

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx::CurveNvIntersector1<8>::
     intersect_t<embree::avx::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  Primitive *pPVar2;
  undefined1 (*pauVar3) [28];
  float *pfVar4;
  float *pfVar5;
  undefined1 (*pauVar6) [28];
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Primitive PVar20;
  uint uVar21;
  uint uVar22;
  RTCFilterFunctionN p_Var23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  long lVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [28];
  undefined1 auVar126 [28];
  undefined1 auVar127 [28];
  undefined1 auVar128 [28];
  undefined1 auVar129 [28];
  undefined1 auVar130 [24];
  uint uVar131;
  uint uVar132;
  uint uVar133;
  ulong uVar134;
  long lVar135;
  long lVar136;
  Geometry *pGVar137;
  Primitive *pPVar138;
  ulong uVar139;
  float fVar140;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar157;
  float fVar158;
  float fVar160;
  float fVar161;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar159;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar162;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  float fVar163;
  float fVar164;
  float fVar177;
  float fVar179;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar183;
  float fVar185;
  float fVar186;
  undefined1 auVar168 [32];
  undefined1 auVar184 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar181;
  undefined1 auVar172 [32];
  float fVar178;
  float fVar180;
  float fVar182;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar187;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar199;
  float fVar200;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar201;
  undefined1 auVar198 [32];
  float fVar202;
  float fVar216;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar214;
  float fVar215;
  float fVar218;
  float fVar220;
  float fVar222;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar217;
  float fVar219;
  float fVar221;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar223;
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar232;
  float fVar235;
  float fVar238;
  undefined1 auVar227 [16];
  float fVar233;
  float fVar234;
  float fVar236;
  float fVar237;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  float fVar244;
  float fVar252;
  float fVar253;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar255;
  float fVar256;
  float fVar257;
  undefined1 auVar249 [32];
  float fVar254;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  float fVar265;
  undefined1 auVar264 [32];
  float fVar266;
  float fVar278;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  float fVar285;
  float fVar287;
  float fVar288;
  float fVar290;
  float fVar292;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  float fVar286;
  float fVar289;
  float fVar293;
  undefined1 auVar282 [32];
  float fVar291;
  undefined1 auVar283 [32];
  undefined1 auVar284 [64];
  float fVar294;
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [64];
  float fVar304;
  float fVar309;
  float fVar311;
  float fVar313;
  float fVar314;
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  float fVar310;
  float fVar312;
  undefined1 auVar308 [32];
  float fVar315;
  float fVar319;
  float fVar320;
  float fVar321;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  float in_register_0000151c;
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  float fVar328;
  float fVar332;
  float fVar333;
  float fVar334;
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  float fVar335;
  float fVar339;
  float fVar340;
  float fVar341;
  float in_register_0000159c;
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [64];
  float fVar342;
  float fVar346;
  float fVar347;
  undefined1 auVar343 [16];
  float fVar348;
  float in_register_000015dc;
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_7bc;
  ulong local_7b8;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_770 [8];
  undefined8 uStack_768;
  Precalculations *local_760;
  Primitive *local_758;
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [16];
  undefined1 auStack_710 [16];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 local_6b0 [8];
  undefined8 uStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined8 local_620;
  undefined4 local_618;
  float local_614;
  undefined4 local_610;
  uint local_60c;
  undefined4 local_608;
  uint local_604;
  uint local_600;
  RayQueryContext *local_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [2] [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  uint local_220;
  uint local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  
  PVar20 = prim[1];
  uVar139 = (ulong)(byte)PVar20;
  lVar136 = uVar139 * 5;
  lVar118 = uVar139 * 0x19;
  fVar202 = *(float *)(prim + lVar118 + 0x12);
  auVar184 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar118 + 6));
  auVar245._0_4_ = fVar202 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar245._4_4_ = fVar202 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar245._8_4_ = fVar202 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar245._12_4_ = fVar202 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar248 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 4 + 6)));
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 4 + 10)));
  auVar165._0_4_ = fVar202 * auVar184._0_4_;
  auVar165._4_4_ = fVar202 * auVar184._4_4_;
  auVar165._8_4_ = fVar202 * auVar184._8_4_;
  auVar165._12_4_ = fVar202 * auVar184._12_4_;
  auVar149._16_16_ = auVar191;
  auVar149._0_16_ = auVar248;
  auVar248 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar136 + 6)));
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar136 + 10)));
  auVar195._16_16_ = auVar191;
  auVar195._0_16_ = auVar248;
  auVar25 = vcvtdq2ps_avx(auVar195);
  auVar248 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 6 + 6)));
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 6 + 10)));
  auVar206._16_16_ = auVar191;
  auVar206._0_16_ = auVar248;
  auVar248 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 0xb + 6)));
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 0xb + 10)));
  auVar26 = vcvtdq2ps_avx(auVar206);
  auVar207._16_16_ = auVar191;
  auVar207._0_16_ = auVar248;
  auVar27 = vcvtdq2ps_avx(auVar207);
  uVar134 = (ulong)((uint)(byte)PVar20 * 0xc);
  auVar248 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + 6)));
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + 10)));
  auVar259._16_16_ = auVar191;
  auVar259._0_16_ = auVar248;
  auVar248 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + uVar139 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar259);
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + uVar139 + 10)));
  auVar267._16_16_ = auVar191;
  auVar267._0_16_ = auVar248;
  lVar135 = uVar139 * 9;
  uVar134 = (ulong)(uint)((int)lVar135 * 2);
  auVar248 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar267);
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + 10)));
  auVar268._16_16_ = auVar191;
  auVar268._0_16_ = auVar248;
  auVar30 = vcvtdq2ps_avx(auVar268);
  auVar248 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + uVar139 + 6)));
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + uVar139 + 10)));
  auVar295._16_16_ = auVar191;
  auVar295._0_16_ = auVar248;
  uVar134 = (ulong)(uint)((int)lVar136 << 2);
  auVar248 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + 6)));
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 + 10)));
  auVar31 = vcvtdq2ps_avx(auVar295);
  auVar305._16_16_ = auVar191;
  auVar305._0_16_ = auVar248;
  auVar32 = vcvtdq2ps_avx(auVar305);
  auVar248 = vshufps_avx(auVar245,auVar245,0);
  auVar191 = vshufps_avx(auVar245,auVar245,0x55);
  auVar184 = vshufps_avx(auVar245,auVar245,0xaa);
  fVar202 = auVar184._0_4_;
  fVar214 = auVar184._4_4_;
  fVar215 = auVar184._8_4_;
  fVar216 = auVar184._12_4_;
  fVar218 = auVar191._0_4_;
  fVar220 = auVar191._4_4_;
  fVar222 = auVar191._8_4_;
  fVar224 = auVar191._12_4_;
  fVar232 = auVar248._0_4_;
  fVar235 = auVar248._4_4_;
  fVar238 = auVar248._8_4_;
  fVar241 = auVar248._12_4_;
  auVar322._0_4_ = fVar232 * auVar149._0_4_ + fVar218 * auVar25._0_4_ + fVar202 * auVar26._0_4_;
  auVar322._4_4_ = fVar235 * auVar149._4_4_ + fVar220 * auVar25._4_4_ + fVar214 * auVar26._4_4_;
  auVar322._8_4_ = fVar238 * auVar149._8_4_ + fVar222 * auVar25._8_4_ + fVar215 * auVar26._8_4_;
  auVar322._12_4_ = fVar241 * auVar149._12_4_ + fVar224 * auVar25._12_4_ + fVar216 * auVar26._12_4_;
  auVar322._16_4_ = fVar232 * auVar149._16_4_ + fVar218 * auVar25._16_4_ + fVar202 * auVar26._16_4_;
  auVar322._20_4_ = fVar235 * auVar149._20_4_ + fVar220 * auVar25._20_4_ + fVar214 * auVar26._20_4_;
  auVar322._24_4_ = fVar238 * auVar149._24_4_ + fVar222 * auVar25._24_4_ + fVar215 * auVar26._24_4_;
  auVar322._28_4_ = fVar224 + in_register_000015dc + in_register_0000151c;
  auVar316._0_4_ = fVar232 * auVar27._0_4_ + fVar218 * auVar28._0_4_ + auVar29._0_4_ * fVar202;
  auVar316._4_4_ = fVar235 * auVar27._4_4_ + fVar220 * auVar28._4_4_ + auVar29._4_4_ * fVar214;
  auVar316._8_4_ = fVar238 * auVar27._8_4_ + fVar222 * auVar28._8_4_ + auVar29._8_4_ * fVar215;
  auVar316._12_4_ = fVar241 * auVar27._12_4_ + fVar224 * auVar28._12_4_ + auVar29._12_4_ * fVar216;
  auVar316._16_4_ = fVar232 * auVar27._16_4_ + fVar218 * auVar28._16_4_ + auVar29._16_4_ * fVar202;
  auVar316._20_4_ = fVar235 * auVar27._20_4_ + fVar220 * auVar28._20_4_ + auVar29._20_4_ * fVar214;
  auVar316._24_4_ = fVar238 * auVar27._24_4_ + fVar222 * auVar28._24_4_ + auVar29._24_4_ * fVar215;
  auVar316._28_4_ = fVar224 + in_register_000015dc + in_register_0000159c;
  auVar249._0_4_ = fVar232 * auVar30._0_4_ + fVar218 * auVar31._0_4_ + auVar32._0_4_ * fVar202;
  auVar249._4_4_ = fVar235 * auVar30._4_4_ + fVar220 * auVar31._4_4_ + auVar32._4_4_ * fVar214;
  auVar249._8_4_ = fVar238 * auVar30._8_4_ + fVar222 * auVar31._8_4_ + auVar32._8_4_ * fVar215;
  auVar249._12_4_ = fVar241 * auVar30._12_4_ + fVar224 * auVar31._12_4_ + auVar32._12_4_ * fVar216;
  auVar249._16_4_ = fVar232 * auVar30._16_4_ + fVar218 * auVar31._16_4_ + auVar32._16_4_ * fVar202;
  auVar249._20_4_ = fVar235 * auVar30._20_4_ + fVar220 * auVar31._20_4_ + auVar32._20_4_ * fVar214;
  auVar249._24_4_ = fVar238 * auVar30._24_4_ + fVar222 * auVar31._24_4_ + auVar32._24_4_ * fVar215;
  auVar249._28_4_ = fVar241 + fVar224 + fVar216;
  auVar248 = vshufps_avx(auVar165,auVar165,0);
  auVar191 = vshufps_avx(auVar165,auVar165,0x55);
  auVar184 = vshufps_avx(auVar165,auVar165,0xaa);
  fVar214 = auVar184._0_4_;
  fVar215 = auVar184._4_4_;
  fVar216 = auVar184._8_4_;
  fVar218 = auVar184._12_4_;
  fVar235 = auVar191._0_4_;
  fVar238 = auVar191._4_4_;
  fVar241 = auVar191._8_4_;
  fVar242 = auVar191._12_4_;
  fVar220 = auVar248._0_4_;
  fVar222 = auVar248._4_4_;
  fVar224 = auVar248._8_4_;
  fVar232 = auVar248._12_4_;
  fVar202 = auVar149._28_4_;
  auVar260._0_4_ = fVar220 * auVar149._0_4_ + fVar235 * auVar25._0_4_ + fVar214 * auVar26._0_4_;
  auVar260._4_4_ = fVar222 * auVar149._4_4_ + fVar238 * auVar25._4_4_ + fVar215 * auVar26._4_4_;
  auVar260._8_4_ = fVar224 * auVar149._8_4_ + fVar241 * auVar25._8_4_ + fVar216 * auVar26._8_4_;
  auVar260._12_4_ = fVar232 * auVar149._12_4_ + fVar242 * auVar25._12_4_ + fVar218 * auVar26._12_4_;
  auVar260._16_4_ = fVar220 * auVar149._16_4_ + fVar235 * auVar25._16_4_ + fVar214 * auVar26._16_4_;
  auVar260._20_4_ = fVar222 * auVar149._20_4_ + fVar238 * auVar25._20_4_ + fVar215 * auVar26._20_4_;
  auVar260._24_4_ = fVar224 * auVar149._24_4_ + fVar241 * auVar25._24_4_ + fVar216 * auVar26._24_4_;
  auVar260._28_4_ = fVar202 + auVar25._28_4_ + auVar26._28_4_;
  auVar168._0_4_ = fVar220 * auVar27._0_4_ + auVar29._0_4_ * fVar214 + fVar235 * auVar28._0_4_;
  auVar168._4_4_ = fVar222 * auVar27._4_4_ + auVar29._4_4_ * fVar215 + fVar238 * auVar28._4_4_;
  auVar168._8_4_ = fVar224 * auVar27._8_4_ + auVar29._8_4_ * fVar216 + fVar241 * auVar28._8_4_;
  auVar168._12_4_ = fVar232 * auVar27._12_4_ + auVar29._12_4_ * fVar218 + fVar242 * auVar28._12_4_;
  auVar168._16_4_ = fVar220 * auVar27._16_4_ + auVar29._16_4_ * fVar214 + fVar235 * auVar28._16_4_;
  auVar168._20_4_ = fVar222 * auVar27._20_4_ + auVar29._20_4_ * fVar215 + fVar238 * auVar28._20_4_;
  auVar168._24_4_ = fVar224 * auVar27._24_4_ + auVar29._24_4_ * fVar216 + fVar241 * auVar28._24_4_;
  auVar168._28_4_ = fVar202 + auVar29._28_4_ + auVar26._28_4_;
  auVar269._8_4_ = 0x7fffffff;
  auVar269._0_8_ = 0x7fffffff7fffffff;
  auVar269._12_4_ = 0x7fffffff;
  auVar269._16_4_ = 0x7fffffff;
  auVar269._20_4_ = 0x7fffffff;
  auVar269._24_4_ = 0x7fffffff;
  auVar269._28_4_ = 0x7fffffff;
  auVar196._8_4_ = 0x219392ef;
  auVar196._0_8_ = 0x219392ef219392ef;
  auVar196._12_4_ = 0x219392ef;
  auVar196._16_4_ = 0x219392ef;
  auVar196._20_4_ = 0x219392ef;
  auVar196._24_4_ = 0x219392ef;
  auVar196._28_4_ = 0x219392ef;
  auVar149 = vandps_avx(auVar322,auVar269);
  auVar149 = vcmpps_avx(auVar149,auVar196,1);
  auVar25 = vblendvps_avx(auVar322,auVar196,auVar149);
  auVar149 = vandps_avx(auVar316,auVar269);
  auVar149 = vcmpps_avx(auVar149,auVar196,1);
  auVar26 = vblendvps_avx(auVar316,auVar196,auVar149);
  auVar149 = vandps_avx(auVar249,auVar269);
  auVar149 = vcmpps_avx(auVar149,auVar196,1);
  auVar149 = vblendvps_avx(auVar249,auVar196,auVar149);
  auVar197._0_4_ = fVar235 * auVar31._0_4_ + auVar32._0_4_ * fVar214 + fVar220 * auVar30._0_4_;
  auVar197._4_4_ = fVar238 * auVar31._4_4_ + auVar32._4_4_ * fVar215 + fVar222 * auVar30._4_4_;
  auVar197._8_4_ = fVar241 * auVar31._8_4_ + auVar32._8_4_ * fVar216 + fVar224 * auVar30._8_4_;
  auVar197._12_4_ = fVar242 * auVar31._12_4_ + auVar32._12_4_ * fVar218 + fVar232 * auVar30._12_4_;
  auVar197._16_4_ = fVar235 * auVar31._16_4_ + auVar32._16_4_ * fVar214 + fVar220 * auVar30._16_4_;
  auVar197._20_4_ = fVar238 * auVar31._20_4_ + auVar32._20_4_ * fVar215 + fVar222 * auVar30._20_4_;
  auVar197._24_4_ = fVar241 * auVar31._24_4_ + auVar32._24_4_ * fVar216 + fVar224 * auVar30._24_4_;
  auVar197._28_4_ = auVar28._28_4_ + fVar218 + fVar202;
  auVar27 = vrcpps_avx(auVar25);
  fVar202 = auVar27._0_4_;
  fVar214 = auVar27._4_4_;
  auVar28._4_4_ = auVar25._4_4_ * fVar214;
  auVar28._0_4_ = auVar25._0_4_ * fVar202;
  fVar215 = auVar27._8_4_;
  auVar28._8_4_ = auVar25._8_4_ * fVar215;
  fVar216 = auVar27._12_4_;
  auVar28._12_4_ = auVar25._12_4_ * fVar216;
  fVar218 = auVar27._16_4_;
  auVar28._16_4_ = auVar25._16_4_ * fVar218;
  fVar220 = auVar27._20_4_;
  auVar28._20_4_ = auVar25._20_4_ * fVar220;
  fVar222 = auVar27._24_4_;
  auVar28._24_4_ = auVar25._24_4_ * fVar222;
  auVar28._28_4_ = auVar25._28_4_;
  auVar279._8_4_ = 0x3f800000;
  auVar279._0_8_ = 0x3f8000003f800000;
  auVar279._12_4_ = 0x3f800000;
  auVar279._16_4_ = 0x3f800000;
  auVar279._20_4_ = 0x3f800000;
  auVar279._24_4_ = 0x3f800000;
  auVar279._28_4_ = 0x3f800000;
  auVar28 = vsubps_avx(auVar279,auVar28);
  auVar25 = vrcpps_avx(auVar26);
  fVar202 = fVar202 + fVar202 * auVar28._0_4_;
  fVar214 = fVar214 + fVar214 * auVar28._4_4_;
  fVar215 = fVar215 + fVar215 * auVar28._8_4_;
  fVar216 = fVar216 + fVar216 * auVar28._12_4_;
  fVar218 = fVar218 + fVar218 * auVar28._16_4_;
  fVar220 = fVar220 + fVar220 * auVar28._20_4_;
  fVar222 = fVar222 + fVar222 * auVar28._24_4_;
  fVar244 = auVar25._0_4_;
  fVar252 = auVar25._4_4_;
  auVar29._4_4_ = fVar252 * auVar26._4_4_;
  auVar29._0_4_ = fVar244 * auVar26._0_4_;
  fVar253 = auVar25._8_4_;
  auVar29._8_4_ = fVar253 * auVar26._8_4_;
  fVar254 = auVar25._12_4_;
  auVar29._12_4_ = fVar254 * auVar26._12_4_;
  fVar255 = auVar25._16_4_;
  auVar29._16_4_ = fVar255 * auVar26._16_4_;
  fVar256 = auVar25._20_4_;
  auVar29._20_4_ = fVar256 * auVar26._20_4_;
  fVar257 = auVar25._24_4_;
  auVar29._24_4_ = fVar257 * auVar26._24_4_;
  auVar29._28_4_ = auVar27._28_4_;
  auVar25 = vsubps_avx(auVar279,auVar29);
  fVar244 = fVar244 + fVar244 * auVar25._0_4_;
  fVar252 = fVar252 + fVar252 * auVar25._4_4_;
  fVar253 = fVar253 + fVar253 * auVar25._8_4_;
  fVar254 = fVar254 + fVar254 * auVar25._12_4_;
  fVar255 = fVar255 + fVar255 * auVar25._16_4_;
  fVar256 = fVar256 + fVar256 * auVar25._20_4_;
  fVar257 = fVar257 + fVar257 * auVar25._24_4_;
  auVar25 = vrcpps_avx(auVar149);
  fVar224 = auVar25._0_4_;
  fVar232 = auVar25._4_4_;
  auVar30._4_4_ = fVar232 * auVar149._4_4_;
  auVar30._0_4_ = fVar224 * auVar149._0_4_;
  fVar235 = auVar25._8_4_;
  auVar30._8_4_ = fVar235 * auVar149._8_4_;
  fVar238 = auVar25._12_4_;
  auVar30._12_4_ = fVar238 * auVar149._12_4_;
  fVar241 = auVar25._16_4_;
  auVar30._16_4_ = fVar241 * auVar149._16_4_;
  fVar242 = auVar25._20_4_;
  auVar30._20_4_ = fVar242 * auVar149._20_4_;
  fVar243 = auVar25._24_4_;
  auVar30._24_4_ = fVar243 * auVar149._24_4_;
  auVar30._28_4_ = auVar26._28_4_;
  auVar149 = vsubps_avx(auVar279,auVar30);
  fVar224 = fVar224 + fVar224 * auVar149._0_4_;
  fVar232 = fVar232 + fVar232 * auVar149._4_4_;
  fVar235 = fVar235 + fVar235 * auVar149._8_4_;
  fVar238 = fVar238 + fVar238 * auVar149._12_4_;
  fVar241 = fVar241 + fVar241 * auVar149._16_4_;
  fVar242 = fVar242 + fVar242 * auVar149._20_4_;
  fVar243 = fVar243 + fVar243 * auVar149._24_4_;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = *(ulong *)(prim + uVar139 * 7 + 6);
  auVar248 = vpmovsxwd_avx(auVar248);
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *(ulong *)(prim + uVar139 * 7 + 0xe);
  auVar191 = vpmovsxwd_avx(auVar191);
  auVar143._16_16_ = auVar191;
  auVar143._0_16_ = auVar248;
  auVar149 = vcvtdq2ps_avx(auVar143);
  auVar149 = vsubps_avx(auVar149,auVar260);
  auVar141._0_4_ = fVar202 * auVar149._0_4_;
  auVar141._4_4_ = fVar214 * auVar149._4_4_;
  auVar141._8_4_ = fVar215 * auVar149._8_4_;
  auVar141._12_4_ = fVar216 * auVar149._12_4_;
  auVar26._16_4_ = fVar218 * auVar149._16_4_;
  auVar26._0_16_ = auVar141;
  auVar26._20_4_ = fVar220 * auVar149._20_4_;
  auVar26._24_4_ = fVar222 * auVar149._24_4_;
  auVar26._28_4_ = auVar149._28_4_;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + lVar135 + 6);
  auVar248 = vpmovsxwd_avx(auVar184);
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(prim + lVar135 + 0xe);
  auVar191 = vpmovsxwd_avx(auVar205);
  auVar270._16_16_ = auVar191;
  auVar270._0_16_ = auVar248;
  auVar149 = vcvtdq2ps_avx(auVar270);
  auVar149 = vsubps_avx(auVar149,auVar260);
  auVar203._0_4_ = fVar202 * auVar149._0_4_;
  auVar203._4_4_ = fVar214 * auVar149._4_4_;
  auVar203._8_4_ = fVar215 * auVar149._8_4_;
  auVar203._12_4_ = fVar216 * auVar149._12_4_;
  auVar31._16_4_ = fVar218 * auVar149._16_4_;
  auVar31._0_16_ = auVar203;
  auVar31._20_4_ = fVar220 * auVar149._20_4_;
  auVar31._24_4_ = fVar222 * auVar149._24_4_;
  auVar31._28_4_ = auVar27._28_4_ + auVar28._28_4_;
  lVar136 = (ulong)(byte)PVar20 * 0x10;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar136 + 6);
  auVar248 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + lVar136 + 0xe);
  auVar191 = vpmovsxwd_avx(auVar13);
  lVar136 = lVar136 + uVar139 * -2;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + lVar136 + 6);
  auVar184 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + lVar136 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar15);
  auVar261._16_16_ = auVar205;
  auVar261._0_16_ = auVar184;
  auVar149 = vcvtdq2ps_avx(auVar261);
  auVar149 = vsubps_avx(auVar149,auVar168);
  auVar258._0_4_ = fVar244 * auVar149._0_4_;
  auVar258._4_4_ = fVar252 * auVar149._4_4_;
  auVar258._8_4_ = fVar253 * auVar149._8_4_;
  auVar258._12_4_ = fVar254 * auVar149._12_4_;
  auVar27._16_4_ = fVar255 * auVar149._16_4_;
  auVar27._0_16_ = auVar258;
  auVar27._20_4_ = fVar256 * auVar149._20_4_;
  auVar27._24_4_ = fVar257 * auVar149._24_4_;
  auVar27._28_4_ = auVar149._28_4_;
  auVar271._16_16_ = auVar191;
  auVar271._0_16_ = auVar248;
  auVar149 = vcvtdq2ps_avx(auVar271);
  auVar149 = vsubps_avx(auVar149,auVar168);
  auVar166._0_4_ = fVar244 * auVar149._0_4_;
  auVar166._4_4_ = fVar252 * auVar149._4_4_;
  auVar166._8_4_ = fVar253 * auVar149._8_4_;
  auVar166._12_4_ = fVar254 * auVar149._12_4_;
  auVar25._16_4_ = fVar255 * auVar149._16_4_;
  auVar25._0_16_ = auVar166;
  auVar25._20_4_ = fVar256 * auVar149._20_4_;
  auVar25._24_4_ = fVar257 * auVar149._24_4_;
  auVar25._28_4_ = auVar149._28_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar134 + uVar139 + 6);
  auVar248 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar134 + uVar139 + 0xe);
  auVar191 = vpmovsxwd_avx(auVar17);
  auVar250._16_16_ = auVar191;
  auVar250._0_16_ = auVar248;
  auVar149 = vcvtdq2ps_avx(auVar250);
  auVar149 = vsubps_avx(auVar149,auVar197);
  auVar246._0_4_ = fVar224 * auVar149._0_4_;
  auVar246._4_4_ = fVar232 * auVar149._4_4_;
  auVar246._8_4_ = fVar235 * auVar149._8_4_;
  auVar246._12_4_ = fVar238 * auVar149._12_4_;
  auVar32._16_4_ = fVar241 * auVar149._16_4_;
  auVar32._0_16_ = auVar246;
  auVar32._20_4_ = fVar242 * auVar149._20_4_;
  auVar32._24_4_ = fVar243 * auVar149._24_4_;
  auVar32._28_4_ = auVar149._28_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar139 * 0x17 + 6);
  auVar248 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar139 * 0x17 + 0xe);
  auVar191 = vpmovsxwd_avx(auVar19);
  auVar272._16_16_ = auVar191;
  auVar272._0_16_ = auVar248;
  auVar149 = vcvtdq2ps_avx(auVar272);
  auVar149 = vsubps_avx(auVar149,auVar197);
  auVar188._0_4_ = fVar224 * auVar149._0_4_;
  auVar188._4_4_ = fVar232 * auVar149._4_4_;
  auVar188._8_4_ = fVar235 * auVar149._8_4_;
  auVar188._12_4_ = fVar238 * auVar149._12_4_;
  auVar24._16_4_ = fVar241 * auVar149._16_4_;
  auVar24._0_16_ = auVar188;
  auVar24._20_4_ = fVar242 * auVar149._20_4_;
  auVar24._24_4_ = fVar243 * auVar149._24_4_;
  auVar24._28_4_ = auVar149._28_4_;
  auVar248 = vpminsd_avx(auVar26._16_16_,auVar31._16_16_);
  auVar191 = vpminsd_avx(auVar141,auVar203);
  auVar280._16_16_ = auVar248;
  auVar280._0_16_ = auVar191;
  auVar184 = auVar25._16_16_;
  auVar300 = ZEXT1664(auVar184);
  auVar248 = vpminsd_avx(auVar27._16_16_,auVar184);
  auVar191 = vpminsd_avx(auVar258,auVar166);
  auVar317._16_16_ = auVar248;
  auVar317._0_16_ = auVar191;
  auVar149 = vmaxps_avx(auVar280,auVar317);
  auVar248 = vpminsd_avx(auVar32._16_16_,auVar24._16_16_);
  auVar191 = vpminsd_avx(auVar246,auVar188);
  auVar329._16_16_ = auVar248;
  auVar329._0_16_ = auVar191;
  uVar9 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar336._4_4_ = uVar9;
  auVar336._0_4_ = uVar9;
  auVar336._8_4_ = uVar9;
  auVar336._12_4_ = uVar9;
  auVar336._16_4_ = uVar9;
  auVar336._20_4_ = uVar9;
  auVar336._24_4_ = uVar9;
  auVar336._28_4_ = uVar9;
  auVar25 = vmaxps_avx(auVar329,auVar336);
  auVar149 = vmaxps_avx(auVar149,auVar25);
  local_80._4_4_ = auVar149._4_4_ * 0.99999964;
  local_80._0_4_ = auVar149._0_4_ * 0.99999964;
  local_80._8_4_ = auVar149._8_4_ * 0.99999964;
  local_80._12_4_ = auVar149._12_4_ * 0.99999964;
  local_80._16_4_ = auVar149._16_4_ * 0.99999964;
  local_80._20_4_ = auVar149._20_4_ * 0.99999964;
  local_80._24_4_ = auVar149._24_4_ * 0.99999964;
  local_80._28_4_ = auVar149._28_4_;
  auVar284 = ZEXT3264(local_80);
  auVar248 = vpmaxsd_avx(auVar26._16_16_,auVar31._16_16_);
  auVar191 = vpmaxsd_avx(auVar141,auVar203);
  auVar144._16_16_ = auVar248;
  auVar144._0_16_ = auVar191;
  auVar248 = vpmaxsd_avx(auVar27._16_16_,auVar184);
  auVar191 = vpmaxsd_avx(auVar258,auVar166);
  auVar169._16_16_ = auVar248;
  auVar169._0_16_ = auVar191;
  auVar149 = vminps_avx(auVar144,auVar169);
  auVar248 = vpmaxsd_avx(auVar32._16_16_,auVar24._16_16_);
  auVar191 = vpmaxsd_avx(auVar246,auVar188);
  fVar202 = (ray->super_RayK<1>).tfar;
  auVar208._4_4_ = fVar202;
  auVar208._0_4_ = fVar202;
  auVar208._8_4_ = fVar202;
  auVar208._12_4_ = fVar202;
  auVar208._16_4_ = fVar202;
  auVar208._20_4_ = fVar202;
  auVar208._24_4_ = fVar202;
  auVar208._28_4_ = fVar202;
  auVar170._16_16_ = auVar248;
  auVar170._0_16_ = auVar191;
  auVar25 = vminps_avx(auVar170,auVar208);
  auVar149 = vminps_avx(auVar149,auVar25);
  auVar33._4_4_ = auVar149._4_4_ * 1.0000004;
  auVar33._0_4_ = auVar149._0_4_ * 1.0000004;
  auVar33._8_4_ = auVar149._8_4_ * 1.0000004;
  auVar33._12_4_ = auVar149._12_4_ * 1.0000004;
  auVar33._16_4_ = auVar149._16_4_ * 1.0000004;
  auVar33._20_4_ = auVar149._20_4_ * 1.0000004;
  auVar33._24_4_ = auVar149._24_4_ * 1.0000004;
  auVar33._28_4_ = auVar149._28_4_;
  auVar149 = vcmpps_avx(local_80,auVar33,2);
  auVar248 = vpshufd_avx(ZEXT116((byte)PVar20),0);
  auVar171._16_16_ = auVar248;
  auVar171._0_16_ = auVar248;
  auVar25 = vcvtdq2ps_avx(auVar171);
  auVar25 = vcmpps_avx(_DAT_01faff40,auVar25,1);
  auVar149 = vandps_avx(auVar149,auVar25);
  uVar133 = vmovmskps_avx(auVar149);
  if (uVar133 != 0) {
    uVar133 = uVar133 & 0xff;
    local_4e0[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_4e0[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_4e0[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_4e0[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_758 = prim;
    local_760 = pre;
    pPVar138 = prim;
    do {
      uVar139 = (ulong)uVar133;
      local_680 = auVar300._0_32_;
      local_6e0 = auVar284._0_32_;
      lVar136 = 0;
      if (uVar139 != 0) {
        for (; (uVar133 >> lVar136 & 1) == 0; lVar136 = lVar136 + 1) {
        }
      }
      uVar139 = uVar139 - 1 & uVar139;
      uVar133 = *(uint *)(pPVar138 + lVar136 * 4 + 6);
      lVar136 = lVar136 * 0x40;
      lVar135 = 0;
      if (uVar139 != 0) {
        for (; (uVar139 >> lVar135 & 1) == 0; lVar135 = lVar135 + 1) {
        }
      }
      uVar21 = *(uint *)(pPVar138 + 2);
      local_7b8 = (ulong)uVar21;
      pGVar137 = (context->scene->geometries).items[uVar21].ptr;
      pPVar2 = prim + lVar136 + lVar118 + 0x16;
      local_210 = *(undefined8 *)pPVar2;
      uStack_208 = *(undefined8 *)(pPVar2 + 8);
      local_7b0 = (float)local_210;
      fStack_7ac = (float)((ulong)local_210 >> 0x20);
      fStack_7a8 = (float)uStack_208;
      fStack_7a4 = (float)((ulong)uStack_208 >> 0x20);
      if (((uVar139 != 0) && (uVar134 = uVar139 - 1 & uVar139, uVar134 != 0)) &&
         (lVar135 = 0, uVar134 != 0)) {
        for (; (uVar134 >> lVar135 & 1) == 0; lVar135 = lVar135 + 1) {
        }
      }
      _local_770 = *(undefined1 (*) [16])(prim + lVar136 + lVar118 + 0x26);
      _local_6b0 = *(undefined1 (*) [16])(prim + lVar136 + lVar118 + 0x36);
      _local_6c0 = *(undefined1 (*) [16])(prim + lVar136 + lVar118 + 0x46);
      uVar22 = (uint)pGVar137[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar11 = (ray->super_RayK<1>).org.field_0;
      auVar119._12_4_ = fStack_7a4;
      auVar119._0_12_ = *(undefined1 (*) [12])pPVar2;
      auVar184 = vsubps_avx(auVar119,(undefined1  [16])aVar11);
      auVar248 = vshufps_avx(auVar184,auVar184,0);
      auVar191 = vshufps_avx(auVar184,auVar184,0x55);
      auVar184 = vshufps_avx(auVar184,auVar184,0xaa);
      fVar202 = (pre->ray_space).vx.field_0.m128[0];
      fVar214 = (pre->ray_space).vx.field_0.m128[1];
      fVar215 = (pre->ray_space).vx.field_0.m128[2];
      fVar216 = (pre->ray_space).vx.field_0.m128[3];
      fVar218 = (pre->ray_space).vy.field_0.m128[0];
      fVar220 = (pre->ray_space).vy.field_0.m128[1];
      fVar222 = (pre->ray_space).vy.field_0.m128[2];
      fVar224 = (pre->ray_space).vy.field_0.m128[3];
      fVar232 = (pre->ray_space).vz.field_0.m128[0];
      fVar235 = (pre->ray_space).vz.field_0.m128[1];
      fVar238 = (pre->ray_space).vz.field_0.m128[2];
      fVar241 = (pre->ray_space).vz.field_0.m128[3];
      auVar204._0_4_ =
           auVar248._0_4_ * fVar202 + auVar184._0_4_ * fVar232 + auVar191._0_4_ * fVar218;
      auVar204._4_4_ =
           auVar248._4_4_ * fVar214 + auVar184._4_4_ * fVar235 + auVar191._4_4_ * fVar220;
      auVar204._8_4_ =
           auVar248._8_4_ * fVar215 + auVar184._8_4_ * fVar238 + auVar191._8_4_ * fVar222;
      auVar204._12_4_ =
           auVar248._12_4_ * fVar216 + auVar184._12_4_ * fVar241 + auVar191._12_4_ * fVar224;
      auVar248 = vblendps_avx(auVar204,auVar119,8);
      auVar14 = _local_770;
      auVar205 = vsubps_avx(_local_770,(undefined1  [16])aVar11);
      auVar191 = vshufps_avx(auVar205,auVar205,0);
      auVar184 = vshufps_avx(auVar205,auVar205,0x55);
      auVar205 = vshufps_avx(auVar205,auVar205,0xaa);
      auVar343._0_4_ =
           auVar191._0_4_ * fVar202 + auVar205._0_4_ * fVar232 + auVar184._0_4_ * fVar218;
      auVar343._4_4_ =
           auVar191._4_4_ * fVar214 + auVar205._4_4_ * fVar235 + auVar184._4_4_ * fVar220;
      auVar343._8_4_ =
           auVar191._8_4_ * fVar215 + auVar205._8_4_ * fVar238 + auVar184._8_4_ * fVar222;
      auVar343._12_4_ =
           auVar191._12_4_ * fVar216 + auVar205._12_4_ * fVar241 + auVar184._12_4_ * fVar224;
      auVar191 = vblendps_avx(auVar343,_local_770,8);
      auVar12 = vsubps_avx(_local_6b0,(undefined1  [16])aVar11);
      auVar184 = vshufps_avx(auVar12,auVar12,0);
      auVar205 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar247._0_4_ = auVar184._0_4_ * fVar202 + auVar205._0_4_ * fVar218 + auVar12._0_4_ * fVar232
      ;
      auVar247._4_4_ = auVar184._4_4_ * fVar214 + auVar205._4_4_ * fVar220 + auVar12._4_4_ * fVar235
      ;
      auVar247._8_4_ = auVar184._8_4_ * fVar215 + auVar205._8_4_ * fVar222 + auVar12._8_4_ * fVar238
      ;
      auVar247._12_4_ =
           auVar184._12_4_ * fVar216 + auVar205._12_4_ * fVar224 + auVar12._12_4_ * fVar241;
      auVar184 = vblendps_avx(auVar247,_local_6b0,8);
      local_380._0_16_ = (undefined1  [16])aVar11;
      auVar13 = vsubps_avx(_local_6c0,(undefined1  [16])aVar11);
      auVar205 = vshufps_avx(auVar13,auVar13,0);
      auVar12 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar167._0_4_ = auVar205._0_4_ * fVar202 + auVar13._0_4_ * fVar232 + auVar12._0_4_ * fVar218;
      auVar167._4_4_ = auVar205._4_4_ * fVar214 + auVar13._4_4_ * fVar235 + auVar12._4_4_ * fVar220;
      auVar167._8_4_ = auVar205._8_4_ * fVar215 + auVar13._8_4_ * fVar238 + auVar12._8_4_ * fVar222;
      auVar167._12_4_ =
           auVar205._12_4_ * fVar216 + auVar13._12_4_ * fVar241 + auVar12._12_4_ * fVar224;
      auVar205 = vblendps_avx(auVar167,_local_6c0,8);
      auVar227._8_4_ = 0x7fffffff;
      auVar227._0_8_ = 0x7fffffff7fffffff;
      auVar227._12_4_ = 0x7fffffff;
      auVar248 = vandps_avx(auVar248,auVar227);
      auVar191 = vandps_avx(auVar191,auVar227);
      auVar12 = vmaxps_avx(auVar248,auVar191);
      auVar248 = vandps_avx(auVar184,auVar227);
      auVar191 = vandps_avx(auVar205,auVar227);
      auVar248 = vmaxps_avx(auVar248,auVar191);
      auVar248 = vmaxps_avx(auVar12,auVar248);
      auVar191 = vmovshdup_avx(auVar248);
      auVar191 = vmaxss_avx(auVar191,auVar248);
      auVar248 = vshufpd_avx(auVar248,auVar248,1);
      auVar248 = vmaxss_avx(auVar248,auVar191);
      lVar136 = (long)(int)uVar22 * 0x44;
      fVar217 = *(float *)(bezier_basis0 + lVar136 + 0x908);
      fVar288 = *(float *)(bezier_basis0 + lVar136 + 0x90c);
      fVar287 = *(float *)(bezier_basis0 + lVar136 + 0x910);
      fVar289 = *(float *)(bezier_basis0 + lVar136 + 0x914);
      fVar219 = *(float *)(bezier_basis0 + lVar136 + 0x918);
      fVar290 = *(float *)(bezier_basis0 + lVar136 + 0x91c);
      fVar291 = *(float *)(bezier_basis0 + lVar136 + 0x920);
      local_700._0_16_ = auVar247;
      auVar191 = vshufps_avx(auVar247,auVar247,0);
      register0x00001250 = auVar191;
      _local_5a0 = auVar191;
      auVar184 = vshufps_avx(auVar247,auVar247,0x55);
      register0x00001290 = auVar184;
      _local_660 = auVar184;
      fVar215 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar136 + 0xd8c);
      fVar216 = *(float *)(bezier_basis0 + lVar136 + 0xd90);
      fVar222 = *(float *)(bezier_basis0 + lVar136 + 0xd94);
      fVar224 = *(float *)(bezier_basis0 + lVar136 + 0xd98);
      fVar238 = *(float *)(bezier_basis0 + lVar136 + 0xd9c);
      fVar241 = *(float *)(bezier_basis0 + lVar136 + 0xda0);
      fVar244 = *(float *)(bezier_basis0 + lVar136 + 0xda4);
      auVar125 = *(undefined1 (*) [28])(bezier_basis0 + lVar136 + 0xd8c);
      auVar205 = vshufps_avx(auVar167,auVar167,0);
      register0x00001350 = auVar205;
      _local_360 = auVar205;
      fVar202 = auVar205._0_4_;
      fVar218 = auVar205._4_4_;
      fVar232 = auVar205._8_4_;
      fVar242 = auVar205._12_4_;
      fVar163 = auVar191._0_4_;
      fVar177 = auVar191._4_4_;
      fVar179 = auVar191._8_4_;
      fVar181 = auVar191._12_4_;
      auVar191 = vshufps_avx(auVar167,auVar167,0x55);
      register0x00001250 = auVar191;
      _local_580 = auVar191;
      fVar214 = auVar191._0_4_;
      fVar220 = auVar191._4_4_;
      fVar235 = auVar191._8_4_;
      fVar243 = auVar191._12_4_;
      fVar187 = auVar184._0_4_;
      fVar199 = auVar184._4_4_;
      fVar200 = auVar184._8_4_;
      fVar201 = auVar184._12_4_;
      auVar15 = _local_6b0;
      auVar191 = vshufps_avx(_local_6b0,_local_6b0,0xff);
      register0x00001550 = auVar191;
      _local_e0 = auVar191;
      auVar13 = _local_6c0;
      auVar184 = vshufps_avx(_local_6c0,_local_6c0,0xff);
      register0x00001410 = auVar184;
      _local_100 = auVar184;
      fVar226 = auVar184._0_4_;
      fVar234 = auVar184._4_4_;
      fVar237 = auVar184._8_4_;
      fVar240 = auVar184._12_4_;
      fVar303 = auVar191._0_4_;
      fVar328 = auVar191._4_4_;
      fVar332 = auVar191._8_4_;
      fVar333 = auVar191._12_4_;
      auVar191 = vshufps_avx(auVar343,auVar343,0);
      register0x000014d0 = auVar191;
      _local_640 = auVar191;
      fVar293 = *(float *)(bezier_basis0 + lVar136 + 0x484);
      fVar221 = *(float *)(bezier_basis0 + lVar136 + 0x488);
      fVar292 = *(float *)(bezier_basis0 + lVar136 + 0x48c);
      fVar310 = *(float *)(bezier_basis0 + lVar136 + 0x490);
      fStack_3f0 = *(float *)(bezier_basis0 + lVar136 + 0x494);
      fStack_3ec = *(float *)(bezier_basis0 + lVar136 + 0x498);
      fStack_3e8 = *(float *)(bezier_basis0 + lVar136 + 0x49c);
      fStack_3e4 = *(float *)(bezier_basis0 + lVar136 + 0x4a0);
      fVar315 = auVar191._0_4_;
      fVar319 = auVar191._4_4_;
      fVar320 = auVar191._8_4_;
      fVar321 = auVar191._12_4_;
      auVar191 = vshufps_avx(auVar343,auVar343,0x55);
      register0x000015d0 = auVar191;
      _local_5e0 = auVar191;
      fVar342 = auVar191._0_4_;
      fVar346 = auVar191._4_4_;
      fVar347 = auVar191._8_4_;
      fVar348 = auVar191._12_4_;
      auVar191 = vpermilps_avx(_local_770,0xff);
      register0x00001590 = auVar191;
      _local_120 = auVar191;
      fVar334 = auVar191._0_4_;
      fVar335 = auVar191._4_4_;
      fVar339 = auVar191._8_4_;
      fVar340 = auVar191._12_4_;
      auVar191 = vshufps_avx(auVar204,auVar204,0);
      local_340._16_16_ = auVar191;
      local_340._0_16_ = auVar191;
      fVar252 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar136);
      fVar253 = *(float *)(bezier_basis0 + lVar136 + 4);
      fVar254 = *(float *)(bezier_basis0 + lVar136 + 8);
      fVar255 = *(float *)(bezier_basis0 + lVar136 + 0xc);
      fVar256 = *(float *)(bezier_basis0 + lVar136 + 0x10);
      fVar257 = *(float *)(bezier_basis0 + lVar136 + 0x14);
      fVar286 = *(float *)(bezier_basis0 + lVar136 + 0x18);
      auVar126 = *(undefined1 (*) [28])(bezier_basis0 + lVar136);
      fVar225 = auVar191._0_4_;
      fVar233 = auVar191._4_4_;
      fVar236 = auVar191._8_4_;
      fVar239 = auVar191._12_4_;
      auVar262._0_4_ = fVar225 * fVar252 + fVar315 * fVar293 + fVar163 * fVar217 + fVar215 * fVar202
      ;
      auVar262._4_4_ = fVar233 * fVar253 + fVar319 * fVar221 + fVar177 * fVar288 + fVar216 * fVar218
      ;
      auVar262._8_4_ = fVar236 * fVar254 + fVar320 * fVar292 + fVar179 * fVar287 + fVar222 * fVar232
      ;
      auVar262._12_4_ =
           fVar239 * fVar255 + fVar321 * fVar310 + fVar181 * fVar289 + fVar224 * fVar242;
      auVar262._16_4_ =
           fVar225 * fVar256 + fVar315 * fStack_3f0 + fVar163 * fVar219 + fVar238 * fVar202;
      auVar262._20_4_ =
           fVar233 * fVar257 + fVar319 * fStack_3ec + fVar177 * fVar290 + fVar241 * fVar218;
      auVar262._24_4_ =
           fVar236 * fVar286 + fVar320 * fStack_3e8 + fVar179 * fVar291 + fVar244 * fVar232;
      auVar262._28_4_ = fStack_3e4 + fVar181 + 0.0 + 0.0;
      auVar191 = vshufps_avx(auVar204,auVar204,0x55);
      register0x00001490 = auVar191;
      _local_2c0 = auVar191;
      fVar304 = auVar191._0_4_;
      fVar309 = auVar191._4_4_;
      fVar311 = auVar191._8_4_;
      fVar313 = auVar191._12_4_;
      auVar323._0_4_ = fVar304 * fVar252 + fVar342 * fVar293 + fVar187 * fVar217 + fVar215 * fVar214
      ;
      auVar323._4_4_ = fVar309 * fVar253 + fVar346 * fVar221 + fVar199 * fVar288 + fVar216 * fVar220
      ;
      auVar323._8_4_ = fVar311 * fVar254 + fVar347 * fVar292 + fVar200 * fVar287 + fVar222 * fVar235
      ;
      auVar323._12_4_ =
           fVar313 * fVar255 + fVar348 * fVar310 + fVar201 * fVar289 + fVar224 * fVar243;
      auVar323._16_4_ =
           fVar304 * fVar256 + fVar342 * fStack_3f0 + fVar187 * fVar219 + fVar238 * fVar214;
      auVar323._20_4_ =
           fVar309 * fVar257 + fVar346 * fStack_3ec + fVar199 * fVar290 + fVar241 * fVar220;
      auVar323._24_4_ =
           fVar311 * fVar286 + fVar347 * fStack_3e8 + fVar200 * fVar291 + fVar244 * fVar235;
      auVar323._28_4_ = fVar201 + fVar243 + 0.0 + 0.0;
      auVar120._12_4_ = fStack_7a4;
      auVar120._0_12_ = *(undefined1 (*) [12])pPVar2;
      auVar191 = vpermilps_avx(auVar120,0xff);
      register0x00001450 = auVar191;
      _local_140 = auVar191;
      fVar294 = auVar191._0_4_;
      fVar301 = auVar191._4_4_;
      fVar302 = auVar191._8_4_;
      local_7a0._0_4_ =
           fVar294 * fVar252 + fVar334 * fVar293 + fVar303 * fVar217 + fVar226 * fVar215;
      local_7a0._4_4_ =
           fVar301 * fVar253 + fVar335 * fVar221 + fVar328 * fVar288 + fVar234 * fVar216;
      fStack_798 = fVar302 * fVar254 + fVar339 * fVar292 + fVar332 * fVar287 + fVar237 * fVar222;
      fStack_794 = auVar191._12_4_ * fVar255 +
                   fVar340 * fVar310 + fVar333 * fVar289 + fVar240 * fVar224;
      fStack_790 = fVar294 * fVar256 + fVar334 * fStack_3f0 + fVar303 * fVar219 + fVar226 * fVar238;
      fStack_78c = fVar301 * fVar257 + fVar335 * fStack_3ec + fVar328 * fVar290 + fVar234 * fVar241;
      fStack_788 = fVar302 * fVar286 + fVar339 * fStack_3e8 + fVar332 * fVar291 + fVar237 * fVar244;
      fStack_784 = 0.0;
      fVar312 = *(float *)(bezier_basis1 + lVar136 + 0x908);
      fVar162 = *(float *)(bezier_basis1 + lVar136 + 0x90c);
      fVar314 = *(float *)(bezier_basis1 + lVar136 + 0x910);
      fVar140 = *(float *)(bezier_basis1 + lVar136 + 0x914);
      fVar157 = *(float *)(bezier_basis1 + lVar136 + 0x918);
      fVar158 = *(float *)(bezier_basis1 + lVar136 + 0x91c);
      fVar159 = *(float *)(bezier_basis1 + lVar136 + 0x920);
      fVar215 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar136 + 0xd8c);
      fVar216 = *(float *)(bezier_basis1 + lVar136 + 0xd90);
      fVar222 = *(float *)(bezier_basis1 + lVar136 + 0xd94);
      fVar224 = *(float *)(bezier_basis1 + lVar136 + 0xd98);
      fVar238 = *(float *)(bezier_basis1 + lVar136 + 0xd9c);
      fVar241 = *(float *)(bezier_basis1 + lVar136 + 0xda0);
      fVar244 = *(float *)(bezier_basis1 + lVar136 + 0xda4);
      auVar127 = *(undefined1 (*) [28])(bezier_basis1 + lVar136 + 0xd8c);
      fVar160 = *(float *)(bezier_basis1 + lVar136 + 0x484);
      fVar161 = *(float *)(bezier_basis1 + lVar136 + 0x488);
      fVar164 = *(float *)(bezier_basis1 + lVar136 + 0x48c);
      fVar178 = *(float *)(bezier_basis1 + lVar136 + 0x490);
      fVar180 = *(float *)(bezier_basis1 + lVar136 + 0x494);
      fVar182 = *(float *)(bezier_basis1 + lVar136 + 0x498);
      fVar183 = *(float *)(bezier_basis1 + lVar136 + 0x49c);
      fVar252 = fVar333 + fStack_3e4 + 0.0;
      fVar185 = *(float *)(bezier_basis1 + lVar136);
      fVar186 = *(float *)(bezier_basis1 + lVar136 + 4);
      fVar265 = *(float *)(bezier_basis1 + lVar136 + 8);
      fVar223 = *(float *)(bezier_basis1 + lVar136 + 0xc);
      fVar285 = *(float *)(bezier_basis1 + lVar136 + 0x10);
      fVar266 = *(float *)(bezier_basis1 + lVar136 + 0x14);
      fVar278 = *(float *)(bezier_basis1 + lVar136 + 0x18);
      local_3e0._0_4_ =
           fVar185 * fVar225 + fVar315 * fVar160 + fVar312 * fVar163 + fVar202 * fVar215;
      local_3e0._4_4_ =
           fVar186 * fVar233 + fVar319 * fVar161 + fVar162 * fVar177 + fVar218 * fVar216;
      fStack_3d8 = fVar265 * fVar236 + fVar320 * fVar164 + fVar314 * fVar179 + fVar232 * fVar222;
      fStack_3d4 = fVar223 * fVar239 + fVar321 * fVar178 + fVar140 * fVar181 + fVar242 * fVar224;
      fStack_3d0 = fVar285 * fVar225 + fVar315 * fVar180 + fVar157 * fVar163 + fVar202 * fVar238;
      fStack_3cc = fVar266 * fVar233 + fVar319 * fVar182 + fVar158 * fVar177 + fVar218 * fVar241;
      fStack_3c8 = fVar278 * fVar236 + fVar320 * fVar183 + fVar159 * fVar179 + fVar232 * fVar244;
      fStack_3c4 = fVar340 + fVar252;
      local_520._0_4_ =
           fVar304 * fVar185 + fVar342 * fVar160 + fVar312 * fVar187 + fVar215 * fVar214;
      local_520._4_4_ =
           fVar309 * fVar186 + fVar346 * fVar161 + fVar162 * fVar199 + fVar216 * fVar220;
      fStack_518 = fVar311 * fVar265 + fVar347 * fVar164 + fVar314 * fVar200 + fVar222 * fVar235;
      fStack_514 = fVar313 * fVar223 + fVar348 * fVar178 + fVar140 * fVar201 + fVar224 * fVar243;
      fStack_510 = fVar304 * fVar285 + fVar342 * fVar180 + fVar157 * fVar187 + fVar238 * fVar214;
      fStack_50c = fVar309 * fVar266 + fVar346 * fVar182 + fVar158 * fVar199 + fVar241 * fVar220;
      fStack_508 = fVar311 * fVar278 + fVar347 * fVar183 + fVar159 * fVar200 + fVar244 * fVar235;
      fStack_504 = fVar252 + fVar333 + fStack_3e4 + 0.0;
      local_4a0._0_4_ =
           fVar334 * fVar160 + fVar303 * fVar312 + fVar226 * fVar215 + fVar294 * fVar185;
      local_4a0._4_4_ =
           fVar335 * fVar161 + fVar328 * fVar162 + fVar234 * fVar216 + fVar301 * fVar186;
      local_4a0._8_4_ =
           fVar339 * fVar164 + fVar332 * fVar314 + fVar237 * fVar222 + fVar302 * fVar265;
      local_4a0._12_4_ =
           fVar340 * fVar178 + fVar333 * fVar140 + fVar240 * fVar224 + auVar191._12_4_ * fVar223;
      local_4a0._16_4_ =
           fVar334 * fVar180 + fVar303 * fVar157 + fVar226 * fVar238 + fVar294 * fVar285;
      local_4a0._20_4_ =
           fVar335 * fVar182 + fVar328 * fVar158 + fVar234 * fVar241 + fVar301 * fVar266;
      local_4a0._24_4_ =
           fVar339 * fVar183 + fVar332 * fVar159 + fVar237 * fVar244 + fVar302 * fVar278;
      local_4a0._28_4_ = fVar333 + fVar240 + fStack_3e4 + fVar252;
      auVar26 = vsubps_avx(_local_3e0,auVar262);
      auVar27 = vsubps_avx(_local_520,auVar323);
      fVar215 = auVar26._0_4_;
      fVar222 = auVar26._4_4_;
      auVar34._4_4_ = auVar323._4_4_ * fVar222;
      auVar34._0_4_ = auVar323._0_4_ * fVar215;
      fVar238 = auVar26._8_4_;
      auVar34._8_4_ = auVar323._8_4_ * fVar238;
      fVar244 = auVar26._12_4_;
      auVar34._12_4_ = auVar323._12_4_ * fVar244;
      fVar253 = auVar26._16_4_;
      auVar34._16_4_ = auVar323._16_4_ * fVar253;
      fVar255 = auVar26._20_4_;
      auVar34._20_4_ = auVar323._20_4_ * fVar255;
      fVar257 = auVar26._24_4_;
      auVar34._24_4_ = auVar323._24_4_ * fVar257;
      auVar34._28_4_ = fVar252;
      fVar216 = auVar27._0_4_;
      fVar224 = auVar27._4_4_;
      auVar35._4_4_ = auVar262._4_4_ * fVar224;
      auVar35._0_4_ = auVar262._0_4_ * fVar216;
      fVar241 = auVar27._8_4_;
      auVar35._8_4_ = auVar262._8_4_ * fVar241;
      fVar252 = auVar27._12_4_;
      auVar35._12_4_ = auVar262._12_4_ * fVar252;
      fVar254 = auVar27._16_4_;
      auVar35._16_4_ = auVar262._16_4_ * fVar254;
      fVar256 = auVar27._20_4_;
      auVar35._20_4_ = auVar262._20_4_ * fVar256;
      fVar286 = auVar27._24_4_;
      auVar35._24_4_ = auVar262._24_4_ * fVar286;
      auVar35._28_4_ = fStack_504;
      auVar25 = vsubps_avx(auVar34,auVar35);
      auVar149 = vmaxps_avx(_local_7a0,local_4a0);
      auVar36._4_4_ = auVar149._4_4_ * auVar149._4_4_ * (fVar222 * fVar222 + fVar224 * fVar224);
      auVar36._0_4_ = auVar149._0_4_ * auVar149._0_4_ * (fVar215 * fVar215 + fVar216 * fVar216);
      auVar36._8_4_ = auVar149._8_4_ * auVar149._8_4_ * (fVar238 * fVar238 + fVar241 * fVar241);
      auVar36._12_4_ = auVar149._12_4_ * auVar149._12_4_ * (fVar244 * fVar244 + fVar252 * fVar252);
      auVar36._16_4_ = auVar149._16_4_ * auVar149._16_4_ * (fVar253 * fVar253 + fVar254 * fVar254);
      auVar36._20_4_ = auVar149._20_4_ * auVar149._20_4_ * (fVar255 * fVar255 + fVar256 * fVar256);
      auVar36._24_4_ = auVar149._24_4_ * auVar149._24_4_ * (fVar257 * fVar257 + fVar286 * fVar286);
      auVar36._28_4_ = auVar27._28_4_ + fStack_504;
      auVar37._4_4_ = auVar25._4_4_ * auVar25._4_4_;
      auVar37._0_4_ = auVar25._0_4_ * auVar25._0_4_;
      auVar37._8_4_ = auVar25._8_4_ * auVar25._8_4_;
      auVar37._12_4_ = auVar25._12_4_ * auVar25._12_4_;
      auVar37._16_4_ = auVar25._16_4_ * auVar25._16_4_;
      auVar37._20_4_ = auVar25._20_4_ * auVar25._20_4_;
      auVar37._24_4_ = auVar25._24_4_ * auVar25._24_4_;
      auVar37._28_4_ = auVar25._28_4_;
      auVar149 = vcmpps_avx(auVar37,auVar36,2);
      auVar191 = ZEXT416((uint)(float)(int)uVar22);
      _local_3a0 = auVar191;
      auVar191 = vshufps_avx(auVar191,auVar191,0);
      auVar209._16_16_ = auVar191;
      auVar209._0_16_ = auVar191;
      auVar25 = vcmpps_avx(_DAT_01faff40,auVar209,1);
      auVar213 = ZEXT3264(auVar25);
      auVar191 = vpermilps_avx(auVar204,0xaa);
      register0x00001450 = auVar191;
      _local_480 = auVar191;
      auVar184 = vpermilps_avx(auVar343,0xaa);
      register0x00001550 = auVar184;
      _local_2a0 = auVar184;
      auVar205 = vpermilps_avx(auVar247,0xaa);
      register0x00001590 = auVar205;
      _local_a0 = auVar205;
      auVar12 = vpermilps_avx(auVar167,0xaa);
      register0x00001310 = auVar12;
      _local_5c0 = auVar12;
      auVar28 = auVar25 & auVar149;
      auVar248 = ZEXT416((uint)(auVar248._0_4_ * 4.7683716e-07));
      fVar215 = fVar315;
      fVar216 = fVar319;
      fVar222 = fVar320;
      fVar224 = fVar187;
      fVar238 = fVar199;
      fVar241 = fVar200;
      fVar244 = fVar201;
      if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar28 >> 0x7f,0) == '\0') &&
            (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar28 >> 0xbf,0) == '\0') &&
          (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar28[0x1f])
      {
        auVar284 = ZEXT3264(local_6e0);
        auVar300 = ZEXT3264(local_680);
        auVar338 = ZEXT3264(_local_5e0);
      }
      else {
        auVar149 = vandps_avx(auVar149,auVar25);
        fVar294 = auVar191._0_4_;
        fVar301 = auVar191._4_4_;
        fVar302 = auVar191._8_4_;
        fVar303 = auVar191._12_4_;
        fVar328 = auVar184._0_4_;
        fVar332 = auVar184._4_4_;
        fVar333 = auVar184._8_4_;
        fVar334 = auVar184._12_4_;
        fVar335 = auVar205._0_4_;
        fVar339 = auVar205._4_4_;
        fVar340 = auVar205._8_4_;
        fVar341 = auVar205._12_4_;
        local_700._0_16_ = auVar248;
        local_440._0_4_ = auVar127._0_4_;
        local_440._4_4_ = auVar127._4_4_;
        fStack_438 = auVar127._8_4_;
        fStack_434 = auVar127._12_4_;
        fStack_430 = auVar127._16_4_;
        fStack_42c = auVar127._20_4_;
        fStack_428 = auVar127._24_4_;
        fVar226 = auVar12._0_4_;
        fVar234 = auVar12._4_4_;
        fVar237 = auVar12._8_4_;
        fVar240 = auVar12._12_4_;
        local_440._0_4_ =
             fVar294 * fVar185 +
             fVar328 * fVar160 + fVar335 * fVar312 + fVar226 * (float)local_440._0_4_;
        local_440._4_4_ =
             fVar301 * fVar186 +
             fVar332 * fVar161 + fVar339 * fVar162 + fVar234 * (float)local_440._4_4_;
        fStack_438 = fVar302 * fVar265 +
                     fVar333 * fVar164 + fVar340 * fVar314 + fVar237 * fStack_438;
        fStack_434 = fVar303 * fVar223 +
                     fVar334 * fVar178 + fVar341 * fVar140 + fVar240 * fStack_434;
        fStack_430 = fVar294 * fVar285 +
                     fVar328 * fVar180 + fVar335 * fVar157 + fVar226 * fStack_430;
        fStack_42c = fVar301 * fVar266 +
                     fVar332 * fVar182 + fVar339 * fVar158 + fVar234 * fStack_42c;
        fStack_428 = fVar302 * fVar278 +
                     fVar333 * fVar183 + fVar340 * fVar159 + fVar237 * fStack_428;
        fStack_424 = auVar149._28_4_ +
                     auVar25._28_4_ + *(float *)(bezier_basis1 + lVar136 + 0x924) + fStack_3e4 + 0.0
        ;
        local_420._0_4_ = auVar126._0_4_;
        local_420._4_4_ = auVar126._4_4_;
        fStack_418 = auVar126._8_4_;
        fStack_414 = auVar126._12_4_;
        fStack_410 = auVar126._16_4_;
        fStack_40c = auVar126._20_4_;
        fStack_408 = auVar126._24_4_;
        local_6a0._0_4_ = auVar125._0_4_;
        local_6a0._4_4_ = auVar125._4_4_;
        fStack_698 = auVar125._8_4_;
        fStack_694 = auVar125._12_4_;
        fStack_690 = auVar125._16_4_;
        fStack_68c = auVar125._20_4_;
        fStack_688 = auVar125._24_4_;
        local_540 = fVar294 * (float)local_420._0_4_ +
                    fVar328 * fVar293 + fVar335 * fVar217 + fVar226 * (float)local_6a0._0_4_;
        fStack_53c = fVar301 * (float)local_420._4_4_ +
                     fVar332 * fVar221 + fVar339 * fVar288 + fVar234 * (float)local_6a0._4_4_;
        fStack_538 = fVar302 * fStack_418 +
                     fVar333 * fVar292 + fVar340 * fVar287 + fVar237 * fStack_698;
        fStack_534 = fVar303 * fStack_414 +
                     fVar334 * fVar310 + fVar341 * fVar289 + fVar240 * fStack_694;
        fStack_530 = fVar294 * fStack_410 +
                     fVar328 * fStack_3f0 + fVar335 * fVar219 + fVar226 * fStack_690;
        fStack_52c = fVar301 * fStack_40c +
                     fVar332 * fStack_3ec + fVar339 * fVar290 + fVar234 * fStack_68c;
        fStack_528 = fVar302 * fStack_408 +
                     fVar333 * fStack_3e8 + fVar340 * fVar291 + fVar237 * fStack_688;
        fStack_524 = fVar313 + fStack_424 + auVar149._28_4_ + auVar25._28_4_;
        fVar252 = *(float *)(bezier_basis0 + lVar136 + 0x1210);
        fVar253 = *(float *)(bezier_basis0 + lVar136 + 0x1214);
        fVar254 = *(float *)(bezier_basis0 + lVar136 + 0x1218);
        fVar255 = *(float *)(bezier_basis0 + lVar136 + 0x121c);
        fVar256 = *(float *)(bezier_basis0 + lVar136 + 0x1220);
        fVar257 = *(float *)(bezier_basis0 + lVar136 + 0x1224);
        fVar286 = *(float *)(bezier_basis0 + lVar136 + 0x1228);
        fVar217 = *(float *)(bezier_basis0 + lVar136 + 0x1694);
        fVar288 = *(float *)(bezier_basis0 + lVar136 + 0x1698);
        fVar287 = *(float *)(bezier_basis0 + lVar136 + 0x169c);
        fVar289 = *(float *)(bezier_basis0 + lVar136 + 0x16a0);
        fVar219 = *(float *)(bezier_basis0 + lVar136 + 0x16a4);
        fVar290 = *(float *)(bezier_basis0 + lVar136 + 0x16a8);
        fVar291 = *(float *)(bezier_basis0 + lVar136 + 0x16ac);
        fVar293 = *(float *)(bezier_basis0 + lVar136 + 0x1b18);
        fVar221 = *(float *)(bezier_basis0 + lVar136 + 0x1b1c);
        fVar292 = *(float *)(bezier_basis0 + lVar136 + 0x1b20);
        fVar310 = *(float *)(bezier_basis0 + lVar136 + 0x1b24);
        fVar312 = *(float *)(bezier_basis0 + lVar136 + 0x1b28);
        fVar162 = *(float *)(bezier_basis0 + lVar136 + 0x1b2c);
        fVar314 = *(float *)(bezier_basis0 + lVar136 + 0x1b30);
        fVar140 = *(float *)(bezier_basis0 + lVar136 + 0x1f9c);
        fVar157 = *(float *)(bezier_basis0 + lVar136 + 0x1fa0);
        fVar158 = *(float *)(bezier_basis0 + lVar136 + 0x1fa4);
        fVar159 = *(float *)(bezier_basis0 + lVar136 + 0x1fa8);
        fVar160 = *(float *)(bezier_basis0 + lVar136 + 0x1fac);
        fVar161 = *(float *)(bezier_basis0 + lVar136 + 0x1fb0);
        fVar164 = *(float *)(bezier_basis0 + lVar136 + 0x1fb4);
        fVar178 = *(float *)(bezier_basis0 + lVar136 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar136 + 0x1fb8);
        fVar180 = *(float *)(bezier_basis0 + lVar136 + 0x16b0) + fVar178;
        local_400 = fVar225 * fVar252 + fVar315 * fVar217 + fVar163 * fVar293 + fVar202 * fVar140;
        fStack_3fc = fVar233 * fVar253 + fVar319 * fVar288 + fVar177 * fVar221 + fVar218 * fVar157;
        fStack_3f8 = fVar236 * fVar254 + fVar320 * fVar287 + fVar179 * fVar292 + fVar232 * fVar158;
        fStack_3f4 = fVar239 * fVar255 + fVar321 * fVar289 + fVar181 * fVar310 + fVar242 * fVar159;
        fStack_3f0 = fVar225 * fVar256 + fVar315 * fVar219 + fVar163 * fVar312 + fVar202 * fVar160;
        fStack_3ec = fVar233 * fVar257 + fVar319 * fVar290 + fVar177 * fVar162 + fVar218 * fVar161;
        fStack_3e8 = fVar236 * fVar286 + fVar320 * fVar291 + fVar179 * fVar314 + fVar232 * fVar164;
        fStack_3e4 = *(float *)(bezier_basis0 + lVar136 + 0x16b0) +
                     *(float *)(bezier_basis0 + lVar136 + 0x1fb8) +
                     fVar303 + *(float *)(bezier_basis1 + lVar136 + 0x4a0);
        auVar273._0_4_ =
             fVar304 * fVar252 + fVar187 * fVar293 + fVar214 * fVar140 + fVar342 * fVar217;
        auVar273._4_4_ =
             fVar309 * fVar253 + fVar199 * fVar221 + fVar220 * fVar157 + fVar346 * fVar288;
        auVar273._8_4_ =
             fVar311 * fVar254 + fVar200 * fVar292 + fVar235 * fVar158 + fVar347 * fVar287;
        auVar273._12_4_ =
             fVar313 * fVar255 + fVar201 * fVar310 + fVar243 * fVar159 + fVar348 * fVar289;
        auVar273._16_4_ =
             fVar304 * fVar256 + fVar187 * fVar312 + fVar214 * fVar160 + fVar342 * fVar219;
        auVar273._20_4_ =
             fVar309 * fVar257 + fVar199 * fVar162 + fVar220 * fVar161 + fVar346 * fVar290;
        auVar273._24_4_ =
             fVar311 * fVar286 + fVar200 * fVar314 + fVar235 * fVar164 + fVar347 * fVar291;
        auVar273._28_4_ =
             fVar178 + fVar303 + *(float *)(bezier_basis1 + lVar136 + 0x1c) +
                       fVar303 + *(float *)(bezier_basis1 + lVar136 + 0x4a0);
        local_420._4_4_ =
             fVar332 * fVar288 + fVar339 * fVar221 + fVar234 * fVar157 + fVar301 * fVar253;
        local_420._0_4_ =
             fVar328 * fVar217 + fVar335 * fVar293 + fVar226 * fVar140 + fVar294 * fVar252;
        fStack_418 = fVar333 * fVar287 + fVar340 * fVar292 + fVar237 * fVar158 + fVar302 * fVar254;
        fStack_414 = fVar334 * fVar289 + fVar341 * fVar310 + fVar240 * fVar159 + fVar303 * fVar255;
        fStack_410 = fVar328 * fVar219 + fVar335 * fVar312 + fVar226 * fVar160 + fVar294 * fVar256;
        fStack_40c = fVar332 * fVar290 + fVar339 * fVar162 + fVar234 * fVar161 + fVar301 * fVar257;
        fStack_408 = fVar333 * fVar291 + fVar340 * fVar314 + fVar237 * fVar164 + fVar302 * fVar286;
        fStack_404 = fVar180 + *(float *)(bezier_basis0 + lVar136 + 0x122c);
        fVar252 = *(float *)(bezier_basis1 + lVar136 + 0x1b18);
        fVar253 = *(float *)(bezier_basis1 + lVar136 + 0x1b1c);
        fVar254 = *(float *)(bezier_basis1 + lVar136 + 0x1b20);
        fVar255 = *(float *)(bezier_basis1 + lVar136 + 0x1b24);
        fVar256 = *(float *)(bezier_basis1 + lVar136 + 0x1b28);
        fVar257 = *(float *)(bezier_basis1 + lVar136 + 0x1b2c);
        fVar286 = *(float *)(bezier_basis1 + lVar136 + 0x1b30);
        fVar217 = *(float *)(bezier_basis1 + lVar136 + 0x1f9c);
        fVar288 = *(float *)(bezier_basis1 + lVar136 + 0x1fa0);
        fVar287 = *(float *)(bezier_basis1 + lVar136 + 0x1fa4);
        fVar289 = *(float *)(bezier_basis1 + lVar136 + 0x1fa8);
        fVar219 = *(float *)(bezier_basis1 + lVar136 + 0x1fac);
        fVar290 = *(float *)(bezier_basis1 + lVar136 + 0x1fb0);
        fVar291 = *(float *)(bezier_basis1 + lVar136 + 0x1fb4);
        fVar293 = *(float *)(bezier_basis1 + lVar136 + 0x1694);
        fVar221 = *(float *)(bezier_basis1 + lVar136 + 0x1698);
        fVar292 = *(float *)(bezier_basis1 + lVar136 + 0x169c);
        fVar310 = *(float *)(bezier_basis1 + lVar136 + 0x16a0);
        fVar312 = *(float *)(bezier_basis1 + lVar136 + 0x16a4);
        fVar162 = *(float *)(bezier_basis1 + lVar136 + 0x16a8);
        fVar314 = *(float *)(bezier_basis1 + lVar136 + 0x16ac);
        fVar140 = *(float *)(bezier_basis1 + lVar136 + 0x1210);
        fVar157 = *(float *)(bezier_basis1 + lVar136 + 0x1214);
        fVar158 = *(float *)(bezier_basis1 + lVar136 + 0x1218);
        fVar159 = *(float *)(bezier_basis1 + lVar136 + 0x121c);
        fVar160 = *(float *)(bezier_basis1 + lVar136 + 0x1220);
        fVar161 = *(float *)(bezier_basis1 + lVar136 + 0x1224);
        fVar164 = *(float *)(bezier_basis1 + lVar136 + 0x1228);
        auVar281._0_4_ =
             fVar225 * fVar140 + fVar315 * fVar293 + fVar163 * fVar252 + fVar202 * fVar217;
        auVar281._4_4_ =
             fVar233 * fVar157 + fVar319 * fVar221 + fVar177 * fVar253 + fVar218 * fVar288;
        auVar281._8_4_ =
             fVar236 * fVar158 + fVar320 * fVar292 + fVar179 * fVar254 + fVar232 * fVar287;
        auVar281._12_4_ =
             fVar239 * fVar159 + fVar321 * fVar310 + fVar181 * fVar255 + fVar242 * fVar289;
        auVar281._16_4_ =
             fVar225 * fVar160 + fVar315 * fVar312 + fVar163 * fVar256 + fVar202 * fVar219;
        auVar281._20_4_ =
             fVar233 * fVar161 + fVar319 * fVar162 + fVar177 * fVar257 + fVar218 * fVar290;
        auVar281._24_4_ =
             fVar236 * fVar164 + fVar320 * fVar314 + fVar179 * fVar286 + fVar232 * fVar291;
        auVar281._28_4_ = fVar201 + fVar201 + fVar303 + fVar180;
        auVar296._0_4_ =
             fVar304 * fVar140 + fVar342 * fVar293 + fVar187 * fVar252 + fVar214 * fVar217;
        auVar296._4_4_ =
             fVar309 * fVar157 + fVar346 * fVar221 + fVar199 * fVar253 + fVar220 * fVar288;
        auVar296._8_4_ =
             fVar311 * fVar158 + fVar347 * fVar292 + fVar200 * fVar254 + fVar235 * fVar287;
        auVar296._12_4_ =
             fVar313 * fVar159 + fVar348 * fVar310 + fVar201 * fVar255 + fVar243 * fVar289;
        auVar296._16_4_ =
             fVar304 * fVar160 + fVar342 * fVar312 + fVar187 * fVar256 + fVar214 * fVar219;
        auVar296._20_4_ =
             fVar309 * fVar161 + fVar346 * fVar162 + fVar199 * fVar257 + fVar220 * fVar290;
        auVar296._24_4_ =
             fVar311 * fVar164 + fVar347 * fVar314 + fVar200 * fVar286 + fVar235 * fVar291;
        auVar296._28_4_ = fVar201 + fVar201 + fVar201 + fVar303;
        auVar198._0_4_ =
             fVar294 * fVar140 + fVar328 * fVar293 + fVar335 * fVar252 + fVar217 * fVar226;
        auVar198._4_4_ =
             fVar301 * fVar157 + fVar332 * fVar221 + fVar339 * fVar253 + fVar288 * fVar234;
        auVar198._8_4_ =
             fVar302 * fVar158 + fVar333 * fVar292 + fVar340 * fVar254 + fVar287 * fVar237;
        auVar198._12_4_ =
             fVar303 * fVar159 + fVar334 * fVar310 + fVar341 * fVar255 + fVar289 * fVar240;
        auVar198._16_4_ =
             fVar294 * fVar160 + fVar328 * fVar312 + fVar335 * fVar256 + fVar219 * fVar226;
        auVar198._20_4_ =
             fVar301 * fVar161 + fVar332 * fVar162 + fVar339 * fVar257 + fVar290 * fVar234;
        auVar198._24_4_ =
             fVar302 * fVar164 + fVar333 * fVar314 + fVar340 * fVar286 + fVar291 * fVar237;
        auVar198._28_4_ =
             *(float *)(bezier_basis1 + lVar136 + 0x122c) +
             *(float *)(bezier_basis1 + lVar136 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar136 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar136 + 0x1fb8);
        auVar228._8_4_ = 0x7fffffff;
        auVar228._0_8_ = 0x7fffffff7fffffff;
        auVar228._12_4_ = 0x7fffffff;
        auVar228._16_4_ = 0x7fffffff;
        auVar228._20_4_ = 0x7fffffff;
        auVar228._24_4_ = 0x7fffffff;
        auVar228._28_4_ = 0x7fffffff;
        auVar124._4_4_ = fStack_3fc;
        auVar124._0_4_ = local_400;
        auVar124._8_4_ = fStack_3f8;
        auVar124._12_4_ = fStack_3f4;
        auVar124._16_4_ = fStack_3f0;
        auVar124._20_4_ = fStack_3ec;
        auVar124._24_4_ = fStack_3e8;
        auVar124._28_4_ = fStack_3e4;
        auVar25 = vandps_avx(auVar124,auVar228);
        auVar28 = vandps_avx(auVar273,auVar228);
        auVar28 = vmaxps_avx(auVar25,auVar28);
        auVar25 = vandps_avx(auVar228,_local_420);
        auVar25 = vmaxps_avx(auVar28,auVar25);
        auVar248 = vpermilps_avx(auVar248,0);
        auVar274._16_16_ = auVar248;
        auVar274._0_16_ = auVar248;
        auVar25 = vcmpps_avx(auVar25,auVar274,1);
        auVar29 = vblendvps_avx(auVar124,auVar26,auVar25);
        auVar30 = vblendvps_avx(auVar273,auVar27,auVar25);
        auVar25 = vandps_avx(auVar281,auVar228);
        auVar28 = vandps_avx(auVar296,auVar228);
        auVar31 = vmaxps_avx(auVar25,auVar28);
        auVar25 = vandps_avx(auVar198,auVar228);
        auVar25 = vmaxps_avx(auVar31,auVar25);
        auVar31 = vcmpps_avx(auVar25,auVar274,1);
        auVar25 = vblendvps_avx(auVar281,auVar26,auVar31);
        auVar26 = vblendvps_avx(auVar296,auVar27,auVar31);
        fVar140 = auVar29._0_4_;
        fVar157 = auVar29._4_4_;
        fVar158 = auVar29._8_4_;
        fVar159 = auVar29._12_4_;
        fVar160 = auVar29._16_4_;
        fVar161 = auVar29._20_4_;
        fVar164 = auVar29._24_4_;
        fVar178 = auVar25._0_4_;
        fVar180 = auVar25._4_4_;
        fVar182 = auVar25._8_4_;
        fVar183 = auVar25._12_4_;
        fVar185 = auVar25._16_4_;
        fVar186 = auVar25._20_4_;
        fVar265 = auVar25._24_4_;
        fVar223 = -auVar25._28_4_;
        fVar202 = auVar30._0_4_;
        fVar232 = auVar30._4_4_;
        fVar252 = auVar30._8_4_;
        fVar256 = auVar30._12_4_;
        fVar288 = auVar30._16_4_;
        fVar290 = auVar30._20_4_;
        fVar292 = auVar30._24_4_;
        auVar145._0_4_ = fVar202 * fVar202 + fVar140 * fVar140;
        auVar145._4_4_ = fVar232 * fVar232 + fVar157 * fVar157;
        auVar145._8_4_ = fVar252 * fVar252 + fVar158 * fVar158;
        auVar145._12_4_ = fVar256 * fVar256 + fVar159 * fVar159;
        auVar145._16_4_ = fVar288 * fVar288 + fVar160 * fVar160;
        auVar145._20_4_ = fVar290 * fVar290 + fVar161 * fVar161;
        auVar145._24_4_ = fVar292 * fVar292 + fVar164 * fVar164;
        auVar145._28_4_ = auVar296._28_4_ + auVar29._28_4_;
        auVar27 = vrsqrtps_avx(auVar145);
        fVar214 = auVar27._0_4_;
        fVar218 = auVar27._4_4_;
        auVar38._4_4_ = fVar218 * 1.5;
        auVar38._0_4_ = fVar214 * 1.5;
        fVar220 = auVar27._8_4_;
        auVar38._8_4_ = fVar220 * 1.5;
        fVar235 = auVar27._12_4_;
        auVar38._12_4_ = fVar235 * 1.5;
        fVar242 = auVar27._16_4_;
        auVar38._16_4_ = fVar242 * 1.5;
        fVar243 = auVar27._20_4_;
        auVar38._20_4_ = fVar243 * 1.5;
        fVar253 = auVar27._24_4_;
        fVar314 = auVar28._28_4_;
        auVar38._24_4_ = fVar253 * 1.5;
        auVar38._28_4_ = fVar314;
        auVar39._4_4_ = fVar218 * fVar218 * fVar218 * auVar145._4_4_ * 0.5;
        auVar39._0_4_ = fVar214 * fVar214 * fVar214 * auVar145._0_4_ * 0.5;
        auVar39._8_4_ = fVar220 * fVar220 * fVar220 * auVar145._8_4_ * 0.5;
        auVar39._12_4_ = fVar235 * fVar235 * fVar235 * auVar145._12_4_ * 0.5;
        auVar39._16_4_ = fVar242 * fVar242 * fVar242 * auVar145._16_4_ * 0.5;
        auVar39._20_4_ = fVar243 * fVar243 * fVar243 * auVar145._20_4_ * 0.5;
        auVar39._24_4_ = fVar253 * fVar253 * fVar253 * auVar145._24_4_ * 0.5;
        auVar39._28_4_ = auVar145._28_4_;
        auVar27 = vsubps_avx(auVar38,auVar39);
        fVar214 = auVar27._0_4_;
        fVar235 = auVar27._4_4_;
        fVar253 = auVar27._8_4_;
        fVar257 = auVar27._12_4_;
        fVar287 = auVar27._16_4_;
        fVar291 = auVar27._20_4_;
        fVar310 = auVar27._24_4_;
        fVar218 = auVar26._0_4_;
        fVar242 = auVar26._4_4_;
        fVar254 = auVar26._8_4_;
        fVar286 = auVar26._12_4_;
        fVar289 = auVar26._16_4_;
        fVar293 = auVar26._20_4_;
        fVar312 = auVar26._24_4_;
        auVar146._0_4_ = fVar218 * fVar218 + fVar178 * fVar178;
        auVar146._4_4_ = fVar242 * fVar242 + fVar180 * fVar180;
        auVar146._8_4_ = fVar254 * fVar254 + fVar182 * fVar182;
        auVar146._12_4_ = fVar286 * fVar286 + fVar183 * fVar183;
        auVar146._16_4_ = fVar289 * fVar289 + fVar185 * fVar185;
        auVar146._20_4_ = fVar293 * fVar293 + fVar186 * fVar186;
        auVar146._24_4_ = fVar312 * fVar312 + fVar265 * fVar265;
        auVar146._28_4_ = auVar25._28_4_ + auVar27._28_4_;
        auVar25 = vrsqrtps_avx(auVar146);
        fVar220 = auVar25._0_4_;
        fVar243 = auVar25._4_4_;
        auVar40._4_4_ = fVar243 * 1.5;
        auVar40._0_4_ = fVar220 * 1.5;
        fVar255 = auVar25._8_4_;
        auVar40._8_4_ = fVar255 * 1.5;
        fVar217 = auVar25._12_4_;
        auVar40._12_4_ = fVar217 * 1.5;
        fVar219 = auVar25._16_4_;
        auVar40._16_4_ = fVar219 * 1.5;
        fVar221 = auVar25._20_4_;
        auVar40._20_4_ = fVar221 * 1.5;
        fVar162 = auVar25._24_4_;
        auVar40._24_4_ = fVar162 * 1.5;
        auVar40._28_4_ = fVar314;
        auVar41._4_4_ = fVar243 * fVar243 * fVar243 * auVar146._4_4_ * 0.5;
        auVar41._0_4_ = fVar220 * fVar220 * fVar220 * auVar146._0_4_ * 0.5;
        auVar41._8_4_ = fVar255 * fVar255 * fVar255 * auVar146._8_4_ * 0.5;
        auVar41._12_4_ = fVar217 * fVar217 * fVar217 * auVar146._12_4_ * 0.5;
        auVar41._16_4_ = fVar219 * fVar219 * fVar219 * auVar146._16_4_ * 0.5;
        auVar41._20_4_ = fVar221 * fVar221 * fVar221 * auVar146._20_4_ * 0.5;
        auVar41._24_4_ = fVar162 * fVar162 * fVar162 * auVar146._24_4_ * 0.5;
        auVar41._28_4_ = auVar146._28_4_;
        auVar25 = vsubps_avx(auVar40,auVar41);
        fVar220 = auVar25._0_4_;
        fVar243 = auVar25._4_4_;
        fVar255 = auVar25._8_4_;
        fVar217 = auVar25._12_4_;
        fVar219 = auVar25._16_4_;
        fVar221 = auVar25._20_4_;
        fVar162 = auVar25._24_4_;
        fVar202 = (float)local_7a0._0_4_ * fVar202 * fVar214;
        fVar232 = (float)local_7a0._4_4_ * fVar232 * fVar235;
        auVar42._4_4_ = fVar232;
        auVar42._0_4_ = fVar202;
        fVar252 = fStack_798 * fVar252 * fVar253;
        auVar42._8_4_ = fVar252;
        fVar256 = fStack_794 * fVar256 * fVar257;
        auVar42._12_4_ = fVar256;
        fVar288 = fStack_790 * fVar288 * fVar287;
        auVar42._16_4_ = fVar288;
        fVar290 = fStack_78c * fVar290 * fVar291;
        auVar42._20_4_ = fVar290;
        fVar292 = fStack_788 * fVar292 * fVar310;
        auVar42._24_4_ = fVar292;
        auVar42._28_4_ = fVar223;
        local_6a0._4_4_ = fVar232 + auVar262._4_4_;
        local_6a0._0_4_ = fVar202 + auVar262._0_4_;
        fStack_698 = fVar252 + auVar262._8_4_;
        fStack_694 = fVar256 + auVar262._12_4_;
        fStack_690 = fVar288 + auVar262._16_4_;
        fStack_68c = fVar290 + auVar262._20_4_;
        fStack_688 = fVar292 + auVar262._24_4_;
        fStack_684 = fVar223 + auVar262._28_4_;
        fVar202 = (float)local_7a0._0_4_ * fVar214 * -fVar140;
        fVar232 = (float)local_7a0._4_4_ * fVar235 * -fVar157;
        auVar43._4_4_ = fVar232;
        auVar43._0_4_ = fVar202;
        fVar252 = fStack_798 * fVar253 * -fVar158;
        auVar43._8_4_ = fVar252;
        fVar256 = fStack_794 * fVar257 * -fVar159;
        auVar43._12_4_ = fVar256;
        fVar288 = fStack_790 * fVar287 * -fVar160;
        auVar43._16_4_ = fVar288;
        fVar290 = fStack_78c * fVar291 * -fVar161;
        auVar43._20_4_ = fVar290;
        fVar292 = fStack_788 * fVar310 * -fVar164;
        auVar43._24_4_ = fVar292;
        auVar43._28_4_ = fVar314;
        local_560._4_4_ = fVar232 + auVar323._4_4_;
        local_560._0_4_ = fVar202 + auVar323._0_4_;
        fStack_558 = fVar252 + auVar323._8_4_;
        fStack_554 = fVar256 + auVar323._12_4_;
        fStack_550 = fVar288 + auVar323._16_4_;
        fStack_54c = fVar290 + auVar323._20_4_;
        fStack_548 = fVar292 + auVar323._24_4_;
        fStack_544 = fVar314 + auVar323._28_4_;
        fVar202 = fVar214 * 0.0 * (float)local_7a0._0_4_;
        fVar214 = fVar235 * 0.0 * (float)local_7a0._4_4_;
        auVar44._4_4_ = fVar214;
        auVar44._0_4_ = fVar202;
        fVar232 = fVar253 * 0.0 * fStack_798;
        auVar44._8_4_ = fVar232;
        fVar235 = fVar257 * 0.0 * fStack_794;
        auVar44._12_4_ = fVar235;
        fVar252 = fVar287 * 0.0 * fStack_790;
        auVar44._16_4_ = fVar252;
        fVar253 = fVar291 * 0.0 * fStack_78c;
        auVar44._20_4_ = fVar253;
        fVar256 = fVar310 * 0.0 * fStack_788;
        auVar44._24_4_ = fVar256;
        auVar44._28_4_ = fVar181;
        auVar121._4_4_ = fStack_53c;
        auVar121._0_4_ = local_540;
        auVar121._8_4_ = fStack_538;
        auVar121._12_4_ = fStack_534;
        auVar121._16_4_ = fStack_530;
        auVar121._20_4_ = fStack_52c;
        auVar121._24_4_ = fStack_528;
        auVar121._28_4_ = fStack_524;
        auVar275._0_4_ = local_540 + fVar202;
        auVar275._4_4_ = fStack_53c + fVar214;
        auVar275._8_4_ = fStack_538 + fVar232;
        auVar275._12_4_ = fStack_534 + fVar235;
        auVar275._16_4_ = fStack_530 + fVar252;
        auVar275._20_4_ = fStack_52c + fVar253;
        auVar275._24_4_ = fStack_528 + fVar256;
        auVar275._28_4_ = fStack_524 + fVar181;
        fVar202 = local_4a0._0_4_ * fVar218 * fVar220;
        fVar214 = local_4a0._4_4_ * fVar242 * fVar243;
        auVar45._4_4_ = fVar214;
        auVar45._0_4_ = fVar202;
        fVar218 = local_4a0._8_4_ * fVar254 * fVar255;
        auVar45._8_4_ = fVar218;
        fVar232 = local_4a0._12_4_ * fVar286 * fVar217;
        auVar45._12_4_ = fVar232;
        fVar235 = local_4a0._16_4_ * fVar289 * fVar219;
        auVar45._16_4_ = fVar235;
        fVar242 = local_4a0._20_4_ * fVar293 * fVar221;
        auVar45._20_4_ = fVar242;
        fVar252 = local_4a0._24_4_ * fVar312 * fVar162;
        auVar45._24_4_ = fVar252;
        auVar45._28_4_ = auVar26._28_4_;
        auVar29 = vsubps_avx(auVar262,auVar42);
        auVar297._0_4_ = (float)local_3e0._0_4_ + fVar202;
        auVar297._4_4_ = (float)local_3e0._4_4_ + fVar214;
        auVar297._8_4_ = fStack_3d8 + fVar218;
        auVar297._12_4_ = fStack_3d4 + fVar232;
        auVar297._16_4_ = fStack_3d0 + fVar235;
        auVar297._20_4_ = fStack_3cc + fVar242;
        auVar297._24_4_ = fStack_3c8 + fVar252;
        auVar297._28_4_ = fStack_3c4 + auVar26._28_4_;
        fVar202 = local_4a0._0_4_ * -fVar178 * fVar220;
        fVar214 = local_4a0._4_4_ * -fVar180 * fVar243;
        auVar46._4_4_ = fVar214;
        auVar46._0_4_ = fVar202;
        fVar218 = local_4a0._8_4_ * -fVar182 * fVar255;
        auVar46._8_4_ = fVar218;
        fVar232 = local_4a0._12_4_ * -fVar183 * fVar217;
        auVar46._12_4_ = fVar232;
        fVar235 = local_4a0._16_4_ * -fVar185 * fVar219;
        auVar46._16_4_ = fVar235;
        fVar242 = local_4a0._20_4_ * -fVar186 * fVar221;
        auVar46._20_4_ = fVar242;
        fVar252 = local_4a0._24_4_ * -fVar265 * fVar162;
        auVar46._24_4_ = fVar252;
        auVar46._28_4_ = fVar334;
        auVar30 = vsubps_avx(auVar323,auVar43);
        auVar306._0_4_ = fVar202 + (float)local_520._0_4_;
        auVar306._4_4_ = fVar214 + (float)local_520._4_4_;
        auVar306._8_4_ = fVar218 + fStack_518;
        auVar306._12_4_ = fVar232 + fStack_514;
        auVar306._16_4_ = fVar235 + fStack_510;
        auVar306._20_4_ = fVar242 + fStack_50c;
        auVar306._24_4_ = fVar252 + fStack_508;
        auVar306._28_4_ = fVar334 + fStack_504;
        fVar202 = fVar220 * 0.0 * local_4a0._0_4_;
        fVar214 = fVar243 * 0.0 * local_4a0._4_4_;
        auVar47._4_4_ = fVar214;
        auVar47._0_4_ = fVar202;
        fVar218 = fVar255 * 0.0 * local_4a0._8_4_;
        auVar47._8_4_ = fVar218;
        fVar220 = fVar217 * 0.0 * local_4a0._12_4_;
        auVar47._12_4_ = fVar220;
        fVar232 = fVar219 * 0.0 * local_4a0._16_4_;
        auVar47._16_4_ = fVar232;
        fVar235 = fVar221 * 0.0 * local_4a0._20_4_;
        auVar47._20_4_ = fVar235;
        fVar242 = fVar162 * 0.0 * local_4a0._24_4_;
        auVar47._24_4_ = fVar242;
        auVar47._28_4_ = fVar341;
        auVar32 = vsubps_avx(auVar121,auVar44);
        auVar344._0_4_ = fVar202 + (float)local_440._0_4_;
        auVar344._4_4_ = fVar214 + (float)local_440._4_4_;
        auVar344._8_4_ = fVar218 + fStack_438;
        auVar344._12_4_ = fVar220 + fStack_434;
        auVar344._16_4_ = fVar232 + fStack_430;
        auVar344._20_4_ = fVar235 + fStack_42c;
        auVar344._24_4_ = fVar242 + fStack_428;
        auVar344._28_4_ = fVar341 + fStack_424;
        auVar25 = vsubps_avx(_local_3e0,auVar45);
        auVar26 = vsubps_avx(_local_520,auVar46);
        auVar27 = vsubps_avx(_local_440,auVar47);
        auVar28 = vsubps_avx(auVar306,auVar30);
        auVar31 = vsubps_avx(auVar344,auVar32);
        auVar48._4_4_ = auVar32._4_4_ * auVar28._4_4_;
        auVar48._0_4_ = auVar32._0_4_ * auVar28._0_4_;
        auVar48._8_4_ = auVar32._8_4_ * auVar28._8_4_;
        auVar48._12_4_ = auVar32._12_4_ * auVar28._12_4_;
        auVar48._16_4_ = auVar32._16_4_ * auVar28._16_4_;
        auVar48._20_4_ = auVar32._20_4_ * auVar28._20_4_;
        auVar48._24_4_ = auVar32._24_4_ * auVar28._24_4_;
        auVar48._28_4_ = fVar341;
        auVar49._4_4_ = auVar30._4_4_ * auVar31._4_4_;
        auVar49._0_4_ = auVar30._0_4_ * auVar31._0_4_;
        auVar49._8_4_ = auVar30._8_4_ * auVar31._8_4_;
        auVar49._12_4_ = auVar30._12_4_ * auVar31._12_4_;
        auVar49._16_4_ = auVar30._16_4_ * auVar31._16_4_;
        auVar49._20_4_ = auVar30._20_4_ * auVar31._20_4_;
        auVar49._24_4_ = auVar30._24_4_ * auVar31._24_4_;
        auVar49._28_4_ = fStack_424;
        auVar24 = vsubps_avx(auVar49,auVar48);
        auVar50._4_4_ = auVar29._4_4_ * auVar31._4_4_;
        auVar50._0_4_ = auVar29._0_4_ * auVar31._0_4_;
        auVar50._8_4_ = auVar29._8_4_ * auVar31._8_4_;
        auVar50._12_4_ = auVar29._12_4_ * auVar31._12_4_;
        auVar50._16_4_ = auVar29._16_4_ * auVar31._16_4_;
        auVar50._20_4_ = auVar29._20_4_ * auVar31._20_4_;
        auVar50._24_4_ = auVar29._24_4_ * auVar31._24_4_;
        auVar50._28_4_ = auVar31._28_4_;
        auVar33 = vsubps_avx(auVar297,auVar29);
        auVar51._4_4_ = auVar32._4_4_ * auVar33._4_4_;
        auVar51._0_4_ = auVar32._0_4_ * auVar33._0_4_;
        auVar51._8_4_ = auVar32._8_4_ * auVar33._8_4_;
        auVar51._12_4_ = auVar32._12_4_ * auVar33._12_4_;
        auVar51._16_4_ = auVar32._16_4_ * auVar33._16_4_;
        auVar51._20_4_ = auVar32._20_4_ * auVar33._20_4_;
        auVar51._24_4_ = auVar32._24_4_ * auVar33._24_4_;
        auVar51._28_4_ = fStack_504;
        auVar143 = vsubps_avx(auVar51,auVar50);
        auVar52._4_4_ = auVar33._4_4_ * auVar30._4_4_;
        auVar52._0_4_ = auVar33._0_4_ * auVar30._0_4_;
        auVar52._8_4_ = auVar33._8_4_ * auVar30._8_4_;
        auVar52._12_4_ = auVar33._12_4_ * auVar30._12_4_;
        auVar52._16_4_ = auVar33._16_4_ * auVar30._16_4_;
        auVar52._20_4_ = auVar33._20_4_ * auVar30._20_4_;
        auVar52._24_4_ = auVar33._24_4_ * auVar30._24_4_;
        auVar52._28_4_ = auVar31._28_4_;
        auVar53._4_4_ = auVar29._4_4_ * auVar28._4_4_;
        auVar53._0_4_ = auVar29._0_4_ * auVar28._0_4_;
        auVar53._8_4_ = auVar29._8_4_ * auVar28._8_4_;
        auVar53._12_4_ = auVar29._12_4_ * auVar28._12_4_;
        auVar53._16_4_ = auVar29._16_4_ * auVar28._16_4_;
        auVar53._20_4_ = auVar29._20_4_ * auVar28._20_4_;
        auVar53._24_4_ = auVar29._24_4_ * auVar28._24_4_;
        auVar53._28_4_ = auVar28._28_4_;
        auVar28 = vsubps_avx(auVar53,auVar52);
        auVar147._0_4_ = auVar24._0_4_ * 0.0 + auVar28._0_4_ + auVar143._0_4_ * 0.0;
        auVar147._4_4_ = auVar24._4_4_ * 0.0 + auVar28._4_4_ + auVar143._4_4_ * 0.0;
        auVar147._8_4_ = auVar24._8_4_ * 0.0 + auVar28._8_4_ + auVar143._8_4_ * 0.0;
        auVar147._12_4_ = auVar24._12_4_ * 0.0 + auVar28._12_4_ + auVar143._12_4_ * 0.0;
        auVar147._16_4_ = auVar24._16_4_ * 0.0 + auVar28._16_4_ + auVar143._16_4_ * 0.0;
        auVar147._20_4_ = auVar24._20_4_ * 0.0 + auVar28._20_4_ + auVar143._20_4_ * 0.0;
        auVar147._24_4_ = auVar24._24_4_ * 0.0 + auVar28._24_4_ + auVar143._24_4_ * 0.0;
        auVar147._28_4_ = auVar28._28_4_ + auVar28._28_4_ + auVar143._28_4_;
        auVar31 = vcmpps_avx(auVar147,ZEXT432(0) << 0x20,2);
        _local_500 = vblendvps_avx(auVar25,_local_6a0,auVar31);
        local_3c0 = vblendvps_avx(auVar26,_local_560,auVar31);
        auVar25 = vblendvps_avx(auVar27,auVar275,auVar31);
        auVar26 = vblendvps_avx(auVar29,auVar297,auVar31);
        auVar27 = vblendvps_avx(auVar30,auVar306,auVar31);
        auVar28 = vblendvps_avx(auVar32,auVar344,auVar31);
        auVar29 = vblendvps_avx(auVar297,auVar29,auVar31);
        auVar30 = vblendvps_avx(auVar306,auVar30,auVar31);
        local_720 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
        auStack_710 = auVar149._16_16_;
        auVar149 = vblendvps_avx(auVar344,auVar32,auVar31);
        auVar29 = vsubps_avx(auVar29,_local_500);
        auVar24 = vsubps_avx(auVar30,local_3c0);
        auVar33 = vsubps_avx(auVar149,auVar25);
        auVar149 = vsubps_avx(local_3c0,auVar27);
        fVar202 = auVar24._0_4_;
        fVar164 = auVar25._0_4_;
        fVar235 = auVar24._4_4_;
        fVar178 = auVar25._4_4_;
        auVar54._4_4_ = fVar178 * fVar235;
        auVar54._0_4_ = fVar164 * fVar202;
        fVar254 = auVar24._8_4_;
        fVar180 = auVar25._8_4_;
        auVar54._8_4_ = fVar180 * fVar254;
        fVar217 = auVar24._12_4_;
        fVar182 = auVar25._12_4_;
        auVar54._12_4_ = fVar182 * fVar217;
        fVar290 = auVar24._16_4_;
        fVar183 = auVar25._16_4_;
        auVar54._16_4_ = fVar183 * fVar290;
        fVar310 = auVar24._20_4_;
        fVar185 = auVar25._20_4_;
        auVar54._20_4_ = fVar185 * fVar310;
        fVar157 = auVar24._24_4_;
        fVar186 = auVar25._24_4_;
        auVar54._24_4_ = fVar186 * fVar157;
        auVar54._28_4_ = auVar30._28_4_;
        fVar214 = local_3c0._0_4_;
        fVar179 = auVar33._0_4_;
        fVar242 = local_3c0._4_4_;
        fVar181 = auVar33._4_4_;
        auVar55._4_4_ = fVar181 * fVar242;
        auVar55._0_4_ = fVar179 * fVar214;
        fVar255 = local_3c0._8_4_;
        fVar225 = auVar33._8_4_;
        auVar55._8_4_ = fVar225 * fVar255;
        fVar288 = local_3c0._12_4_;
        fVar233 = auVar33._12_4_;
        auVar55._12_4_ = fVar233 * fVar288;
        fVar291 = local_3c0._16_4_;
        fVar236 = auVar33._16_4_;
        auVar55._16_4_ = fVar236 * fVar291;
        fVar312 = local_3c0._20_4_;
        fVar239 = auVar33._20_4_;
        auVar55._20_4_ = fVar239 * fVar312;
        fVar158 = local_3c0._24_4_;
        fVar226 = auVar33._24_4_;
        uVar9 = auVar32._28_4_;
        auVar55._24_4_ = fVar226 * fVar158;
        auVar55._28_4_ = uVar9;
        auVar30 = vsubps_avx(auVar55,auVar54);
        fVar218 = local_500._0_4_;
        fVar243 = local_500._4_4_;
        auVar56._4_4_ = fVar181 * fVar243;
        auVar56._0_4_ = fVar179 * fVar218;
        fVar256 = local_500._8_4_;
        auVar56._8_4_ = fVar225 * fVar256;
        fVar287 = local_500._12_4_;
        auVar56._12_4_ = fVar233 * fVar287;
        fVar293 = local_500._16_4_;
        auVar56._16_4_ = fVar236 * fVar293;
        fVar162 = local_500._20_4_;
        auVar56._20_4_ = fVar239 * fVar162;
        fVar159 = local_500._24_4_;
        auVar56._24_4_ = fVar226 * fVar159;
        auVar56._28_4_ = uVar9;
        fVar220 = auVar29._0_4_;
        auVar337._0_4_ = fVar164 * fVar220;
        fVar252 = auVar29._4_4_;
        auVar337._4_4_ = fVar178 * fVar252;
        fVar257 = auVar29._8_4_;
        auVar337._8_4_ = fVar180 * fVar257;
        fVar289 = auVar29._12_4_;
        auVar337._12_4_ = fVar182 * fVar289;
        fVar221 = auVar29._16_4_;
        auVar337._16_4_ = fVar183 * fVar221;
        fVar314 = auVar29._20_4_;
        auVar337._20_4_ = fVar185 * fVar314;
        fVar160 = auVar29._24_4_;
        auVar337._24_4_ = fVar186 * fVar160;
        auVar337._28_4_ = 0;
        auVar32 = vsubps_avx(auVar337,auVar56);
        auVar57._4_4_ = fVar242 * fVar252;
        auVar57._0_4_ = fVar214 * fVar220;
        auVar57._8_4_ = fVar255 * fVar257;
        auVar57._12_4_ = fVar288 * fVar289;
        auVar57._16_4_ = fVar291 * fVar221;
        auVar57._20_4_ = fVar312 * fVar314;
        auVar57._24_4_ = fVar158 * fVar160;
        auVar57._28_4_ = uVar9;
        auVar58._4_4_ = fVar243 * fVar235;
        auVar58._0_4_ = fVar218 * fVar202;
        auVar58._8_4_ = fVar256 * fVar254;
        auVar58._12_4_ = fVar287 * fVar217;
        auVar58._16_4_ = fVar293 * fVar290;
        auVar58._20_4_ = fVar162 * fVar310;
        auVar58._24_4_ = fVar159 * fVar157;
        auVar58._28_4_ = auVar344._28_4_;
        auVar143 = vsubps_avx(auVar58,auVar57);
        auVar144 = vsubps_avx(auVar25,auVar28);
        fVar232 = auVar143._28_4_ + auVar32._28_4_;
        auVar276._0_4_ = auVar143._0_4_ + auVar32._0_4_ * 0.0 + auVar30._0_4_ * 0.0;
        auVar276._4_4_ = auVar143._4_4_ + auVar32._4_4_ * 0.0 + auVar30._4_4_ * 0.0;
        auVar276._8_4_ = auVar143._8_4_ + auVar32._8_4_ * 0.0 + auVar30._8_4_ * 0.0;
        auVar276._12_4_ = auVar143._12_4_ + auVar32._12_4_ * 0.0 + auVar30._12_4_ * 0.0;
        auVar276._16_4_ = auVar143._16_4_ + auVar32._16_4_ * 0.0 + auVar30._16_4_ * 0.0;
        auVar276._20_4_ = auVar143._20_4_ + auVar32._20_4_ * 0.0 + auVar30._20_4_ * 0.0;
        auVar276._24_4_ = auVar143._24_4_ + auVar32._24_4_ * 0.0 + auVar30._24_4_ * 0.0;
        auVar276._28_4_ = fVar232 + auVar30._28_4_;
        fVar265 = auVar149._0_4_;
        fVar223 = auVar149._4_4_;
        auVar59._4_4_ = fVar223 * auVar28._4_4_;
        auVar59._0_4_ = fVar265 * auVar28._0_4_;
        fVar285 = auVar149._8_4_;
        auVar59._8_4_ = fVar285 * auVar28._8_4_;
        fVar266 = auVar149._12_4_;
        auVar59._12_4_ = fVar266 * auVar28._12_4_;
        fVar278 = auVar149._16_4_;
        auVar59._16_4_ = fVar278 * auVar28._16_4_;
        fVar163 = auVar149._20_4_;
        auVar59._20_4_ = fVar163 * auVar28._20_4_;
        fVar177 = auVar149._24_4_;
        auVar59._24_4_ = fVar177 * auVar28._24_4_;
        auVar59._28_4_ = fVar232;
        fVar232 = auVar144._0_4_;
        fVar253 = auVar144._4_4_;
        auVar60._4_4_ = auVar27._4_4_ * fVar253;
        auVar60._0_4_ = auVar27._0_4_ * fVar232;
        fVar286 = auVar144._8_4_;
        auVar60._8_4_ = auVar27._8_4_ * fVar286;
        fVar219 = auVar144._12_4_;
        auVar60._12_4_ = auVar27._12_4_ * fVar219;
        fVar292 = auVar144._16_4_;
        auVar60._16_4_ = auVar27._16_4_ * fVar292;
        fVar140 = auVar144._20_4_;
        auVar60._20_4_ = auVar27._20_4_ * fVar140;
        fVar161 = auVar144._24_4_;
        auVar60._24_4_ = auVar27._24_4_ * fVar161;
        auVar60._28_4_ = auVar143._28_4_;
        auVar149 = vsubps_avx(auVar60,auVar59);
        auVar32 = vsubps_avx(_local_500,auVar26);
        fVar234 = auVar32._0_4_;
        fVar237 = auVar32._4_4_;
        auVar61._4_4_ = fVar237 * auVar28._4_4_;
        auVar61._0_4_ = fVar234 * auVar28._0_4_;
        fVar240 = auVar32._8_4_;
        auVar61._8_4_ = fVar240 * auVar28._8_4_;
        fVar294 = auVar32._12_4_;
        auVar61._12_4_ = fVar294 * auVar28._12_4_;
        fVar301 = auVar32._16_4_;
        auVar61._16_4_ = fVar301 * auVar28._16_4_;
        fVar302 = auVar32._20_4_;
        auVar61._20_4_ = fVar302 * auVar28._20_4_;
        fVar304 = auVar32._24_4_;
        auVar61._24_4_ = fVar304 * auVar28._24_4_;
        auVar61._28_4_ = auVar28._28_4_;
        auVar62._4_4_ = auVar26._4_4_ * fVar253;
        auVar62._0_4_ = auVar26._0_4_ * fVar232;
        auVar62._8_4_ = auVar26._8_4_ * fVar286;
        auVar62._12_4_ = auVar26._12_4_ * fVar219;
        auVar62._16_4_ = auVar26._16_4_ * fVar292;
        auVar62._20_4_ = auVar26._20_4_ * fVar140;
        auVar62._24_4_ = auVar26._24_4_ * fVar161;
        auVar62._28_4_ = auVar30._28_4_;
        auVar30 = vsubps_avx(auVar61,auVar62);
        auVar63._4_4_ = auVar27._4_4_ * fVar237;
        auVar63._0_4_ = auVar27._0_4_ * fVar234;
        auVar63._8_4_ = auVar27._8_4_ * fVar240;
        auVar63._12_4_ = auVar27._12_4_ * fVar294;
        auVar63._16_4_ = auVar27._16_4_ * fVar301;
        auVar63._20_4_ = auVar27._20_4_ * fVar302;
        auVar63._24_4_ = auVar27._24_4_ * fVar304;
        auVar63._28_4_ = auVar28._28_4_;
        auVar64._4_4_ = auVar26._4_4_ * fVar223;
        auVar64._0_4_ = auVar26._0_4_ * fVar265;
        auVar64._8_4_ = auVar26._8_4_ * fVar285;
        auVar64._12_4_ = auVar26._12_4_ * fVar266;
        auVar64._16_4_ = auVar26._16_4_ * fVar278;
        auVar64._20_4_ = auVar26._20_4_ * fVar163;
        auVar64._24_4_ = auVar26._24_4_ * fVar177;
        auVar64._28_4_ = auVar26._28_4_;
        auVar26 = vsubps_avx(auVar64,auVar63);
        auVar229._0_4_ = auVar149._0_4_ * 0.0 + auVar26._0_4_ + auVar30._0_4_ * 0.0;
        auVar229._4_4_ = auVar149._4_4_ * 0.0 + auVar26._4_4_ + auVar30._4_4_ * 0.0;
        auVar229._8_4_ = auVar149._8_4_ * 0.0 + auVar26._8_4_ + auVar30._8_4_ * 0.0;
        auVar229._12_4_ = auVar149._12_4_ * 0.0 + auVar26._12_4_ + auVar30._12_4_ * 0.0;
        auVar229._16_4_ = auVar149._16_4_ * 0.0 + auVar26._16_4_ + auVar30._16_4_ * 0.0;
        auVar229._20_4_ = auVar149._20_4_ * 0.0 + auVar26._20_4_ + auVar30._20_4_ * 0.0;
        auVar229._24_4_ = auVar149._24_4_ * 0.0 + auVar26._24_4_ + auVar30._24_4_ * 0.0;
        auVar229._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar30._28_4_;
        auVar149 = vmaxps_avx(auVar276,auVar229);
        auVar149 = vcmpps_avx(auVar149,ZEXT832(0) << 0x20,2);
        auVar248 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
        auVar248 = vpand_avx(auVar248,local_720);
        auVar191 = vpmovsxwd_avx(auVar248);
        auVar184 = vpunpckhwd_avx(auVar248,auVar248);
        auVar210._16_16_ = auVar184;
        auVar210._0_16_ = auVar191;
        if ((((((((auVar210 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar210 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar210 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar210 >> 0x7f,0) == '\0') &&
              (auVar210 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar184 >> 0x3f,0) == '\0') &&
            (auVar210 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar184[0xf]) {
LAB_00ff4ec4:
          auVar213 = ZEXT3264(auVar210);
          auVar156 = ZEXT3264(CONCAT824(local_4e0[1]._24_8_,
                                        CONCAT816(local_4e0[1]._16_8_,
                                                  CONCAT88(local_4e0[1]._8_8_,local_4e0[1]._0_8_))))
          ;
          auVar284 = ZEXT3264(local_6e0);
          auVar300 = ZEXT3264(local_680);
        }
        else {
          auVar65._4_4_ = fVar253 * fVar235;
          auVar65._0_4_ = fVar232 * fVar202;
          auVar65._8_4_ = fVar286 * fVar254;
          auVar65._12_4_ = fVar219 * fVar217;
          auVar65._16_4_ = fVar292 * fVar290;
          auVar65._20_4_ = fVar140 * fVar310;
          auVar65._24_4_ = fVar161 * fVar157;
          auVar65._28_4_ = auVar184._12_4_;
          auVar324._0_4_ = fVar265 * fVar179;
          auVar324._4_4_ = fVar223 * fVar181;
          auVar324._8_4_ = fVar285 * fVar225;
          auVar324._12_4_ = fVar266 * fVar233;
          auVar324._16_4_ = fVar278 * fVar236;
          auVar324._20_4_ = fVar163 * fVar239;
          auVar324._24_4_ = fVar177 * fVar226;
          auVar324._28_4_ = 0;
          auVar149 = vsubps_avx(auVar324,auVar65);
          auVar66._4_4_ = fVar237 * fVar181;
          auVar66._0_4_ = fVar234 * fVar179;
          auVar66._8_4_ = fVar240 * fVar225;
          auVar66._12_4_ = fVar294 * fVar233;
          auVar66._16_4_ = fVar301 * fVar236;
          auVar66._20_4_ = fVar302 * fVar239;
          auVar66._24_4_ = fVar304 * fVar226;
          auVar66._28_4_ = auVar33._28_4_;
          auVar67._4_4_ = fVar253 * fVar252;
          auVar67._0_4_ = fVar232 * fVar220;
          auVar67._8_4_ = fVar286 * fVar257;
          auVar67._12_4_ = fVar219 * fVar289;
          auVar67._16_4_ = fVar292 * fVar221;
          auVar67._20_4_ = fVar140 * fVar314;
          auVar67._24_4_ = fVar161 * fVar160;
          auVar67._28_4_ = auVar144._28_4_;
          auVar27 = vsubps_avx(auVar67,auVar66);
          auVar68._4_4_ = fVar223 * fVar252;
          auVar68._0_4_ = fVar265 * fVar220;
          auVar68._8_4_ = fVar285 * fVar257;
          auVar68._12_4_ = fVar266 * fVar289;
          auVar68._16_4_ = fVar278 * fVar221;
          auVar68._20_4_ = fVar163 * fVar314;
          auVar68._24_4_ = fVar177 * fVar160;
          auVar68._28_4_ = auVar29._28_4_;
          auVar69._4_4_ = fVar237 * fVar235;
          auVar69._0_4_ = fVar234 * fVar202;
          auVar69._8_4_ = fVar240 * fVar254;
          auVar69._12_4_ = fVar294 * fVar217;
          auVar69._16_4_ = fVar301 * fVar290;
          auVar69._20_4_ = fVar302 * fVar310;
          auVar69._24_4_ = fVar304 * fVar157;
          auVar69._28_4_ = auVar276._28_4_;
          auVar28 = vsubps_avx(auVar69,auVar68);
          auVar277._0_4_ = auVar149._0_4_ * 0.0 + auVar28._0_4_ + auVar27._0_4_ * 0.0;
          auVar277._4_4_ = auVar149._4_4_ * 0.0 + auVar28._4_4_ + auVar27._4_4_ * 0.0;
          auVar277._8_4_ = auVar149._8_4_ * 0.0 + auVar28._8_4_ + auVar27._8_4_ * 0.0;
          auVar277._12_4_ = auVar149._12_4_ * 0.0 + auVar28._12_4_ + auVar27._12_4_ * 0.0;
          auVar277._16_4_ = auVar149._16_4_ * 0.0 + auVar28._16_4_ + auVar27._16_4_ * 0.0;
          auVar277._20_4_ = auVar149._20_4_ * 0.0 + auVar28._20_4_ + auVar27._20_4_ * 0.0;
          auVar277._24_4_ = auVar149._24_4_ * 0.0 + auVar28._24_4_ + auVar27._24_4_ * 0.0;
          auVar277._28_4_ = auVar276._28_4_ + auVar28._28_4_ + auVar29._28_4_;
          auVar26 = vrcpps_avx(auVar277);
          fVar220 = auVar26._0_4_;
          fVar232 = auVar26._4_4_;
          auVar70._4_4_ = auVar277._4_4_ * fVar232;
          auVar70._0_4_ = auVar277._0_4_ * fVar220;
          fVar235 = auVar26._8_4_;
          auVar70._8_4_ = auVar277._8_4_ * fVar235;
          fVar252 = auVar26._12_4_;
          auVar70._12_4_ = auVar277._12_4_ * fVar252;
          fVar253 = auVar26._16_4_;
          auVar70._16_4_ = auVar277._16_4_ * fVar253;
          fVar254 = auVar26._20_4_;
          auVar70._20_4_ = auVar277._20_4_ * fVar254;
          fVar257 = auVar26._24_4_;
          auVar70._24_4_ = auVar277._24_4_ * fVar257;
          auVar70._28_4_ = auVar144._28_4_;
          auVar325._8_4_ = 0x3f800000;
          auVar325._0_8_ = 0x3f8000003f800000;
          auVar325._12_4_ = 0x3f800000;
          auVar325._16_4_ = 0x3f800000;
          auVar325._20_4_ = 0x3f800000;
          auVar325._24_4_ = 0x3f800000;
          auVar325._28_4_ = 0x3f800000;
          auVar29 = vsubps_avx(auVar325,auVar70);
          fVar220 = auVar29._0_4_ * fVar220 + fVar220;
          fVar232 = auVar29._4_4_ * fVar232 + fVar232;
          fVar235 = auVar29._8_4_ * fVar235 + fVar235;
          fVar252 = auVar29._12_4_ * fVar252 + fVar252;
          fVar253 = auVar29._16_4_ * fVar253 + fVar253;
          fVar254 = auVar29._20_4_ * fVar254 + fVar254;
          fVar257 = auVar29._24_4_ * fVar257 + fVar257;
          auVar71._4_4_ =
               (auVar149._4_4_ * fVar243 + auVar27._4_4_ * fVar242 + auVar28._4_4_ * fVar178) *
               fVar232;
          auVar71._0_4_ =
               (auVar149._0_4_ * fVar218 + auVar27._0_4_ * fVar214 + auVar28._0_4_ * fVar164) *
               fVar220;
          auVar71._8_4_ =
               (auVar149._8_4_ * fVar256 + auVar27._8_4_ * fVar255 + auVar28._8_4_ * fVar180) *
               fVar235;
          auVar71._12_4_ =
               (auVar149._12_4_ * fVar287 + auVar27._12_4_ * fVar288 + auVar28._12_4_ * fVar182) *
               fVar252;
          auVar71._16_4_ =
               (auVar149._16_4_ * fVar293 + auVar27._16_4_ * fVar291 + auVar28._16_4_ * fVar183) *
               fVar253;
          auVar71._20_4_ =
               (auVar149._20_4_ * fVar162 + auVar27._20_4_ * fVar312 + auVar28._20_4_ * fVar185) *
               fVar254;
          auVar71._24_4_ =
               (auVar149._24_4_ * fVar159 + auVar27._24_4_ * fVar158 + auVar28._24_4_ * fVar186) *
               fVar257;
          auVar71._28_4_ = auVar24._28_4_ + auVar25._28_4_;
          auVar191 = vpermilps_avx((undefined1  [16])aVar11,0xff);
          auVar148._16_16_ = auVar191;
          auVar148._0_16_ = auVar191;
          auVar149 = vcmpps_avx(auVar148,auVar71,2);
          fVar202 = (ray->super_RayK<1>).tfar;
          auVar211._4_4_ = fVar202;
          auVar211._0_4_ = fVar202;
          auVar211._8_4_ = fVar202;
          auVar211._12_4_ = fVar202;
          auVar211._16_4_ = fVar202;
          auVar211._20_4_ = fVar202;
          auVar211._24_4_ = fVar202;
          auVar211._28_4_ = fVar202;
          auVar25 = vcmpps_avx(auVar71,auVar211,2);
          auVar149 = vandps_avx(auVar25,auVar149);
          auVar191 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
          auVar248 = vpand_avx(auVar248,auVar191);
          auVar191 = vpmovsxwd_avx(auVar248);
          auVar184 = vpshufd_avx(auVar248,0xee);
          auVar184 = vpmovsxwd_avx(auVar184);
          auVar210._16_16_ = auVar184;
          auVar210._0_16_ = auVar191;
          if ((((((((auVar210 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar210 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar210 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar210 >> 0x7f,0) == '\0') &&
                (auVar210 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar184 >> 0x3f,0) == '\0') &&
              (auVar210 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar184[0xf]) goto LAB_00ff4ec4;
          auVar149 = vcmpps_avx(ZEXT832(0) << 0x20,auVar277,4);
          auVar191 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
          auVar248 = vpand_avx(auVar248,auVar191);
          auVar191 = vpmovsxwd_avx(auVar248);
          auVar213 = ZEXT1664(auVar191);
          auVar248 = vpunpckhwd_avx(auVar248,auVar248);
          auVar263._16_16_ = auVar248;
          auVar263._0_16_ = auVar191;
          auVar156 = ZEXT3264(CONCAT824(local_4e0[1]._24_8_,
                                        CONCAT816(local_4e0[1]._16_8_,
                                                  CONCAT88(local_4e0[1]._8_8_,local_4e0[1]._0_8_))))
          ;
          auVar284 = ZEXT3264(local_6e0);
          auVar300 = ZEXT3264(local_680);
          if ((((((((auVar263 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar263 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar263 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar263 >> 0x7f,0) != '\0') ||
                (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar248 >> 0x3f,0) != '\0') ||
              (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar248[0xf] < '\0') {
            auVar72._4_4_ = auVar276._4_4_ * fVar232;
            auVar72._0_4_ = auVar276._0_4_ * fVar220;
            auVar72._8_4_ = auVar276._8_4_ * fVar235;
            auVar72._12_4_ = auVar276._12_4_ * fVar252;
            auVar72._16_4_ = auVar276._16_4_ * fVar253;
            auVar72._20_4_ = auVar276._20_4_ * fVar254;
            auVar72._24_4_ = auVar276._24_4_ * fVar257;
            auVar72._28_4_ = SUB84(local_4e0[1]._24_8_,4);
            auVar73._4_4_ = auVar229._4_4_ * fVar232;
            auVar73._0_4_ = auVar229._0_4_ * fVar220;
            auVar73._8_4_ = auVar229._8_4_ * fVar235;
            auVar73._12_4_ = auVar229._12_4_ * fVar252;
            auVar73._16_4_ = auVar229._16_4_ * fVar253;
            auVar73._20_4_ = auVar229._20_4_ * fVar254;
            auVar73._24_4_ = auVar229._24_4_ * fVar257;
            auVar73._28_4_ = auVar29._28_4_ + auVar26._28_4_;
            auVar230._8_4_ = 0x3f800000;
            auVar230._0_8_ = 0x3f8000003f800000;
            auVar230._12_4_ = 0x3f800000;
            auVar230._16_4_ = 0x3f800000;
            auVar230._20_4_ = 0x3f800000;
            auVar230._24_4_ = 0x3f800000;
            auVar230._28_4_ = 0x3f800000;
            auVar149 = vsubps_avx(auVar230,auVar72);
            auVar213 = ZEXT3264(auVar149);
            auVar149 = vblendvps_avx(auVar149,auVar72,auVar31);
            auVar284 = ZEXT3264(auVar149);
            auVar149 = vsubps_avx(auVar230,auVar73);
            _local_2e0 = vblendvps_avx(auVar149,auVar73,auVar31);
            auVar156 = ZEXT3264(auVar263);
            auVar300 = ZEXT3264(auVar71);
          }
        }
        auVar338 = ZEXT3264(_local_5e0);
        auVar149 = auVar156._0_32_;
        _local_770 = auVar14;
        _local_6c0 = auVar13;
        _local_6b0 = auVar15;
        if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar149 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar149 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar149 >> 0x7f,0) != '\0') ||
              (auVar156 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar149 >> 0xbf,0) != '\0') ||
            (auVar156 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar156[0x1f] < '\0') {
          auVar25 = vsubps_avx(local_4a0,_local_7a0);
          fVar214 = (float)local_7a0._0_4_ + auVar284._0_4_ * auVar25._0_4_;
          fVar218 = (float)local_7a0._4_4_ + auVar284._4_4_ * auVar25._4_4_;
          fVar220 = fStack_798 + auVar284._8_4_ * auVar25._8_4_;
          fVar232 = fStack_794 + auVar284._12_4_ * auVar25._12_4_;
          fVar235 = fStack_790 + auVar284._16_4_ * auVar25._16_4_;
          fVar242 = fStack_78c + auVar284._20_4_ * auVar25._20_4_;
          fVar243 = fStack_788 + auVar284._24_4_ * auVar25._24_4_;
          fVar252 = auVar25._28_4_ + 0.0;
          fVar202 = pre->depth_scale;
          auVar74._4_4_ = (fVar218 + fVar218) * fVar202;
          auVar74._0_4_ = (fVar214 + fVar214) * fVar202;
          auVar74._8_4_ = (fVar220 + fVar220) * fVar202;
          auVar74._12_4_ = (fVar232 + fVar232) * fVar202;
          auVar74._16_4_ = (fVar235 + fVar235) * fVar202;
          auVar74._20_4_ = (fVar242 + fVar242) * fVar202;
          auVar74._24_4_ = (fVar243 + fVar243) * fVar202;
          auVar74._28_4_ = fVar252 + fVar252;
          local_240 = auVar300._0_32_;
          auVar25 = vcmpps_avx(local_240,auVar74,6);
          auVar26 = auVar149 & auVar25;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0x7f,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar26 >> 0xbf,0) != '\0') ||
              (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar26[0x1f] < '\0') {
            auVar213 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_2e0._0_4_ = (float)local_2e0._0_4_ + (float)local_2e0._0_4_ + -1.0;
            local_2e0._4_4_ = (float)local_2e0._4_4_ + (float)local_2e0._4_4_ + -1.0;
            uStack_2d8._0_4_ = (float)uStack_2d8 + (float)uStack_2d8 + -1.0;
            uStack_2d8._4_4_ = uStack_2d8._4_4_ + uStack_2d8._4_4_ + -1.0;
            uStack_2d0._0_4_ = (float)uStack_2d0 + (float)uStack_2d0 + -1.0;
            uStack_2d0._4_4_ = uStack_2d0._4_4_ + uStack_2d0._4_4_ + -1.0;
            uStack_2c8._0_4_ = (float)uStack_2c8 + (float)uStack_2c8 + -1.0;
            uStack_2c8._4_4_ = uStack_2c8._4_4_ + uStack_2c8._4_4_ + -1.0;
            local_280 = auVar284._0_32_;
            auVar130 = _local_2e0;
            auVar26 = _local_2e0;
            local_260 = (float)local_2e0._0_4_;
            fStack_25c = (float)local_2e0._4_4_;
            fStack_258 = (float)uStack_2d8;
            fStack_254 = uStack_2d8._4_4_;
            fStack_250 = (float)uStack_2d0;
            fStack_24c = uStack_2d0._4_4_;
            fStack_248 = (float)uStack_2c8;
            fStack_244 = uStack_2c8._4_4_;
            local_220 = 0;
            local_21c = uVar22;
            local_200 = local_770;
            uStack_1f8 = uStack_768;
            local_1f0 = local_6b0;
            uStack_1e8 = uStack_6a8;
            local_1e0 = local_6c0;
            uStack_1d8 = uStack_6b8;
            _local_2e0 = auVar26;
            if ((pGVar137->mask & (ray->super_RayK<1>).mask) != 0) {
              auVar149 = vandps_avx(auVar25,auVar149);
              local_4e0[0] = auVar149;
              auVar189._0_4_ = 1.0 / (float)(int)uVar22;
              auVar189._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar248 = vshufps_avx(auVar189,auVar189,0);
              local_1a0[0] = auVar248._0_4_ * (auVar284._0_4_ + 0.0);
              local_1a0[1] = auVar248._4_4_ * (auVar284._4_4_ + 1.0);
              local_1a0[2] = auVar248._8_4_ * (auVar284._8_4_ + 2.0);
              local_1a0[3] = auVar248._12_4_ * (auVar284._12_4_ + 3.0);
              fStack_190 = auVar248._0_4_ * (auVar284._16_4_ + 4.0);
              fStack_18c = auVar248._4_4_ * (auVar284._20_4_ + 5.0);
              fStack_188 = auVar248._8_4_ * (auVar284._24_4_ + 6.0);
              fStack_184 = auVar284._28_4_ + 7.0;
              uStack_2d0 = auVar130._16_8_;
              uStack_2c8 = auVar26._24_8_;
              local_180 = local_2e0;
              uStack_178 = uStack_2d8;
              uStack_170 = uStack_2d0;
              uStack_168 = uStack_2c8;
              local_160 = local_240;
              auVar172._8_4_ = 0x7f800000;
              auVar172._0_8_ = 0x7f8000007f800000;
              auVar172._12_4_ = 0x7f800000;
              auVar172._16_4_ = 0x7f800000;
              auVar172._20_4_ = 0x7f800000;
              auVar172._24_4_ = 0x7f800000;
              auVar172._28_4_ = 0x7f800000;
              auVar25 = vblendvps_avx(auVar172,local_240,auVar149);
              auVar26 = vshufps_avx(auVar25,auVar25,0xb1);
              auVar26 = vminps_avx(auVar25,auVar26);
              auVar27 = vshufpd_avx(auVar26,auVar26,5);
              auVar26 = vminps_avx(auVar26,auVar27);
              auVar27 = vperm2f128_avx(auVar26,auVar26,1);
              auVar26 = vminps_avx(auVar26,auVar27);
              auVar25 = vcmpps_avx(auVar25,auVar26,0);
              auVar26 = auVar149 & auVar25;
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0x7f,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0xbf,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar26[0x1f] < '\0') {
                auVar149 = vandps_avx(auVar25,auVar149);
              }
              uVar131 = vmovmskps_avx(auVar149);
              uVar132 = 0;
              if (uVar131 != 0) {
                for (; (uVar131 >> uVar132 & 1) == 0; uVar132 = uVar132 + 1) {
                }
              }
              uVar134 = (ulong)uVar132;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar137->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                local_680 = local_240;
                _local_720 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                local_6e0 = auVar284._0_32_;
                local_460._0_8_ = pGVar137;
                do {
                  local_614 = local_1a0[uVar134];
                  local_610 = *(undefined4 *)((long)&local_180 + uVar134 * 4);
                  local_7a0 = (undefined1  [8])uVar134;
                  (ray->super_RayK<1>).tfar = *(float *)(local_160 + uVar134 * 4);
                  local_750.context = context->user;
                  fVar214 = 1.0 - local_614;
                  fVar202 = local_614 * fVar214 + local_614 * fVar214;
                  auVar248 = ZEXT416((uint)(local_614 * local_614 * 3.0));
                  auVar248 = vshufps_avx(auVar248,auVar248,0);
                  auVar191 = ZEXT416((uint)((fVar202 - local_614 * local_614) * 3.0));
                  auVar191 = vshufps_avx(auVar191,auVar191,0);
                  auVar184 = ZEXT416((uint)((fVar214 * fVar214 - fVar202) * 3.0));
                  auVar184 = vshufps_avx(auVar184,auVar184,0);
                  auVar205 = ZEXT416((uint)(fVar214 * fVar214 * -3.0));
                  auVar205 = vshufps_avx(auVar205,auVar205,0);
                  auVar194._0_4_ =
                       auVar205._0_4_ * local_7b0 +
                       auVar184._0_4_ * (float)local_770._0_4_ +
                       auVar248._0_4_ * (float)local_6c0._0_4_ +
                       auVar191._0_4_ * (float)local_6b0._0_4_;
                  auVar194._4_4_ =
                       auVar205._4_4_ * fStack_7ac +
                       auVar184._4_4_ * (float)local_770._4_4_ +
                       auVar248._4_4_ * (float)local_6c0._4_4_ +
                       auVar191._4_4_ * (float)local_6b0._4_4_;
                  auVar194._8_4_ =
                       auVar205._8_4_ * fStack_7a8 +
                       auVar184._8_4_ * (float)uStack_768 +
                       auVar248._8_4_ * (float)uStack_6b8 + auVar191._8_4_ * (float)uStack_6a8;
                  auVar194._12_4_ =
                       auVar205._12_4_ * fStack_7a4 +
                       auVar184._12_4_ * uStack_768._4_4_ +
                       auVar248._12_4_ * uStack_6b8._4_4_ + auVar191._12_4_ * uStack_6a8._4_4_;
                  local_620 = vmovlps_avx(auVar194);
                  local_618 = vextractps_avx(auVar194,2);
                  local_60c = uVar133;
                  local_608 = (int)local_7b8;
                  local_604 = (local_750.context)->instID[0];
                  local_600 = (local_750.context)->instPrimID[0];
                  local_7bc = -1;
                  local_750.valid = &local_7bc;
                  local_750.geometryUserPtr = pGVar137->userPtr;
                  local_750.ray = (RTCRayN *)ray;
                  local_750.hit = (RTCHitN *)&local_620;
                  local_750.N = 1;
                  if (pGVar137->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00ff510e:
                    p_Var23 = context->args->filter;
                    if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_460._0_8_ + 0x3e) & 0x40) != 0)))) {
                      (*p_Var23)(&local_750);
                      auVar338 = ZEXT3264(_local_5e0);
                      auVar284 = ZEXT3264(local_6e0);
                      pre = local_760;
                      pPVar138 = local_758;
                      fVar315 = (float)local_640._0_4_;
                      fVar319 = (float)local_640._4_4_;
                      fVar320 = fStack_638;
                      fVar321 = fStack_634;
                      fVar215 = fStack_630;
                      fVar216 = fStack_62c;
                      fVar222 = fStack_628;
                      fVar187 = (float)local_660._0_4_;
                      fVar199 = (float)local_660._4_4_;
                      fVar200 = fStack_658;
                      fVar201 = fStack_654;
                      fVar224 = fStack_650;
                      fVar238 = fStack_64c;
                      fVar241 = fStack_648;
                      fVar244 = fStack_644;
                      if (*local_750.valid == 0) goto LAB_00ff520d;
                    }
                    (((Vec3f *)((long)local_750.ray + 0x30))->field_0).components[0] =
                         *(float *)local_750.hit;
                    (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_750.hit + 4);
                    (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_750.hit + 8);
                    *(float *)((long)local_750.ray + 0x3c) = *(float *)(local_750.hit + 0xc);
                    *(float *)((long)local_750.ray + 0x40) = *(float *)(local_750.hit + 0x10);
                    *(float *)((long)local_750.ray + 0x44) = *(float *)(local_750.hit + 0x14);
                    *(float *)((long)local_750.ray + 0x48) = *(float *)(local_750.hit + 0x18);
                    *(float *)((long)local_750.ray + 0x4c) = *(float *)(local_750.hit + 0x1c);
                    *(float *)((long)local_750.ray + 0x50) = *(float *)(local_750.hit + 0x20);
                  }
                  else {
                    (*pGVar137->intersectionFilterN)(&local_750);
                    auVar338 = ZEXT3264(_local_5e0);
                    auVar284 = ZEXT3264(local_6e0);
                    pre = local_760;
                    pPVar138 = local_758;
                    fVar315 = (float)local_640._0_4_;
                    fVar319 = (float)local_640._4_4_;
                    fVar320 = fStack_638;
                    fVar321 = fStack_634;
                    fVar215 = fStack_630;
                    fVar216 = fStack_62c;
                    fVar222 = fStack_628;
                    fVar187 = (float)local_660._0_4_;
                    fVar199 = (float)local_660._4_4_;
                    fVar200 = fStack_658;
                    fVar201 = fStack_654;
                    fVar224 = fStack_650;
                    fVar238 = fStack_64c;
                    fVar241 = fStack_648;
                    fVar244 = fStack_644;
                    if (*local_750.valid != 0) goto LAB_00ff510e;
LAB_00ff520d:
                    (ray->super_RayK<1>).tfar = (float)local_720._0_4_;
                    pre = local_760;
                    pPVar138 = local_758;
                  }
                  *(undefined4 *)(local_4e0[0] + (long)local_7a0 * 4) = 0;
                  auVar26 = local_4e0[0];
                  _local_720 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                  auVar213 = ZEXT3264(_local_720);
                  fVar202 = (ray->super_RayK<1>).tfar;
                  auVar155._4_4_ = fVar202;
                  auVar155._0_4_ = fVar202;
                  auVar155._8_4_ = fVar202;
                  auVar155._12_4_ = fVar202;
                  auVar155._16_4_ = fVar202;
                  auVar155._20_4_ = fVar202;
                  auVar155._24_4_ = fVar202;
                  auVar155._28_4_ = fVar202;
                  auVar300 = ZEXT3264(local_680);
                  auVar25 = vcmpps_avx(local_680,auVar155,2);
                  auVar149 = vandps_avx(auVar25,local_4e0[0]);
                  local_4e0[0] = auVar149;
                  auVar26 = auVar26 & auVar25;
                  if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar26 >> 0x7f,0) == '\0') &&
                        (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar26 >> 0xbf,0) == '\0') &&
                      (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar26[0x1f]) goto LAB_00ff3f28;
                  auVar176._8_4_ = 0x7f800000;
                  auVar176._0_8_ = 0x7f8000007f800000;
                  auVar176._12_4_ = 0x7f800000;
                  auVar176._16_4_ = 0x7f800000;
                  auVar176._20_4_ = 0x7f800000;
                  auVar176._24_4_ = 0x7f800000;
                  auVar176._28_4_ = 0x7f800000;
                  auVar25 = vblendvps_avx(auVar176,local_680,auVar149);
                  auVar26 = vshufps_avx(auVar25,auVar25,0xb1);
                  auVar26 = vminps_avx(auVar25,auVar26);
                  auVar27 = vshufpd_avx(auVar26,auVar26,5);
                  auVar26 = vminps_avx(auVar26,auVar27);
                  auVar27 = vperm2f128_avx(auVar26,auVar26,1);
                  auVar26 = vminps_avx(auVar26,auVar27);
                  auVar25 = vcmpps_avx(auVar25,auVar26,0);
                  auVar26 = auVar149 & auVar25;
                  if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar26 >> 0x7f,0) != '\0') ||
                        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar26 >> 0xbf,0) != '\0') ||
                      (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar26[0x1f] < '\0') {
                    auVar149 = vandps_avx(auVar25,auVar149);
                  }
                  uVar132 = vmovmskps_avx(auVar149);
                  uVar21 = 0;
                  if (uVar132 != 0) {
                    for (; (uVar132 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                    }
                  }
                  uVar134 = (ulong)uVar21;
                  pGVar137 = (Geometry *)local_460._0_8_;
                } while( true );
              }
              fVar202 = local_1a0[uVar134];
              fVar214 = *(float *)((long)&local_180 + uVar134 * 4);
              fVar220 = 1.0 - fVar202;
              fVar218 = fVar202 * fVar220 + fVar202 * fVar220;
              auVar248 = ZEXT416((uint)(fVar202 * fVar202 * 3.0));
              auVar248 = vshufps_avx(auVar248,auVar248,0);
              auVar191 = ZEXT416((uint)((fVar218 - fVar202 * fVar202) * 3.0));
              auVar191 = vshufps_avx(auVar191,auVar191,0);
              auVar184 = ZEXT416((uint)((fVar220 * fVar220 - fVar218) * 3.0));
              auVar184 = vshufps_avx(auVar184,auVar184,0);
              auVar205 = ZEXT416((uint)(fVar220 * fVar220 * -3.0));
              auVar205 = vshufps_avx(auVar205,auVar205,0);
              auVar190._0_4_ =
                   auVar205._0_4_ * local_7b0 +
                   auVar184._0_4_ * (float)local_770._0_4_ +
                   auVar248._0_4_ * (float)local_6c0._0_4_ + auVar191._0_4_ * (float)local_6b0._0_4_
              ;
              auVar190._4_4_ =
                   auVar205._4_4_ * fStack_7ac +
                   auVar184._4_4_ * (float)local_770._4_4_ +
                   auVar248._4_4_ * (float)local_6c0._4_4_ + auVar191._4_4_ * (float)local_6b0._4_4_
              ;
              auVar190._8_4_ =
                   auVar205._8_4_ * fStack_7a8 +
                   auVar184._8_4_ * (float)uStack_768 +
                   auVar248._8_4_ * (float)uStack_6b8 + auVar191._8_4_ * (float)uStack_6a8;
              auVar190._12_4_ =
                   auVar205._12_4_ * fStack_7a4 +
                   auVar184._12_4_ * uStack_768._4_4_ +
                   auVar248._12_4_ * uStack_6b8._4_4_ + auVar191._12_4_ * uStack_6a8._4_4_;
              auVar213 = ZEXT464((uint)*(float *)(local_160 + uVar134 * 4));
              (ray->super_RayK<1>).tfar = *(float *)(local_160 + uVar134 * 4);
              uVar10 = vmovlps_avx(auVar190);
              *(undefined8 *)&(ray->Ng).field_0 = uVar10;
              fVar218 = (float)vextractps_avx(auVar190,2);
              (ray->Ng).field_0.field_0.z = fVar218;
              ray->u = fVar202;
              ray->v = fVar214;
              ray->primID = uVar133;
              ray->geomID = uVar21;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
            }
          }
        }
LAB_00ff3f28:
        auVar248 = local_700._0_16_;
      }
      if (8 < (int)uVar22) {
        auVar191 = vpshufd_avx(ZEXT416(uVar22),0);
        local_400 = auVar191._0_4_;
        fStack_3fc = auVar191._4_4_;
        fStack_3f8 = auVar191._8_4_;
        fStack_3f4 = auVar191._12_4_;
        auVar248 = vshufps_avx(auVar248,auVar248,0);
        register0x00001210 = auVar248;
        _local_440 = auVar248;
        auVar248 = vpermilps_avx(local_380._0_16_,0xff);
        local_460._16_16_ = auVar248;
        local_460._0_16_ = auVar248;
        auVar142._0_4_ = 1.0 / (float)local_3a0._0_4_;
        auVar142._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar248 = vshufps_avx(auVar142,auVar142,0);
        _fStack_390 = auVar248;
        _local_3a0 = auVar248;
        auVar156 = ZEXT3264(_local_3a0);
        lVar135 = 8;
        local_6e0 = auVar284._0_32_;
        local_680 = auVar300._0_32_;
        _local_5e0 = auVar338._0_32_;
        fVar202 = (float)local_580._0_4_;
        fVar214 = (float)local_580._4_4_;
        fVar218 = fStack_578;
        fVar220 = fStack_574;
        fVar232 = fStack_570;
        fVar235 = fStack_56c;
        fVar242 = fStack_568;
LAB_00ff4005:
        pauVar1 = (undefined1 (*) [28])(bezier_basis0 + lVar135 * 4 + lVar136);
        fVar243 = *(float *)*pauVar1;
        fVar252 = *(float *)(*pauVar1 + 4);
        fVar253 = *(float *)(*pauVar1 + 8);
        fVar254 = *(float *)(*pauVar1 + 0xc);
        fVar255 = *(float *)(*pauVar1 + 0x10);
        fVar256 = *(float *)(*pauVar1 + 0x14);
        fVar257 = *(float *)(*pauVar1 + 0x18);
        auVar127 = *pauVar1;
        pauVar3 = (undefined1 (*) [28])(lVar136 + 0x21aa768 + lVar135 * 4);
        fVar286 = *(float *)*pauVar3;
        fVar217 = *(float *)(*pauVar3 + 4);
        fVar288 = *(float *)(*pauVar3 + 8);
        fVar287 = *(float *)(*pauVar3 + 0xc);
        fVar289 = *(float *)(*pauVar3 + 0x10);
        fVar219 = *(float *)(*pauVar3 + 0x14);
        fVar290 = *(float *)(*pauVar3 + 0x18);
        auVar126 = *pauVar3;
        pauVar3 = (undefined1 (*) [28])(lVar136 + 0x21aabec + lVar135 * 4);
        fVar291 = *(float *)*pauVar3;
        fVar293 = *(float *)(*pauVar3 + 4);
        fVar221 = *(float *)(*pauVar3 + 8);
        fVar292 = *(float *)(*pauVar3 + 0xc);
        fVar310 = *(float *)(*pauVar3 + 0x10);
        fVar312 = *(float *)(*pauVar3 + 0x14);
        fVar162 = *(float *)(*pauVar3 + 0x18);
        auVar125 = *pauVar3;
        pfVar4 = (float *)(lVar136 + 0x21ab070 + lVar135 * 4);
        fVar314 = *pfVar4;
        fVar140 = pfVar4[1];
        fVar157 = pfVar4[2];
        fVar158 = pfVar4[3];
        fVar159 = pfVar4[4];
        fVar160 = pfVar4[5];
        fVar161 = pfVar4[6];
        fVar164 = auVar213._28_4_;
        fStack_784 = fVar164 + fVar164 + auVar156._28_4_;
        fVar223 = fVar164 + fVar164 + pfVar4[7];
        fVar285 = local_340._0_4_;
        fVar266 = local_340._4_4_;
        fVar278 = local_340._8_4_;
        fVar163 = local_340._12_4_;
        fVar177 = local_340._16_4_;
        fVar179 = local_340._20_4_;
        fVar181 = local_340._24_4_;
        local_720._0_4_ =
             fVar285 * fVar243 +
             fVar286 * fVar315 + fVar291 * (float)local_5a0._0_4_ + (float)local_360._0_4_ * fVar314
        ;
        local_720._4_4_ =
             fVar266 * fVar252 +
             fVar217 * fVar319 + fVar293 * (float)local_5a0._4_4_ + (float)local_360._4_4_ * fVar140
        ;
        local_720._8_4_ =
             fVar278 * fVar253 + fVar288 * fVar320 + fVar221 * fStack_598 + fStack_358 * fVar157;
        local_720._12_4_ =
             fVar163 * fVar254 + fVar287 * fVar321 + fVar292 * fStack_594 + fStack_354 * fVar158;
        register0x00001410 =
             fVar177 * fVar255 + fVar289 * fVar215 + fVar310 * fStack_590 + fStack_350 * fVar159;
        register0x00001414 =
             fVar179 * fVar256 + fVar219 * fVar216 + fVar312 * fStack_58c + fStack_34c * fVar160;
        register0x00001418 =
             fVar181 * fVar257 + fVar290 * fVar222 + fVar162 * fStack_588 + fStack_348 * fVar161;
        register0x0000141c = fVar164 + pfVar4[7] + fStack_784;
        local_700._0_4_ =
             fVar202 * fVar314 + fVar187 * fVar291 + auVar338._0_4_ * fVar286 +
             (float)local_2c0._0_4_ * fVar243;
        local_700._4_4_ =
             fVar214 * fVar140 + fVar199 * fVar293 + auVar338._4_4_ * fVar217 +
             (float)local_2c0._4_4_ * fVar252;
        local_700._8_4_ =
             fVar218 * fVar157 + fVar200 * fVar221 + auVar338._8_4_ * fVar288 + fStack_2b8 * fVar253
        ;
        local_700._12_4_ =
             fVar220 * fVar158 + fVar201 * fVar292 + auVar338._12_4_ * fVar287 +
             fStack_2b4 * fVar254;
        local_700._16_4_ =
             fVar232 * fVar159 + fVar224 * fVar310 + auVar338._16_4_ * fVar289 +
             fStack_2b0 * fVar255;
        local_700._20_4_ =
             fVar235 * fVar160 + fVar238 * fVar312 + auVar338._20_4_ * fVar219 +
             fStack_2ac * fVar256;
        local_700._24_4_ =
             fVar242 * fVar161 + fVar241 * fVar162 + auVar338._24_4_ * fVar290 +
             fStack_2a8 * fVar257;
        local_700._28_4_ = auVar284._28_4_ + fVar164 + fVar164 + fStack_784;
        local_7a0._0_4_ =
             fVar243 * (float)local_140._0_4_ +
             fVar286 * (float)local_120._0_4_ +
             fVar291 * (float)local_e0._0_4_ + fVar314 * (float)local_100._0_4_;
        local_7a0._4_4_ =
             fVar252 * (float)local_140._4_4_ +
             fVar217 * (float)local_120._4_4_ +
             fVar293 * (float)local_e0._4_4_ + fVar140 * (float)local_100._4_4_;
        fStack_798 = fVar253 * fStack_138 +
                     fVar288 * fStack_118 + fVar221 * fStack_d8 + fVar157 * fStack_f8;
        fStack_794 = fVar254 * fStack_134 +
                     fVar287 * fStack_114 + fVar292 * fStack_d4 + fVar158 * fStack_f4;
        fStack_790 = fVar255 * fStack_130 +
                     fVar289 * fStack_110 + fVar310 * fStack_d0 + fVar159 * fStack_f0;
        fStack_78c = fVar256 * fStack_12c +
                     fVar219 * fStack_10c + fVar312 * fStack_cc + fVar160 * fStack_ec;
        fStack_788 = fVar257 * fStack_128 +
                     fVar290 * fStack_108 + fVar162 * fStack_c8 + fVar161 * fStack_e8;
        fStack_784 = fStack_784 + fVar223;
        pfVar4 = (float *)(bezier_basis1 + lVar135 * 4 + lVar136);
        fVar255 = *pfVar4;
        fVar256 = pfVar4[1];
        fVar257 = pfVar4[2];
        fVar286 = pfVar4[3];
        fVar217 = pfVar4[4];
        fVar288 = pfVar4[5];
        fVar287 = pfVar4[6];
        pfVar5 = (float *)(lVar136 + 0x21acb88 + lVar135 * 4);
        fVar289 = *pfVar5;
        fVar219 = pfVar5[1];
        fVar290 = pfVar5[2];
        fVar291 = pfVar5[3];
        fVar293 = pfVar5[4];
        fVar221 = pfVar5[5];
        fVar292 = pfVar5[6];
        pauVar3 = (undefined1 (*) [28])(lVar136 + 0x21ad00c + lVar135 * 4);
        fVar243 = *(float *)*pauVar3;
        fVar252 = *(float *)(*pauVar3 + 4);
        fVar253 = *(float *)(*pauVar3 + 8);
        fVar254 = *(float *)(*pauVar3 + 0xc);
        fVar310 = *(float *)(*pauVar3 + 0x10);
        fVar312 = *(float *)(*pauVar3 + 0x14);
        fVar162 = *(float *)(*pauVar3 + 0x18);
        auVar129 = *pauVar3;
        pauVar6 = (undefined1 (*) [28])(lVar136 + 0x21ad490 + lVar135 * 4);
        fVar164 = *(float *)*pauVar6;
        fVar178 = *(float *)(*pauVar6 + 4);
        fVar180 = *(float *)(*pauVar6 + 8);
        fVar182 = *(float *)(*pauVar6 + 0xc);
        fVar183 = *(float *)(*pauVar6 + 0x10);
        fVar185 = *(float *)(*pauVar6 + 0x14);
        fVar186 = *(float *)(*pauVar6 + 0x18);
        auVar128 = *pauVar6;
        fVar265 = *(float *)pauVar6[1];
        fVar223 = fVar265 + fVar265 + fVar223;
        auVar156 = ZEXT3264(local_340);
        local_4a0._0_4_ =
             fVar255 * fVar285 +
             fVar289 * fVar315 + fVar243 * (float)local_5a0._0_4_ + (float)local_360._0_4_ * fVar164
        ;
        local_4a0._4_4_ =
             fVar256 * fVar266 +
             fVar219 * fVar319 + fVar252 * (float)local_5a0._4_4_ + (float)local_360._4_4_ * fVar178
        ;
        local_4a0._8_4_ =
             fVar257 * fVar278 + fVar290 * fVar320 + fVar253 * fStack_598 + fStack_358 * fVar180;
        local_4a0._12_4_ =
             fVar286 * fVar163 + fVar291 * fVar321 + fVar254 * fStack_594 + fStack_354 * fVar182;
        local_4a0._16_4_ =
             fVar217 * fVar177 + fVar293 * fVar215 + fVar310 * fStack_590 + fStack_350 * fVar183;
        local_4a0._20_4_ =
             fVar288 * fVar179 + fVar221 * fVar216 + fVar312 * fStack_58c + fStack_34c * fVar185;
        local_4a0._24_4_ =
             fVar287 * fVar181 + fVar292 * fVar222 + fVar162 * fStack_588 + fStack_348 * fVar186;
        local_4a0._28_4_ = fVar265 + fStack_344 + fVar223;
        local_380._0_4_ =
             (float)local_2c0._0_4_ * fVar255 +
             auVar338._0_4_ * fVar289 + fVar187 * fVar243 + fVar202 * fVar164;
        local_380._4_4_ =
             (float)local_2c0._4_4_ * fVar256 +
             auVar338._4_4_ * fVar219 + fVar199 * fVar252 + fVar214 * fVar178;
        local_380._8_4_ =
             fStack_2b8 * fVar257 + auVar338._8_4_ * fVar290 + fVar200 * fVar253 + fVar218 * fVar180
        ;
        local_380._12_4_ =
             fStack_2b4 * fVar286 +
             auVar338._12_4_ * fVar291 + fVar201 * fVar254 + fVar220 * fVar182;
        local_380._16_4_ =
             fStack_2b0 * fVar217 +
             auVar338._16_4_ * fVar293 + fVar224 * fVar310 + fVar232 * fVar183;
        local_380._20_4_ =
             fStack_2ac * fVar288 +
             auVar338._20_4_ * fVar221 + fVar238 * fVar312 + fVar235 * fVar185;
        local_380._24_4_ =
             fStack_2a8 * fVar287 +
             auVar338._24_4_ * fVar292 + fVar241 * fVar162 + fVar242 * fVar186;
        local_380._28_4_ = fVar223 + fVar265 + fVar265 + *(float *)pauVar1[1];
        auVar318._0_4_ =
             fVar289 * (float)local_120._0_4_ +
             fVar243 * (float)local_e0._0_4_ + fVar164 * (float)local_100._0_4_ +
             fVar255 * (float)local_140._0_4_;
        auVar318._4_4_ =
             fVar219 * (float)local_120._4_4_ +
             fVar252 * (float)local_e0._4_4_ + fVar178 * (float)local_100._4_4_ +
             fVar256 * (float)local_140._4_4_;
        auVar318._8_4_ =
             fVar290 * fStack_118 + fVar253 * fStack_d8 + fVar180 * fStack_f8 + fVar257 * fStack_138
        ;
        auVar318._12_4_ =
             fVar291 * fStack_114 + fVar254 * fStack_d4 + fVar182 * fStack_f4 + fVar286 * fStack_134
        ;
        auVar318._16_4_ =
             fVar293 * fStack_110 + fVar310 * fStack_d0 + fVar183 * fStack_f0 + fVar217 * fStack_130
        ;
        auVar318._20_4_ =
             fVar221 * fStack_10c + fVar312 * fStack_cc + fVar185 * fStack_ec + fVar288 * fStack_12c
        ;
        auVar318._24_4_ =
             fVar292 * fStack_108 + fVar162 * fStack_c8 + fVar186 * fStack_e8 + fVar287 * fStack_128
        ;
        auVar318._28_4_ = fVar265 + fVar265 + fStack_344 + fVar223;
        auVar25 = vsubps_avx(local_4a0,_local_720);
        auVar26 = vsubps_avx(local_380,local_700);
        fVar202 = auVar25._0_4_;
        fVar215 = auVar25._4_4_;
        auVar75._4_4_ = local_700._4_4_ * fVar215;
        auVar75._0_4_ = (float)local_700._0_4_ * fVar202;
        fVar218 = auVar25._8_4_;
        auVar75._8_4_ = local_700._8_4_ * fVar218;
        fVar222 = auVar25._12_4_;
        auVar75._12_4_ = local_700._12_4_ * fVar222;
        fVar235 = auVar25._16_4_;
        auVar75._16_4_ = local_700._16_4_ * fVar235;
        fVar243 = auVar25._20_4_;
        auVar75._20_4_ = local_700._20_4_ * fVar243;
        fVar253 = auVar25._24_4_;
        auVar75._24_4_ = local_700._24_4_ * fVar253;
        auVar75._28_4_ = fVar223;
        fVar214 = auVar26._0_4_;
        fVar216 = auVar26._4_4_;
        auVar76._4_4_ = local_720._4_4_ * fVar216;
        auVar76._0_4_ = (float)local_720._0_4_ * fVar214;
        fVar220 = auVar26._8_4_;
        auVar76._8_4_ = local_720._8_4_ * fVar220;
        fVar232 = auVar26._12_4_;
        auVar76._12_4_ = local_720._12_4_ * fVar232;
        fVar242 = auVar26._16_4_;
        auVar76._16_4_ = register0x00001410 * fVar242;
        fVar252 = auVar26._20_4_;
        auVar76._20_4_ = register0x00001414 * fVar252;
        fVar254 = auVar26._24_4_;
        auVar76._24_4_ = register0x00001418 * fVar254;
        auVar76._28_4_ = local_380._28_4_;
        auVar27 = vsubps_avx(auVar75,auVar76);
        auVar149 = vmaxps_avx(_local_7a0,auVar318);
        auVar77._4_4_ = auVar149._4_4_ * auVar149._4_4_ * (fVar215 * fVar215 + fVar216 * fVar216);
        auVar77._0_4_ = auVar149._0_4_ * auVar149._0_4_ * (fVar202 * fVar202 + fVar214 * fVar214);
        auVar77._8_4_ = auVar149._8_4_ * auVar149._8_4_ * (fVar218 * fVar218 + fVar220 * fVar220);
        auVar77._12_4_ = auVar149._12_4_ * auVar149._12_4_ * (fVar222 * fVar222 + fVar232 * fVar232)
        ;
        auVar77._16_4_ = auVar149._16_4_ * auVar149._16_4_ * (fVar235 * fVar235 + fVar242 * fVar242)
        ;
        auVar77._20_4_ = auVar149._20_4_ * auVar149._20_4_ * (fVar243 * fVar243 + fVar252 * fVar252)
        ;
        auVar77._24_4_ = auVar149._24_4_ * auVar149._24_4_ * (fVar253 * fVar253 + fVar254 * fVar254)
        ;
        auVar77._28_4_ = local_4a0._28_4_ + local_380._28_4_;
        auVar78._4_4_ = auVar27._4_4_ * auVar27._4_4_;
        auVar78._0_4_ = auVar27._0_4_ * auVar27._0_4_;
        auVar78._8_4_ = auVar27._8_4_ * auVar27._8_4_;
        auVar78._12_4_ = auVar27._12_4_ * auVar27._12_4_;
        auVar78._16_4_ = auVar27._16_4_ * auVar27._16_4_;
        auVar78._20_4_ = auVar27._20_4_ * auVar27._20_4_;
        auVar78._24_4_ = auVar27._24_4_ * auVar27._24_4_;
        auVar78._28_4_ = auVar27._28_4_;
        local_3c0 = vcmpps_avx(auVar78,auVar77,2);
        local_220 = (uint)lVar135;
        auVar191 = vpshufd_avx(ZEXT416(local_220),0);
        auVar248 = vpor_avx(auVar191,_DAT_01f7fcf0);
        auVar191 = vpor_avx(auVar191,_DAT_01fafea0);
        auVar123._4_4_ = fStack_3fc;
        auVar123._0_4_ = local_400;
        auVar123._8_4_ = fStack_3f8;
        auVar123._12_4_ = fStack_3f4;
        auVar248 = vpcmpgtd_avx(auVar123,auVar248);
        auVar191 = vpcmpgtd_avx(auVar123,auVar191);
        register0x000012d0 = auVar191;
        _local_420 = auVar248;
        auVar213 = ZEXT3264(_local_420);
        auVar149 = _local_420 & local_3c0;
        fVar315 = (float)local_640._0_4_;
        fVar319 = (float)local_640._4_4_;
        fVar320 = fStack_638;
        fVar321 = fStack_634;
        fVar215 = fStack_630;
        fVar216 = fStack_62c;
        fVar222 = fStack_628;
        if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar149 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar149 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar149 >> 0x7f,0) != '\0') ||
              (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar149 >> 0xbf,0) != '\0') ||
            (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar149[0x1f] < '\0') {
          local_6a0._0_4_ = auVar129._0_4_;
          local_6a0._4_4_ = auVar129._4_4_;
          fStack_698 = auVar129._8_4_;
          fStack_694 = auVar129._12_4_;
          fStack_690 = auVar129._16_4_;
          fStack_68c = auVar129._20_4_;
          fStack_688 = auVar129._24_4_;
          fVar202 = (float)local_a0._0_4_ * (float)local_6a0._0_4_;
          fVar214 = (float)local_a0._4_4_ * (float)local_6a0._4_4_;
          fVar218 = fStack_98 * fStack_698;
          fVar220 = fStack_94 * fStack_694;
          fVar232 = fStack_90 * fStack_690;
          fVar235 = fStack_8c * fStack_68c;
          fVar242 = fStack_88 * fStack_688;
          _local_6a0 = auVar318;
          local_560._0_4_ = auVar128._0_4_;
          local_560._4_4_ = auVar128._4_4_;
          fStack_558 = auVar128._8_4_;
          fStack_554 = auVar128._12_4_;
          fStack_550 = auVar128._16_4_;
          fStack_54c = auVar128._20_4_;
          fStack_548 = auVar128._24_4_;
          local_560._0_4_ =
               fVar255 * (float)local_480._0_4_ +
               fVar289 * (float)local_2a0._0_4_ +
               fVar202 + (float)local_5c0._0_4_ * (float)local_560._0_4_;
          local_560._4_4_ =
               fVar256 * (float)local_480._4_4_ +
               fVar219 * (float)local_2a0._4_4_ +
               fVar214 + (float)local_5c0._4_4_ * (float)local_560._4_4_;
          fStack_558 = fVar257 * fStack_478 +
                       fVar290 * fStack_298 + fVar218 + fStack_5b8 * fStack_558;
          fStack_554 = fVar286 * fStack_474 +
                       fVar291 * fStack_294 + fVar220 + fStack_5b4 * fStack_554;
          fStack_550 = fVar217 * fStack_470 +
                       fVar293 * fStack_290 + fVar232 + fStack_5b0 * fStack_550;
          fStack_54c = fVar288 * fStack_46c +
                       fVar221 * fStack_28c + fVar235 + fStack_5ac * fStack_54c;
          fStack_548 = fVar287 * fStack_468 +
                       fVar292 * fStack_288 + fVar242 + fStack_5a8 * fStack_548;
          fStack_544 = pfVar4[7] + local_340._28_4_ + local_3c0._28_4_ + 0.0;
          local_520._0_4_ = auVar126._0_4_;
          local_520._4_4_ = auVar126._4_4_;
          fStack_518 = auVar126._8_4_;
          fStack_514 = auVar126._12_4_;
          fStack_510 = auVar126._16_4_;
          fStack_50c = auVar126._20_4_;
          fStack_508 = auVar126._24_4_;
          local_3e0._0_4_ = auVar125._0_4_;
          local_3e0._4_4_ = auVar125._4_4_;
          fStack_3d8 = auVar125._8_4_;
          fStack_3d4 = auVar125._12_4_;
          fStack_3d0 = auVar125._16_4_;
          fStack_3cc = auVar125._20_4_;
          fStack_3c8 = auVar125._24_4_;
          fVar164 = (float)local_a0._0_4_ * (float)local_3e0._0_4_;
          fVar178 = (float)local_a0._4_4_ * (float)local_3e0._4_4_;
          fVar180 = fStack_98 * fStack_3d8;
          fVar182 = fStack_94 * fStack_3d4;
          fVar183 = fStack_90 * fStack_3d0;
          fVar185 = fStack_8c * fStack_3cc;
          fVar186 = fStack_88 * fStack_3c8;
          pfVar4 = (float *)(lVar136 + 0x21abdfc + lVar135 * 4);
          fVar202 = *pfVar4;
          fVar214 = pfVar4[1];
          fVar218 = pfVar4[2];
          fVar220 = pfVar4[3];
          fVar232 = pfVar4[4];
          fVar235 = pfVar4[5];
          fVar242 = pfVar4[6];
          pfVar5 = (float *)(lVar136 + 0x21ac280 + lVar135 * 4);
          fVar243 = *pfVar5;
          fVar252 = pfVar5[1];
          fVar253 = pfVar5[2];
          fVar254 = pfVar5[3];
          fVar255 = pfVar5[4];
          fVar256 = pfVar5[5];
          fVar257 = pfVar5[6];
          fVar265 = *(float *)pauVar3[1] + 0.0;
          pfVar7 = (float *)(lVar136 + 0x21ab978 + lVar135 * 4);
          fVar286 = *pfVar7;
          fVar217 = pfVar7[1];
          fVar288 = pfVar7[2];
          fVar287 = pfVar7[3];
          fVar289 = pfVar7[4];
          fVar219 = pfVar7[5];
          fVar290 = pfVar7[6];
          fVar162 = pfVar4[7] + pfVar5[7];
          fStack_524 = pfVar5[7] + fVar265;
          fVar265 = *(float *)pauVar3[1] + fVar244 + fVar265;
          pfVar4 = (float *)(lVar136 + 0x21ab4f4 + lVar135 * 4);
          fVar244 = *pfVar4;
          fVar291 = pfVar4[1];
          fVar293 = pfVar4[2];
          fVar221 = pfVar4[3];
          fVar292 = pfVar4[4];
          fVar310 = pfVar4[5];
          fVar312 = pfVar4[6];
          local_3e0._4_4_ =
               fVar291 * fVar266 +
               fVar217 * (float)local_640._4_4_ +
               (float)local_5a0._4_4_ * fVar214 + (float)local_360._4_4_ * fVar252;
          local_3e0._0_4_ =
               fVar244 * fVar285 +
               fVar286 * (float)local_640._0_4_ +
               (float)local_5a0._0_4_ * fVar202 + (float)local_360._0_4_ * fVar243;
          fStack_3d8 = fVar293 * fVar278 +
                       fVar288 * fStack_638 + fStack_598 * fVar218 + fStack_358 * fVar253;
          fStack_3d4 = fVar221 * fVar163 +
                       fVar287 * fStack_634 + fStack_594 * fVar220 + fStack_354 * fVar254;
          fStack_3d0 = fVar292 * fVar177 +
                       fVar289 * fStack_630 + fStack_590 * fVar232 + fStack_350 * fVar255;
          fStack_3cc = fVar310 * fVar179 +
                       fVar219 * fStack_62c + fStack_58c * fVar235 + fStack_34c * fVar256;
          fStack_3c8 = fVar312 * fVar181 +
                       fVar290 * fStack_628 + fStack_588 * fVar242 + fStack_348 * fVar257;
          fStack_3c4 = fVar162 + fStack_524;
          local_540 = fVar244 * (float)local_2c0._0_4_ +
                      fVar187 * fVar202 + (float)local_580._0_4_ * fVar243 +
                      fVar286 * (float)local_5e0._0_4_;
          fStack_53c = fVar291 * (float)local_2c0._4_4_ +
                       fVar199 * fVar214 + (float)local_580._4_4_ * fVar252 +
                       fVar217 * (float)local_5e0._4_4_;
          fStack_538 = fVar293 * fStack_2b8 +
                       fVar200 * fVar218 + fStack_578 * fVar253 + fVar288 * fStack_5d8;
          fStack_534 = fVar221 * fStack_2b4 +
                       fVar201 * fVar220 + fStack_574 * fVar254 + fVar287 * fStack_5d4;
          fStack_530 = fVar292 * fStack_2b0 +
                       fVar224 * fVar232 + fStack_570 * fVar255 + fVar289 * fStack_5d0;
          fStack_52c = fVar310 * fStack_2ac +
                       fVar238 * fVar235 + fStack_56c * fVar256 + fVar219 * fStack_5cc;
          fStack_528 = fVar312 * fStack_2a8 +
                       fVar241 * fVar242 + fStack_568 * fVar257 + fVar290 * fStack_5c8;
          fStack_524 = fStack_524 + fVar265;
          auVar330._0_4_ =
               fVar286 * (float)local_2a0._0_4_ +
               (float)local_a0._0_4_ * fVar202 + (float)local_5c0._0_4_ * fVar243 +
               fVar244 * (float)local_480._0_4_;
          auVar330._4_4_ =
               fVar217 * (float)local_2a0._4_4_ +
               (float)local_a0._4_4_ * fVar214 + (float)local_5c0._4_4_ * fVar252 +
               fVar291 * (float)local_480._4_4_;
          auVar330._8_4_ =
               fVar288 * fStack_298 + fStack_98 * fVar218 + fStack_5b8 * fVar253 +
               fVar293 * fStack_478;
          auVar330._12_4_ =
               fVar287 * fStack_294 + fStack_94 * fVar220 + fStack_5b4 * fVar254 +
               fVar221 * fStack_474;
          auVar330._16_4_ =
               fVar289 * fStack_290 + fStack_90 * fVar232 + fStack_5b0 * fVar255 +
               fVar292 * fStack_470;
          auVar330._20_4_ =
               fVar219 * fStack_28c + fStack_8c * fVar235 + fStack_5ac * fVar256 +
               fVar310 * fStack_46c;
          auVar330._24_4_ =
               fVar290 * fStack_288 + fStack_88 * fVar242 + fStack_5a8 * fVar257 +
               fVar312 * fStack_468;
          auVar330._28_4_ = pfVar7[7] + fVar162 + fVar265;
          pfVar4 = (float *)(lVar136 + 0x21ae21c + lVar135 * 4);
          fVar202 = *pfVar4;
          fVar214 = pfVar4[1];
          fVar218 = pfVar4[2];
          fVar220 = pfVar4[3];
          fVar232 = pfVar4[4];
          fVar235 = pfVar4[5];
          fVar242 = pfVar4[6];
          pfVar5 = (float *)(lVar136 + 0x21ae6a0 + lVar135 * 4);
          fVar243 = *pfVar5;
          fVar244 = pfVar5[1];
          fVar252 = pfVar5[2];
          fVar253 = pfVar5[3];
          fVar254 = pfVar5[4];
          fVar255 = pfVar5[5];
          fVar256 = pfVar5[6];
          pfVar7 = (float *)(lVar136 + 0x21add98 + lVar135 * 4);
          fVar257 = *pfVar7;
          fVar286 = pfVar7[1];
          fVar217 = pfVar7[2];
          fVar288 = pfVar7[3];
          fVar287 = pfVar7[4];
          fVar289 = pfVar7[5];
          fVar219 = pfVar7[6];
          pfVar8 = (float *)(lVar136 + 0x21ad914 + lVar135 * 4);
          fVar290 = *pfVar8;
          fVar291 = pfVar8[1];
          fVar293 = pfVar8[2];
          fVar221 = pfVar8[3];
          fVar292 = pfVar8[4];
          fVar310 = pfVar8[5];
          fVar312 = pfVar8[6];
          auVar298._0_4_ =
               fVar290 * fVar285 +
               fVar257 * (float)local_640._0_4_ +
               (float)local_5a0._0_4_ * fVar202 + (float)local_360._0_4_ * fVar243;
          auVar298._4_4_ =
               fVar291 * fVar266 +
               fVar286 * (float)local_640._4_4_ +
               (float)local_5a0._4_4_ * fVar214 + (float)local_360._4_4_ * fVar244;
          auVar298._8_4_ =
               fVar293 * fVar278 +
               fVar217 * fStack_638 + fStack_598 * fVar218 + fStack_358 * fVar252;
          auVar298._12_4_ =
               fVar221 * fVar163 +
               fVar288 * fStack_634 + fStack_594 * fVar220 + fStack_354 * fVar253;
          auVar298._16_4_ =
               fVar292 * fVar177 +
               fVar287 * fStack_630 + fStack_590 * fVar232 + fStack_350 * fVar254;
          auVar298._20_4_ =
               fVar310 * fVar179 +
               fVar289 * fStack_62c + fStack_58c * fVar235 + fStack_34c * fVar255;
          auVar298._24_4_ =
               fVar312 * fVar181 +
               fVar219 * fStack_628 + fStack_588 * fVar242 + fStack_348 * fVar256;
          auVar298._28_4_ = fStack_344 + fStack_344 + fStack_584 + fStack_344;
          auVar326._0_4_ =
               fVar290 * (float)local_2c0._0_4_ +
               fVar257 * (float)local_5e0._0_4_ +
               fVar187 * fVar202 + (float)local_580._0_4_ * fVar243;
          auVar326._4_4_ =
               fVar291 * (float)local_2c0._4_4_ +
               fVar286 * (float)local_5e0._4_4_ +
               fVar199 * fVar214 + (float)local_580._4_4_ * fVar244;
          auVar326._8_4_ =
               fVar293 * fStack_2b8 +
               fVar217 * fStack_5d8 + fVar200 * fVar218 + fStack_578 * fVar252;
          auVar326._12_4_ =
               fVar221 * fStack_2b4 +
               fVar288 * fStack_5d4 + fVar201 * fVar220 + fStack_574 * fVar253;
          auVar326._16_4_ =
               fVar292 * fStack_2b0 +
               fVar287 * fStack_5d0 + fVar224 * fVar232 + fStack_570 * fVar254;
          auVar326._20_4_ =
               fVar310 * fStack_2ac +
               fVar289 * fStack_5cc + fVar238 * fVar235 + fStack_56c * fVar255;
          auVar326._24_4_ =
               fVar312 * fStack_2a8 +
               fVar219 * fStack_5c8 + fVar241 * fVar242 + fStack_568 * fVar256;
          auVar326._28_4_ = fStack_344 + fStack_344 + fStack_564 + fStack_344;
          auVar251._8_4_ = 0x7fffffff;
          auVar251._0_8_ = 0x7fffffff7fffffff;
          auVar251._12_4_ = 0x7fffffff;
          auVar251._16_4_ = 0x7fffffff;
          auVar251._20_4_ = 0x7fffffff;
          auVar251._24_4_ = 0x7fffffff;
          auVar251._28_4_ = 0x7fffffff;
          auVar149 = vandps_avx(_local_3e0,auVar251);
          auVar122._4_4_ = fStack_53c;
          auVar122._0_4_ = local_540;
          auVar122._8_4_ = fStack_538;
          auVar122._12_4_ = fStack_534;
          auVar122._16_4_ = fStack_530;
          auVar122._20_4_ = fStack_52c;
          auVar122._24_4_ = fStack_528;
          auVar122._28_4_ = fStack_524;
          auVar27 = vandps_avx(auVar122,auVar251);
          auVar27 = vmaxps_avx(auVar149,auVar27);
          auVar149 = vandps_avx(auVar330,auVar251);
          auVar27 = vmaxps_avx(auVar27,auVar149);
          auVar27 = vcmpps_avx(auVar27,_local_440,1);
          auVar28 = vblendvps_avx(_local_3e0,auVar25,auVar27);
          auVar151._0_4_ =
               fVar290 * (float)local_480._0_4_ +
               fVar257 * (float)local_2a0._0_4_ +
               (float)local_5c0._0_4_ * fVar243 + (float)local_a0._0_4_ * fVar202;
          auVar151._4_4_ =
               fVar291 * (float)local_480._4_4_ +
               fVar286 * (float)local_2a0._4_4_ +
               (float)local_5c0._4_4_ * fVar244 + (float)local_a0._4_4_ * fVar214;
          auVar151._8_4_ =
               fVar293 * fStack_478 +
               fVar217 * fStack_298 + fStack_5b8 * fVar252 + fStack_98 * fVar218;
          auVar151._12_4_ =
               fVar221 * fStack_474 +
               fVar288 * fStack_294 + fStack_5b4 * fVar253 + fStack_94 * fVar220;
          auVar151._16_4_ =
               fVar292 * fStack_470 +
               fVar287 * fStack_290 + fStack_5b0 * fVar254 + fStack_90 * fVar232;
          auVar151._20_4_ =
               fVar310 * fStack_46c +
               fVar289 * fStack_28c + fStack_5ac * fVar255 + fStack_8c * fVar235;
          auVar151._24_4_ =
               fVar312 * fStack_468 +
               fVar219 * fStack_288 + fStack_5a8 * fVar256 + fStack_88 * fVar242;
          auVar151._28_4_ = auVar149._28_4_ + pfVar7[7] + pfVar5[7] + pfVar4[7];
          auVar29 = vblendvps_avx(auVar122,auVar26,auVar27);
          auVar149 = vandps_avx(auVar298,auVar251);
          auVar27 = vandps_avx(auVar326,auVar251);
          auVar30 = vmaxps_avx(auVar149,auVar27);
          auVar149 = vandps_avx(auVar151,auVar251);
          auVar149 = vmaxps_avx(auVar30,auVar149);
          local_500._0_4_ = auVar127._0_4_;
          local_500._4_4_ = auVar127._4_4_;
          fStack_4f8 = auVar127._8_4_;
          fStack_4f4 = auVar127._12_4_;
          fStack_4f0 = auVar127._16_4_;
          fStack_4ec = auVar127._20_4_;
          fStack_4e8 = auVar127._24_4_;
          auVar27 = vcmpps_avx(auVar149,_local_440,1);
          auVar149 = vblendvps_avx(auVar298,auVar25,auVar27);
          auVar152._0_4_ =
               (float)local_480._0_4_ * (float)local_500._0_4_ +
               (float)local_2a0._0_4_ * (float)local_520._0_4_ +
               fVar164 + (float)local_5c0._0_4_ * fVar314;
          auVar152._4_4_ =
               (float)local_480._4_4_ * (float)local_500._4_4_ +
               (float)local_2a0._4_4_ * (float)local_520._4_4_ +
               fVar178 + (float)local_5c0._4_4_ * fVar140;
          auVar152._8_4_ =
               fStack_478 * fStack_4f8 + fStack_298 * fStack_518 + fVar180 + fStack_5b8 * fVar157;
          auVar152._12_4_ =
               fStack_474 * fStack_4f4 + fStack_294 * fStack_514 + fVar182 + fStack_5b4 * fVar158;
          auVar152._16_4_ =
               fStack_470 * fStack_4f0 + fStack_290 * fStack_510 + fVar183 + fStack_5b0 * fVar159;
          auVar152._20_4_ =
               fStack_46c * fStack_4ec + fStack_28c * fStack_50c + fVar185 + fStack_5ac * fVar160;
          auVar152._24_4_ =
               fStack_468 * fStack_4e8 + fStack_288 * fStack_508 + fVar186 + fStack_5a8 * fVar161;
          auVar152._28_4_ = auVar30._28_4_ + fStack_544 + local_3c0._28_4_ + 0.0;
          auVar25 = vblendvps_avx(auVar326,auVar26,auVar27);
          fVar158 = auVar28._0_4_;
          fVar159 = auVar28._4_4_;
          fVar160 = auVar28._8_4_;
          fVar161 = auVar28._12_4_;
          fVar164 = auVar28._16_4_;
          fVar178 = auVar28._20_4_;
          fVar180 = auVar28._24_4_;
          fVar182 = auVar28._28_4_;
          fVar254 = auVar149._0_4_;
          fVar256 = auVar149._4_4_;
          fVar286 = auVar149._8_4_;
          fVar288 = auVar149._12_4_;
          fVar289 = auVar149._16_4_;
          fVar290 = auVar149._20_4_;
          fVar293 = auVar149._24_4_;
          fVar202 = auVar29._0_4_;
          fVar218 = auVar29._4_4_;
          fVar224 = auVar29._8_4_;
          fVar235 = auVar29._12_4_;
          fVar241 = auVar29._16_4_;
          fVar243 = auVar29._20_4_;
          fVar252 = auVar29._24_4_;
          auVar307._0_4_ = fVar202 * fVar202 + fVar158 * fVar158;
          auVar307._4_4_ = fVar218 * fVar218 + fVar159 * fVar159;
          auVar307._8_4_ = fVar224 * fVar224 + fVar160 * fVar160;
          auVar307._12_4_ = fVar235 * fVar235 + fVar161 * fVar161;
          auVar307._16_4_ = fVar241 * fVar241 + fVar164 * fVar164;
          auVar307._20_4_ = fVar243 * fVar243 + fVar178 * fVar178;
          auVar307._24_4_ = fVar252 * fVar252 + fVar180 * fVar180;
          auVar307._28_4_ = fStack_5a4 + auVar26._28_4_;
          auVar26 = vrsqrtps_avx(auVar307);
          fVar214 = auVar26._0_4_;
          fVar220 = auVar26._4_4_;
          auVar79._4_4_ = fVar220 * 1.5;
          auVar79._0_4_ = fVar214 * 1.5;
          fVar232 = auVar26._8_4_;
          auVar79._8_4_ = fVar232 * 1.5;
          fVar238 = auVar26._12_4_;
          auVar79._12_4_ = fVar238 * 1.5;
          fVar242 = auVar26._16_4_;
          auVar79._16_4_ = fVar242 * 1.5;
          fVar244 = auVar26._20_4_;
          auVar79._20_4_ = fVar244 * 1.5;
          fVar253 = auVar26._24_4_;
          auVar79._24_4_ = fVar253 * 1.5;
          auVar79._28_4_ = auVar326._28_4_;
          auVar80._4_4_ = fVar220 * fVar220 * fVar220 * auVar307._4_4_ * 0.5;
          auVar80._0_4_ = fVar214 * fVar214 * fVar214 * auVar307._0_4_ * 0.5;
          auVar80._8_4_ = fVar232 * fVar232 * fVar232 * auVar307._8_4_ * 0.5;
          auVar80._12_4_ = fVar238 * fVar238 * fVar238 * auVar307._12_4_ * 0.5;
          auVar80._16_4_ = fVar242 * fVar242 * fVar242 * auVar307._16_4_ * 0.5;
          auVar80._20_4_ = fVar244 * fVar244 * fVar244 * auVar307._20_4_ * 0.5;
          auVar80._24_4_ = fVar253 * fVar253 * fVar253 * auVar307._24_4_ * 0.5;
          auVar80._28_4_ = auVar307._28_4_;
          auVar27 = vsubps_avx(auVar79,auVar80);
          fVar292 = auVar27._0_4_;
          fVar310 = auVar27._4_4_;
          fVar312 = auVar27._8_4_;
          fVar162 = auVar27._12_4_;
          fVar314 = auVar27._16_4_;
          fVar140 = auVar27._20_4_;
          fVar157 = auVar27._24_4_;
          fVar214 = auVar25._0_4_;
          fVar220 = auVar25._4_4_;
          fVar232 = auVar25._8_4_;
          fVar238 = auVar25._12_4_;
          fVar242 = auVar25._16_4_;
          fVar244 = auVar25._20_4_;
          fVar253 = auVar25._24_4_;
          auVar282._0_4_ = fVar214 * fVar214 + fVar254 * fVar254;
          auVar282._4_4_ = fVar220 * fVar220 + fVar256 * fVar256;
          auVar282._8_4_ = fVar232 * fVar232 + fVar286 * fVar286;
          auVar282._12_4_ = fVar238 * fVar238 + fVar288 * fVar288;
          auVar282._16_4_ = fVar242 * fVar242 + fVar289 * fVar289;
          auVar282._20_4_ = fVar244 * fVar244 + fVar290 * fVar290;
          auVar282._24_4_ = fVar253 * fVar253 + fVar293 * fVar293;
          auVar282._28_4_ = auVar26._28_4_ + auVar149._28_4_;
          auVar149 = vrsqrtps_avx(auVar282);
          fVar255 = auVar149._0_4_;
          fVar257 = auVar149._4_4_;
          auVar81._4_4_ = fVar257 * 1.5;
          auVar81._0_4_ = fVar255 * 1.5;
          fVar217 = auVar149._8_4_;
          auVar81._8_4_ = fVar217 * 1.5;
          fVar287 = auVar149._12_4_;
          auVar81._12_4_ = fVar287 * 1.5;
          fVar219 = auVar149._16_4_;
          auVar81._16_4_ = fVar219 * 1.5;
          fVar291 = auVar149._20_4_;
          auVar81._20_4_ = fVar291 * 1.5;
          fVar221 = auVar149._24_4_;
          auVar81._24_4_ = fVar221 * 1.5;
          auVar81._28_4_ = auVar326._28_4_;
          auVar82._4_4_ = fVar257 * fVar257 * fVar257 * auVar282._4_4_ * 0.5;
          auVar82._0_4_ = fVar255 * fVar255 * fVar255 * auVar282._0_4_ * 0.5;
          auVar82._8_4_ = fVar217 * fVar217 * fVar217 * auVar282._8_4_ * 0.5;
          auVar82._12_4_ = fVar287 * fVar287 * fVar287 * auVar282._12_4_ * 0.5;
          auVar82._16_4_ = fVar219 * fVar219 * fVar219 * auVar282._16_4_ * 0.5;
          auVar82._20_4_ = fVar291 * fVar291 * fVar291 * auVar282._20_4_ * 0.5;
          auVar82._24_4_ = fVar221 * fVar221 * fVar221 * auVar282._24_4_ * 0.5;
          auVar82._28_4_ = auVar282._28_4_;
          auVar25 = vsubps_avx(auVar81,auVar82);
          fVar255 = auVar25._0_4_;
          fVar257 = auVar25._4_4_;
          fVar217 = auVar25._8_4_;
          fVar287 = auVar25._12_4_;
          fVar219 = auVar25._16_4_;
          fVar291 = auVar25._20_4_;
          fVar221 = auVar25._24_4_;
          fVar202 = (float)local_7a0._0_4_ * fVar292 * fVar202;
          fVar218 = (float)local_7a0._4_4_ * fVar310 * fVar218;
          auVar83._4_4_ = fVar218;
          auVar83._0_4_ = fVar202;
          fVar224 = fStack_798 * fVar312 * fVar224;
          auVar83._8_4_ = fVar224;
          fVar235 = fStack_794 * fVar162 * fVar235;
          auVar83._12_4_ = fVar235;
          fVar241 = fStack_790 * fVar314 * fVar241;
          auVar83._16_4_ = fVar241;
          fVar243 = fStack_78c * fVar140 * fVar243;
          auVar83._20_4_ = fVar243;
          fVar252 = fStack_788 * fVar157 * fVar252;
          auVar83._24_4_ = fVar252;
          auVar83._28_4_ = auVar149._28_4_;
          local_500._4_4_ = fVar218 + local_720._4_4_;
          local_500._0_4_ = fVar202 + (float)local_720._0_4_;
          fStack_4f8 = fVar224 + local_720._8_4_;
          fStack_4f4 = fVar235 + local_720._12_4_;
          fStack_4f0 = fVar241 + register0x00001410;
          fStack_4ec = fVar243 + register0x00001414;
          fStack_4e8 = fVar252 + register0x00001418;
          fStack_4e4 = auVar149._28_4_ + register0x0000141c;
          fVar202 = (float)local_7a0._0_4_ * fVar292 * -fVar158;
          fVar218 = (float)local_7a0._4_4_ * fVar310 * -fVar159;
          auVar84._4_4_ = fVar218;
          auVar84._0_4_ = fVar202;
          fVar224 = fStack_798 * fVar312 * -fVar160;
          auVar84._8_4_ = fVar224;
          fVar235 = fStack_794 * fVar162 * -fVar161;
          auVar84._12_4_ = fVar235;
          fVar241 = fStack_790 * fVar314 * -fVar164;
          auVar84._16_4_ = fVar241;
          fVar243 = fStack_78c * fVar140 * -fVar178;
          auVar84._20_4_ = fVar243;
          fVar252 = fStack_788 * fVar157 * -fVar180;
          auVar84._24_4_ = fVar252;
          auVar84._28_4_ = -fVar182;
          local_520._4_4_ = local_700._4_4_ + fVar218;
          local_520._0_4_ = (float)local_700._0_4_ + fVar202;
          fStack_518 = local_700._8_4_ + fVar224;
          fStack_514 = local_700._12_4_ + fVar235;
          fStack_510 = local_700._16_4_ + fVar241;
          fStack_50c = local_700._20_4_ + fVar243;
          fStack_508 = local_700._24_4_ + fVar252;
          fStack_504 = local_700._28_4_ + -fVar182;
          fVar202 = fVar292 * 0.0 * (float)local_7a0._0_4_;
          fVar218 = fVar310 * 0.0 * (float)local_7a0._4_4_;
          auVar85._4_4_ = fVar218;
          auVar85._0_4_ = fVar202;
          fVar224 = fVar312 * 0.0 * fStack_798;
          auVar85._8_4_ = fVar224;
          fVar235 = fVar162 * 0.0 * fStack_794;
          auVar85._12_4_ = fVar235;
          fVar241 = fVar314 * 0.0 * fStack_790;
          auVar85._16_4_ = fVar241;
          fVar243 = fVar140 * 0.0 * fStack_78c;
          auVar85._20_4_ = fVar243;
          fVar252 = fVar157 * 0.0 * fStack_788;
          auVar85._24_4_ = fVar252;
          auVar85._28_4_ = fVar182;
          auVar30 = vsubps_avx(_local_720,auVar83);
          auVar345._0_4_ = fVar202 + auVar152._0_4_;
          auVar345._4_4_ = fVar218 + auVar152._4_4_;
          auVar345._8_4_ = fVar224 + auVar152._8_4_;
          auVar345._12_4_ = fVar235 + auVar152._12_4_;
          auVar345._16_4_ = fVar241 + auVar152._16_4_;
          auVar345._20_4_ = fVar243 + auVar152._20_4_;
          auVar345._24_4_ = fVar252 + auVar152._24_4_;
          auVar345._28_4_ = fVar182 + auVar152._28_4_;
          fVar202 = auVar318._0_4_ * fVar255 * fVar214;
          fVar214 = auVar318._4_4_ * fVar257 * fVar220;
          auVar86._4_4_ = fVar214;
          auVar86._0_4_ = fVar202;
          fVar218 = auVar318._8_4_ * fVar217 * fVar232;
          auVar86._8_4_ = fVar218;
          fVar220 = auVar318._12_4_ * fVar287 * fVar238;
          auVar86._12_4_ = fVar220;
          fVar224 = auVar318._16_4_ * fVar219 * fVar242;
          auVar86._16_4_ = fVar224;
          fVar232 = auVar318._20_4_ * fVar291 * fVar244;
          auVar86._20_4_ = fVar232;
          fVar235 = auVar318._24_4_ * fVar221 * fVar253;
          auVar86._24_4_ = fVar235;
          auVar86._28_4_ = fStack_784;
          auVar33 = vsubps_avx(local_700,auVar84);
          auVar331._0_4_ = local_4a0._0_4_ + fVar202;
          auVar331._4_4_ = local_4a0._4_4_ + fVar214;
          auVar331._8_4_ = local_4a0._8_4_ + fVar218;
          auVar331._12_4_ = local_4a0._12_4_ + fVar220;
          auVar331._16_4_ = local_4a0._16_4_ + fVar224;
          auVar331._20_4_ = local_4a0._20_4_ + fVar232;
          auVar331._24_4_ = local_4a0._24_4_ + fVar235;
          auVar331._28_4_ = local_4a0._28_4_ + fStack_784;
          fVar202 = fVar255 * -fVar254 * auVar318._0_4_;
          fVar214 = fVar257 * -fVar256 * auVar318._4_4_;
          auVar87._4_4_ = fVar214;
          auVar87._0_4_ = fVar202;
          fVar218 = fVar217 * -fVar286 * auVar318._8_4_;
          auVar87._8_4_ = fVar218;
          fVar220 = fVar287 * -fVar288 * auVar318._12_4_;
          auVar87._12_4_ = fVar220;
          fVar224 = fVar219 * -fVar289 * auVar318._16_4_;
          auVar87._16_4_ = fVar224;
          fVar232 = fVar291 * -fVar290 * auVar318._20_4_;
          auVar87._20_4_ = fVar232;
          fVar235 = fVar221 * -fVar293 * auVar318._24_4_;
          auVar87._24_4_ = fVar235;
          auVar87._28_4_ = register0x0000141c;
          auVar143 = vsubps_avx(auVar152,auVar85);
          auVar231._0_4_ = local_380._0_4_ + fVar202;
          auVar231._4_4_ = local_380._4_4_ + fVar214;
          auVar231._8_4_ = local_380._8_4_ + fVar218;
          auVar231._12_4_ = local_380._12_4_ + fVar220;
          auVar231._16_4_ = local_380._16_4_ + fVar224;
          auVar231._20_4_ = local_380._20_4_ + fVar232;
          auVar231._24_4_ = local_380._24_4_ + fVar235;
          auVar231._28_4_ = local_380._28_4_ + register0x0000141c;
          fVar202 = fVar255 * 0.0 * auVar318._0_4_;
          fVar214 = fVar257 * 0.0 * auVar318._4_4_;
          auVar88._4_4_ = fVar214;
          auVar88._0_4_ = fVar202;
          fVar218 = fVar217 * 0.0 * auVar318._8_4_;
          auVar88._8_4_ = fVar218;
          fVar220 = fVar287 * 0.0 * auVar318._12_4_;
          auVar88._12_4_ = fVar220;
          fVar224 = fVar219 * 0.0 * auVar318._16_4_;
          auVar88._16_4_ = fVar224;
          fVar232 = fVar291 * 0.0 * auVar318._20_4_;
          auVar88._20_4_ = fVar232;
          fVar235 = fVar221 * 0.0 * auVar318._24_4_;
          auVar88._24_4_ = fVar235;
          auVar88._28_4_ = auVar152._28_4_;
          auVar149 = vsubps_avx(local_4a0,auVar86);
          auVar299._0_4_ = (float)local_560._0_4_ + fVar202;
          auVar299._4_4_ = (float)local_560._4_4_ + fVar214;
          auVar299._8_4_ = fStack_558 + fVar218;
          auVar299._12_4_ = fStack_554 + fVar220;
          auVar299._16_4_ = fStack_550 + fVar224;
          auVar299._20_4_ = fStack_54c + fVar232;
          auVar299._24_4_ = fStack_548 + fVar235;
          auVar299._28_4_ = fStack_544 + auVar152._28_4_;
          auVar26 = vsubps_avx(local_380,auVar87);
          auVar27 = vsubps_avx(_local_560,auVar88);
          auVar28 = vsubps_avx(auVar231,auVar33);
          auVar29 = vsubps_avx(auVar299,auVar143);
          auVar89._4_4_ = auVar143._4_4_ * auVar28._4_4_;
          auVar89._0_4_ = auVar143._0_4_ * auVar28._0_4_;
          auVar89._8_4_ = auVar143._8_4_ * auVar28._8_4_;
          auVar89._12_4_ = auVar143._12_4_ * auVar28._12_4_;
          auVar89._16_4_ = auVar143._16_4_ * auVar28._16_4_;
          auVar89._20_4_ = auVar143._20_4_ * auVar28._20_4_;
          auVar89._24_4_ = auVar143._24_4_ * auVar28._24_4_;
          auVar89._28_4_ = auVar326._28_4_;
          auVar90._4_4_ = auVar33._4_4_ * auVar29._4_4_;
          auVar90._0_4_ = auVar33._0_4_ * auVar29._0_4_;
          auVar90._8_4_ = auVar33._8_4_ * auVar29._8_4_;
          auVar90._12_4_ = auVar33._12_4_ * auVar29._12_4_;
          auVar90._16_4_ = auVar33._16_4_ * auVar29._16_4_;
          auVar90._20_4_ = auVar33._20_4_ * auVar29._20_4_;
          auVar90._24_4_ = auVar33._24_4_ * auVar29._24_4_;
          auVar90._28_4_ = fStack_544;
          auVar31 = vsubps_avx(auVar90,auVar89);
          auVar91._4_4_ = auVar30._4_4_ * auVar29._4_4_;
          auVar91._0_4_ = auVar30._0_4_ * auVar29._0_4_;
          auVar91._8_4_ = auVar30._8_4_ * auVar29._8_4_;
          auVar91._12_4_ = auVar30._12_4_ * auVar29._12_4_;
          auVar91._16_4_ = auVar30._16_4_ * auVar29._16_4_;
          auVar91._20_4_ = auVar30._20_4_ * auVar29._20_4_;
          auVar91._24_4_ = auVar30._24_4_ * auVar29._24_4_;
          auVar91._28_4_ = auVar29._28_4_;
          auVar29 = vsubps_avx(auVar331,auVar30);
          auVar92._4_4_ = auVar143._4_4_ * auVar29._4_4_;
          auVar92._0_4_ = auVar143._0_4_ * auVar29._0_4_;
          auVar92._8_4_ = auVar143._8_4_ * auVar29._8_4_;
          auVar92._12_4_ = auVar143._12_4_ * auVar29._12_4_;
          auVar92._16_4_ = auVar143._16_4_ * auVar29._16_4_;
          auVar92._20_4_ = auVar143._20_4_ * auVar29._20_4_;
          auVar92._24_4_ = auVar143._24_4_ * auVar29._24_4_;
          auVar92._28_4_ = auVar25._28_4_;
          auVar32 = vsubps_avx(auVar92,auVar91);
          auVar93._4_4_ = auVar33._4_4_ * auVar29._4_4_;
          auVar93._0_4_ = auVar33._0_4_ * auVar29._0_4_;
          auVar93._8_4_ = auVar33._8_4_ * auVar29._8_4_;
          auVar93._12_4_ = auVar33._12_4_ * auVar29._12_4_;
          auVar93._16_4_ = auVar33._16_4_ * auVar29._16_4_;
          auVar93._20_4_ = auVar33._20_4_ * auVar29._20_4_;
          auVar93._24_4_ = auVar33._24_4_ * auVar29._24_4_;
          auVar93._28_4_ = auVar25._28_4_;
          auVar94._4_4_ = auVar30._4_4_ * auVar28._4_4_;
          auVar94._0_4_ = auVar30._0_4_ * auVar28._0_4_;
          auVar94._8_4_ = auVar30._8_4_ * auVar28._8_4_;
          auVar94._12_4_ = auVar30._12_4_ * auVar28._12_4_;
          auVar94._16_4_ = auVar30._16_4_ * auVar28._16_4_;
          auVar94._20_4_ = auVar30._20_4_ * auVar28._20_4_;
          auVar94._24_4_ = auVar30._24_4_ * auVar28._24_4_;
          auVar94._28_4_ = auVar28._28_4_;
          auVar25 = vsubps_avx(auVar94,auVar93);
          auVar173._0_4_ = auVar31._0_4_ * 0.0 + auVar25._0_4_ + auVar32._0_4_ * 0.0;
          auVar173._4_4_ = auVar31._4_4_ * 0.0 + auVar25._4_4_ + auVar32._4_4_ * 0.0;
          auVar173._8_4_ = auVar31._8_4_ * 0.0 + auVar25._8_4_ + auVar32._8_4_ * 0.0;
          auVar173._12_4_ = auVar31._12_4_ * 0.0 + auVar25._12_4_ + auVar32._12_4_ * 0.0;
          auVar173._16_4_ = auVar31._16_4_ * 0.0 + auVar25._16_4_ + auVar32._16_4_ * 0.0;
          auVar173._20_4_ = auVar31._20_4_ * 0.0 + auVar25._20_4_ + auVar32._20_4_ * 0.0;
          auVar173._24_4_ = auVar31._24_4_ * 0.0 + auVar25._24_4_ + auVar32._24_4_ * 0.0;
          auVar173._28_4_ = auVar31._28_4_ + auVar25._28_4_ + auVar32._28_4_;
          auVar24 = vcmpps_avx(auVar173,ZEXT832(0) << 0x20,2);
          auVar149 = vblendvps_avx(auVar149,_local_500,auVar24);
          auVar25 = vblendvps_avx(auVar26,_local_520,auVar24);
          auVar26 = vblendvps_avx(auVar27,auVar345,auVar24);
          auVar27 = vblendvps_avx(auVar30,auVar331,auVar24);
          auVar28 = vblendvps_avx(auVar33,auVar231,auVar24);
          auVar29 = vblendvps_avx(auVar143,auVar299,auVar24);
          auVar30 = vblendvps_avx(auVar331,auVar30,auVar24);
          auVar31 = vblendvps_avx(auVar231,auVar33,auVar24);
          auVar32 = vblendvps_avx(auVar299,auVar143,auVar24);
          local_700 = vandps_avx(local_3c0,_local_420);
          auVar30 = vsubps_avx(auVar30,auVar149);
          auVar144 = vsubps_avx(auVar31,auVar25);
          auVar32 = vsubps_avx(auVar32,auVar26);
          auVar168 = vsubps_avx(auVar25,auVar28);
          fVar202 = auVar144._0_4_;
          fVar266 = auVar26._0_4_;
          fVar238 = auVar144._4_4_;
          fVar278 = auVar26._4_4_;
          auVar95._4_4_ = fVar278 * fVar238;
          auVar95._0_4_ = fVar266 * fVar202;
          fVar254 = auVar144._8_4_;
          fVar187 = auVar26._8_4_;
          auVar95._8_4_ = fVar187 * fVar254;
          fVar287 = auVar144._12_4_;
          fVar199 = auVar26._12_4_;
          auVar95._12_4_ = fVar199 * fVar287;
          fVar292 = auVar144._16_4_;
          fVar200 = auVar26._16_4_;
          auVar95._16_4_ = fVar200 * fVar292;
          fVar158 = auVar144._20_4_;
          fVar201 = auVar26._20_4_;
          auVar95._20_4_ = fVar201 * fVar158;
          fVar182 = auVar144._24_4_;
          fVar163 = auVar26._24_4_;
          auVar95._24_4_ = fVar163 * fVar182;
          auVar95._28_4_ = auVar31._28_4_;
          fVar214 = auVar25._0_4_;
          fVar177 = auVar32._0_4_;
          fVar241 = auVar25._4_4_;
          fVar179 = auVar32._4_4_;
          auVar96._4_4_ = fVar179 * fVar241;
          auVar96._0_4_ = fVar177 * fVar214;
          fVar255 = auVar25._8_4_;
          fVar181 = auVar32._8_4_;
          auVar96._8_4_ = fVar181 * fVar255;
          fVar289 = auVar25._12_4_;
          fVar225 = auVar32._12_4_;
          auVar96._12_4_ = fVar225 * fVar289;
          fVar310 = auVar25._16_4_;
          fVar233 = auVar32._16_4_;
          auVar96._16_4_ = fVar233 * fVar310;
          fVar159 = auVar25._20_4_;
          fVar236 = auVar32._20_4_;
          auVar96._20_4_ = fVar236 * fVar159;
          fVar183 = auVar25._24_4_;
          fVar239 = auVar32._24_4_;
          uVar9 = auVar33._28_4_;
          auVar96._24_4_ = fVar239 * fVar183;
          auVar96._28_4_ = uVar9;
          auVar31 = vsubps_avx(auVar96,auVar95);
          fVar218 = auVar149._0_4_;
          fVar242 = auVar149._4_4_;
          auVar97._4_4_ = fVar179 * fVar242;
          auVar97._0_4_ = fVar177 * fVar218;
          fVar256 = auVar149._8_4_;
          auVar97._8_4_ = fVar181 * fVar256;
          fVar219 = auVar149._12_4_;
          auVar97._12_4_ = fVar225 * fVar219;
          fVar312 = auVar149._16_4_;
          auVar97._16_4_ = fVar233 * fVar312;
          fVar160 = auVar149._20_4_;
          auVar97._20_4_ = fVar236 * fVar160;
          fVar185 = auVar149._24_4_;
          auVar97._24_4_ = fVar239 * fVar185;
          auVar97._28_4_ = uVar9;
          fVar220 = auVar30._0_4_;
          fVar243 = auVar30._4_4_;
          auVar98._4_4_ = fVar278 * fVar243;
          auVar98._0_4_ = fVar266 * fVar220;
          fVar257 = auVar30._8_4_;
          auVar98._8_4_ = fVar187 * fVar257;
          fVar290 = auVar30._12_4_;
          auVar98._12_4_ = fVar199 * fVar290;
          fVar162 = auVar30._16_4_;
          auVar98._16_4_ = fVar200 * fVar162;
          fVar161 = auVar30._20_4_;
          auVar98._20_4_ = fVar201 * fVar161;
          fVar186 = auVar30._24_4_;
          auVar98._24_4_ = fVar163 * fVar186;
          auVar98._28_4_ = auVar331._28_4_;
          auVar33 = vsubps_avx(auVar98,auVar97);
          auVar99._4_4_ = fVar241 * fVar243;
          auVar99._0_4_ = fVar214 * fVar220;
          auVar99._8_4_ = fVar255 * fVar257;
          auVar99._12_4_ = fVar289 * fVar290;
          auVar99._16_4_ = fVar310 * fVar162;
          auVar99._20_4_ = fVar159 * fVar161;
          auVar99._24_4_ = fVar183 * fVar186;
          auVar99._28_4_ = uVar9;
          auVar100._4_4_ = fVar242 * fVar238;
          auVar100._0_4_ = fVar218 * fVar202;
          auVar100._8_4_ = fVar256 * fVar254;
          auVar100._12_4_ = fVar219 * fVar287;
          auVar100._16_4_ = fVar312 * fVar292;
          auVar100._20_4_ = fVar160 * fVar158;
          auVar100._24_4_ = fVar185 * fVar182;
          auVar100._28_4_ = auVar143._28_4_;
          auVar143 = vsubps_avx(auVar100,auVar99);
          auVar26 = vsubps_avx(auVar26,auVar29);
          fVar232 = auVar143._28_4_ + auVar33._28_4_;
          auVar308._0_4_ = auVar143._0_4_ + auVar33._0_4_ * 0.0 + auVar31._0_4_ * 0.0;
          auVar308._4_4_ = auVar143._4_4_ + auVar33._4_4_ * 0.0 + auVar31._4_4_ * 0.0;
          auVar308._8_4_ = auVar143._8_4_ + auVar33._8_4_ * 0.0 + auVar31._8_4_ * 0.0;
          auVar308._12_4_ = auVar143._12_4_ + auVar33._12_4_ * 0.0 + auVar31._12_4_ * 0.0;
          auVar308._16_4_ = auVar143._16_4_ + auVar33._16_4_ * 0.0 + auVar31._16_4_ * 0.0;
          auVar308._20_4_ = auVar143._20_4_ + auVar33._20_4_ * 0.0 + auVar31._20_4_ * 0.0;
          auVar308._24_4_ = auVar143._24_4_ + auVar33._24_4_ * 0.0 + auVar31._24_4_ * 0.0;
          auVar308._28_4_ = fVar232 + auVar31._28_4_;
          fVar224 = auVar168._0_4_;
          fVar244 = auVar168._4_4_;
          auVar101._4_4_ = auVar29._4_4_ * fVar244;
          auVar101._0_4_ = auVar29._0_4_ * fVar224;
          fVar286 = auVar168._8_4_;
          auVar101._8_4_ = auVar29._8_4_ * fVar286;
          fVar291 = auVar168._12_4_;
          auVar101._12_4_ = auVar29._12_4_ * fVar291;
          fVar314 = auVar168._16_4_;
          auVar101._16_4_ = auVar29._16_4_ * fVar314;
          fVar164 = auVar168._20_4_;
          auVar101._20_4_ = auVar29._20_4_ * fVar164;
          fVar265 = auVar168._24_4_;
          auVar101._24_4_ = auVar29._24_4_ * fVar265;
          auVar101._28_4_ = fVar232;
          fVar232 = auVar26._0_4_;
          fVar252 = auVar26._4_4_;
          auVar102._4_4_ = auVar28._4_4_ * fVar252;
          auVar102._0_4_ = auVar28._0_4_ * fVar232;
          fVar217 = auVar26._8_4_;
          auVar102._8_4_ = auVar28._8_4_ * fVar217;
          fVar293 = auVar26._12_4_;
          auVar102._12_4_ = auVar28._12_4_ * fVar293;
          fVar140 = auVar26._16_4_;
          auVar102._16_4_ = auVar28._16_4_ * fVar140;
          fVar178 = auVar26._20_4_;
          auVar102._20_4_ = auVar28._20_4_ * fVar178;
          fVar223 = auVar26._24_4_;
          auVar102._24_4_ = auVar28._24_4_ * fVar223;
          auVar102._28_4_ = auVar143._28_4_;
          auVar33 = vsubps_avx(auVar102,auVar101);
          auVar149 = vsubps_avx(auVar149,auVar27);
          fVar235 = auVar149._0_4_;
          fVar253 = auVar149._4_4_;
          auVar103._4_4_ = auVar29._4_4_ * fVar253;
          auVar103._0_4_ = auVar29._0_4_ * fVar235;
          fVar288 = auVar149._8_4_;
          auVar103._8_4_ = auVar29._8_4_ * fVar288;
          fVar221 = auVar149._12_4_;
          auVar103._12_4_ = auVar29._12_4_ * fVar221;
          fVar157 = auVar149._16_4_;
          auVar103._16_4_ = auVar29._16_4_ * fVar157;
          fVar180 = auVar149._20_4_;
          auVar103._20_4_ = auVar29._20_4_ * fVar180;
          fVar285 = auVar149._24_4_;
          auVar103._24_4_ = auVar29._24_4_ * fVar285;
          auVar103._28_4_ = auVar29._28_4_;
          auVar104._4_4_ = fVar252 * auVar27._4_4_;
          auVar104._0_4_ = fVar232 * auVar27._0_4_;
          auVar104._8_4_ = fVar217 * auVar27._8_4_;
          auVar104._12_4_ = fVar293 * auVar27._12_4_;
          auVar104._16_4_ = fVar140 * auVar27._16_4_;
          auVar104._20_4_ = fVar178 * auVar27._20_4_;
          auVar104._24_4_ = fVar223 * auVar27._24_4_;
          auVar104._28_4_ = auVar31._28_4_;
          auVar149 = vsubps_avx(auVar103,auVar104);
          auVar105._4_4_ = auVar28._4_4_ * fVar253;
          auVar105._0_4_ = auVar28._0_4_ * fVar235;
          auVar105._8_4_ = auVar28._8_4_ * fVar288;
          auVar105._12_4_ = auVar28._12_4_ * fVar221;
          auVar105._16_4_ = auVar28._16_4_ * fVar157;
          auVar105._20_4_ = auVar28._20_4_ * fVar180;
          auVar105._24_4_ = auVar28._24_4_ * fVar285;
          auVar105._28_4_ = auVar28._28_4_;
          auVar106._4_4_ = fVar244 * auVar27._4_4_;
          auVar106._0_4_ = fVar224 * auVar27._0_4_;
          auVar106._8_4_ = fVar286 * auVar27._8_4_;
          auVar106._12_4_ = fVar291 * auVar27._12_4_;
          auVar106._16_4_ = fVar314 * auVar27._16_4_;
          auVar106._20_4_ = fVar164 * auVar27._20_4_;
          auVar106._24_4_ = fVar265 * auVar27._24_4_;
          auVar106._28_4_ = auVar27._28_4_;
          auVar27 = vsubps_avx(auVar106,auVar105);
          auVar153._0_4_ = auVar33._0_4_ * 0.0 + auVar27._0_4_ + auVar149._0_4_ * 0.0;
          auVar153._4_4_ = auVar33._4_4_ * 0.0 + auVar27._4_4_ + auVar149._4_4_ * 0.0;
          auVar153._8_4_ = auVar33._8_4_ * 0.0 + auVar27._8_4_ + auVar149._8_4_ * 0.0;
          auVar153._12_4_ = auVar33._12_4_ * 0.0 + auVar27._12_4_ + auVar149._12_4_ * 0.0;
          auVar153._16_4_ = auVar33._16_4_ * 0.0 + auVar27._16_4_ + auVar149._16_4_ * 0.0;
          auVar153._20_4_ = auVar33._20_4_ * 0.0 + auVar27._20_4_ + auVar149._20_4_ * 0.0;
          auVar153._24_4_ = auVar33._24_4_ * 0.0 + auVar27._24_4_ + auVar149._24_4_ * 0.0;
          auVar153._28_4_ = auVar149._28_4_ + auVar27._28_4_ + auVar149._28_4_;
          auVar156 = ZEXT3264(auVar153);
          auVar149 = vmaxps_avx(auVar308,auVar153);
          auVar149 = vcmpps_avx(auVar149,ZEXT432(0) << 0x20,2);
          auVar27 = local_700 & auVar149;
          if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0x7f,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar27 >> 0xbf,0) == '\0') &&
              (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar27[0x1f]) {
LAB_00ff4b4a:
            auVar213 = ZEXT3264(CONCAT824(local_4e0[1]._24_8_,
                                          CONCAT816(local_4e0[1]._16_8_,
                                                    CONCAT88(local_4e0[1]._8_8_,local_4e0[1]._0_8_))
                                         ));
          }
          else {
            auVar27 = vandps_avx(auVar149,local_700);
            auVar107._4_4_ = fVar252 * fVar238;
            auVar107._0_4_ = fVar232 * fVar202;
            auVar107._8_4_ = fVar217 * fVar254;
            auVar107._12_4_ = fVar293 * fVar287;
            auVar107._16_4_ = fVar140 * fVar292;
            auVar107._20_4_ = fVar178 * fVar158;
            auVar107._24_4_ = fVar223 * fVar182;
            auVar107._28_4_ = local_700._28_4_;
            auVar108._4_4_ = fVar244 * fVar179;
            auVar108._0_4_ = fVar224 * fVar177;
            auVar108._8_4_ = fVar286 * fVar181;
            auVar108._12_4_ = fVar291 * fVar225;
            auVar108._16_4_ = fVar314 * fVar233;
            auVar108._20_4_ = fVar164 * fVar236;
            auVar108._24_4_ = fVar265 * fVar239;
            auVar108._28_4_ = auVar149._28_4_;
            auVar28 = vsubps_avx(auVar108,auVar107);
            auVar109._4_4_ = fVar253 * fVar179;
            auVar109._0_4_ = fVar235 * fVar177;
            auVar109._8_4_ = fVar288 * fVar181;
            auVar109._12_4_ = fVar221 * fVar225;
            auVar109._16_4_ = fVar157 * fVar233;
            auVar109._20_4_ = fVar180 * fVar236;
            auVar109._24_4_ = fVar285 * fVar239;
            auVar109._28_4_ = auVar32._28_4_;
            auVar110._4_4_ = fVar252 * fVar243;
            auVar110._0_4_ = fVar232 * fVar220;
            auVar110._8_4_ = fVar217 * fVar257;
            auVar110._12_4_ = fVar293 * fVar290;
            auVar110._16_4_ = fVar140 * fVar162;
            auVar110._20_4_ = fVar178 * fVar161;
            auVar110._24_4_ = fVar223 * fVar186;
            auVar110._28_4_ = auVar26._28_4_;
            auVar29 = vsubps_avx(auVar110,auVar109);
            auVar111._4_4_ = fVar244 * fVar243;
            auVar111._0_4_ = fVar224 * fVar220;
            auVar111._8_4_ = fVar286 * fVar257;
            auVar111._12_4_ = fVar291 * fVar290;
            auVar111._16_4_ = fVar314 * fVar162;
            auVar111._20_4_ = fVar164 * fVar161;
            auVar111._24_4_ = fVar265 * fVar186;
            auVar111._28_4_ = auVar30._28_4_;
            auVar112._4_4_ = fVar253 * fVar238;
            auVar112._0_4_ = fVar235 * fVar202;
            auVar112._8_4_ = fVar288 * fVar254;
            auVar112._12_4_ = fVar221 * fVar287;
            auVar112._16_4_ = fVar157 * fVar292;
            auVar112._20_4_ = fVar180 * fVar158;
            auVar112._24_4_ = fVar285 * fVar182;
            auVar112._28_4_ = auVar144._28_4_;
            auVar31 = vsubps_avx(auVar112,auVar111);
            auVar283._0_4_ = auVar28._0_4_ * 0.0 + auVar31._0_4_ + auVar29._0_4_ * 0.0;
            auVar283._4_4_ = auVar28._4_4_ * 0.0 + auVar31._4_4_ + auVar29._4_4_ * 0.0;
            auVar283._8_4_ = auVar28._8_4_ * 0.0 + auVar31._8_4_ + auVar29._8_4_ * 0.0;
            auVar283._12_4_ = auVar28._12_4_ * 0.0 + auVar31._12_4_ + auVar29._12_4_ * 0.0;
            auVar283._16_4_ = auVar28._16_4_ * 0.0 + auVar31._16_4_ + auVar29._16_4_ * 0.0;
            auVar283._20_4_ = auVar28._20_4_ * 0.0 + auVar31._20_4_ + auVar29._20_4_ * 0.0;
            auVar283._24_4_ = auVar28._24_4_ * 0.0 + auVar31._24_4_ + auVar29._24_4_ * 0.0;
            auVar283._28_4_ = auVar168._28_4_ + auVar31._28_4_ + auVar30._28_4_;
            auVar149 = vrcpps_avx(auVar283);
            fVar220 = auVar149._0_4_;
            fVar224 = auVar149._4_4_;
            auVar113._4_4_ = auVar283._4_4_ * fVar224;
            auVar113._0_4_ = auVar283._0_4_ * fVar220;
            fVar232 = auVar149._8_4_;
            auVar113._8_4_ = auVar283._8_4_ * fVar232;
            fVar235 = auVar149._12_4_;
            auVar113._12_4_ = auVar283._12_4_ * fVar235;
            fVar238 = auVar149._16_4_;
            auVar113._16_4_ = auVar283._16_4_ * fVar238;
            fVar243 = auVar149._20_4_;
            auVar113._20_4_ = auVar283._20_4_ * fVar243;
            fVar244 = auVar149._24_4_;
            auVar113._24_4_ = auVar283._24_4_ * fVar244;
            auVar113._28_4_ = auVar26._28_4_;
            auVar327._8_4_ = 0x3f800000;
            auVar327._0_8_ = 0x3f8000003f800000;
            auVar327._12_4_ = 0x3f800000;
            auVar327._16_4_ = 0x3f800000;
            auVar327._20_4_ = 0x3f800000;
            auVar327._24_4_ = 0x3f800000;
            auVar327._28_4_ = 0x3f800000;
            auVar149 = vsubps_avx(auVar327,auVar113);
            fVar220 = auVar149._0_4_ * fVar220 + fVar220;
            fVar224 = auVar149._4_4_ * fVar224 + fVar224;
            fVar232 = auVar149._8_4_ * fVar232 + fVar232;
            fVar235 = auVar149._12_4_ * fVar235 + fVar235;
            fVar238 = auVar149._16_4_ * fVar238 + fVar238;
            fVar243 = auVar149._20_4_ * fVar243 + fVar243;
            fVar244 = auVar149._24_4_ * fVar244 + fVar244;
            auVar114._4_4_ =
                 (fVar242 * auVar28._4_4_ + auVar29._4_4_ * fVar241 + fVar278 * auVar31._4_4_) *
                 fVar224;
            auVar114._0_4_ =
                 (fVar218 * auVar28._0_4_ + auVar29._0_4_ * fVar214 + fVar266 * auVar31._0_4_) *
                 fVar220;
            auVar114._8_4_ =
                 (fVar256 * auVar28._8_4_ + auVar29._8_4_ * fVar255 + fVar187 * auVar31._8_4_) *
                 fVar232;
            auVar114._12_4_ =
                 (fVar219 * auVar28._12_4_ + auVar29._12_4_ * fVar289 + fVar199 * auVar31._12_4_) *
                 fVar235;
            auVar114._16_4_ =
                 (fVar312 * auVar28._16_4_ + auVar29._16_4_ * fVar310 + fVar200 * auVar31._16_4_) *
                 fVar238;
            auVar114._20_4_ =
                 (fVar160 * auVar28._20_4_ + auVar29._20_4_ * fVar159 + fVar201 * auVar31._20_4_) *
                 fVar243;
            auVar114._24_4_ =
                 (fVar185 * auVar28._24_4_ + auVar29._24_4_ * fVar183 + fVar163 * auVar31._24_4_) *
                 fVar244;
            auVar114._28_4_ = auVar25._28_4_ + auVar31._28_4_;
            fVar202 = (ray->super_RayK<1>).tfar;
            auVar212._4_4_ = fVar202;
            auVar212._0_4_ = fVar202;
            auVar212._8_4_ = fVar202;
            auVar212._12_4_ = fVar202;
            auVar212._16_4_ = fVar202;
            auVar212._20_4_ = fVar202;
            auVar212._24_4_ = fVar202;
            auVar212._28_4_ = fVar202;
            auVar25 = vcmpps_avx(local_460,auVar114,2);
            auVar149 = vcmpps_avx(auVar114,auVar212,2);
            auVar149 = vandps_avx(auVar25,auVar149);
            auVar26 = auVar27 & auVar149;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar26 >> 0x7f,0) == '\0') &&
                  (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0xbf,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar26[0x1f]) goto LAB_00ff4b4a;
            auVar149 = vandps_avx(auVar27,auVar149);
            auVar26 = vcmpps_avx(auVar283,ZEXT432(0) << 0x20,4);
            auVar27 = auVar149 & auVar26;
            auVar213 = ZEXT3264(CONCAT824(local_4e0[1]._24_8_,
                                          CONCAT816(local_4e0[1]._16_8_,
                                                    CONCAT88(local_4e0[1]._8_8_,local_4e0[1]._0_8_))
                                         ));
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0x7f,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0xbf,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar27[0x1f] < '\0') {
              auVar149 = vandps_avx(auVar26,auVar149);
              auVar213 = ZEXT3264(auVar149);
              auVar115._4_4_ = auVar308._4_4_ * fVar224;
              auVar115._0_4_ = auVar308._0_4_ * fVar220;
              auVar115._8_4_ = auVar308._8_4_ * fVar232;
              auVar115._12_4_ = auVar308._12_4_ * fVar235;
              auVar115._16_4_ = auVar308._16_4_ * fVar238;
              auVar115._20_4_ = auVar308._20_4_ * fVar243;
              auVar115._24_4_ = auVar308._24_4_ * fVar244;
              auVar115._28_4_ = auVar25._28_4_;
              auVar116._4_4_ = auVar153._4_4_ * fVar224;
              auVar116._0_4_ = auVar153._0_4_ * fVar220;
              auVar116._8_4_ = auVar153._8_4_ * fVar232;
              auVar116._12_4_ = auVar153._12_4_ * fVar235;
              auVar116._16_4_ = auVar153._16_4_ * fVar238;
              auVar116._20_4_ = auVar153._20_4_ * fVar243;
              auVar116._24_4_ = auVar153._24_4_ * fVar244;
              auVar116._28_4_ = auVar153._28_4_;
              auVar264._8_4_ = 0x3f800000;
              auVar264._0_8_ = 0x3f8000003f800000;
              auVar264._12_4_ = 0x3f800000;
              auVar264._16_4_ = 0x3f800000;
              auVar264._20_4_ = 0x3f800000;
              auVar264._24_4_ = 0x3f800000;
              auVar264._28_4_ = 0x3f800000;
              auVar149 = vsubps_avx(auVar264,auVar115);
              _local_c0 = vblendvps_avx(auVar149,auVar115,auVar24);
              auVar149 = vsubps_avx(auVar264,auVar116);
              _local_320 = vblendvps_avx(auVar149,auVar116,auVar24);
              auVar156 = ZEXT3264(_local_320);
              local_300 = auVar114;
            }
          }
          auVar300 = ZEXT3264(local_680);
          auVar284 = ZEXT3264(local_6e0);
          auVar149 = auVar213._0_32_;
          auVar338 = ZEXT3264(_local_5e0);
          fVar187 = (float)local_660._0_4_;
          fVar199 = (float)local_660._4_4_;
          fVar200 = fStack_658;
          fVar201 = fStack_654;
          fVar224 = fStack_650;
          fVar238 = fStack_64c;
          fVar241 = fStack_648;
          fVar244 = fStack_644;
          if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar149 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar149 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar149 >> 0x7f,0) != '\0') ||
                (auVar213 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
               SUB321(auVar149 >> 0xbf,0) != '\0') ||
              (auVar213 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
              auVar213[0x1f] < '\0') {
            auVar25 = vsubps_avx(auVar318,_local_7a0);
            fVar214 = (float)local_7a0._0_4_ + auVar25._0_4_ * (float)local_c0._0_4_;
            fVar218 = (float)local_7a0._4_4_ + auVar25._4_4_ * (float)local_c0._4_4_;
            fVar220 = fStack_798 + auVar25._8_4_ * fStack_b8;
            fVar232 = fStack_794 + auVar25._12_4_ * fStack_b4;
            fVar235 = fStack_790 + auVar25._16_4_ * fStack_b0;
            fVar242 = fStack_78c + auVar25._20_4_ * fStack_ac;
            fVar243 = fStack_788 + auVar25._24_4_ * fStack_a8;
            fVar252 = fStack_784 + auVar25._28_4_;
            fVar202 = pre->depth_scale;
            auVar117._4_4_ = (fVar218 + fVar218) * fVar202;
            auVar117._0_4_ = (fVar214 + fVar214) * fVar202;
            auVar117._8_4_ = (fVar220 + fVar220) * fVar202;
            auVar117._12_4_ = (fVar232 + fVar232) * fVar202;
            auVar117._16_4_ = (fVar235 + fVar235) * fVar202;
            auVar117._20_4_ = (fVar242 + fVar242) * fVar202;
            auVar117._24_4_ = (fVar243 + fVar243) * fVar202;
            auVar117._28_4_ = fVar252 + fVar252;
            auVar25 = vcmpps_avx(local_300,auVar117,6);
            auVar156 = ZEXT3264(auVar25);
            auVar26 = auVar149 & auVar25;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              local_320._0_4_ = (float)local_320._0_4_ + (float)local_320._0_4_ + -1.0;
              local_320._4_4_ = (float)local_320._4_4_ + (float)local_320._4_4_ + -1.0;
              uStack_318._0_4_ = (float)uStack_318 + (float)uStack_318 + -1.0;
              uStack_318._4_4_ = uStack_318._4_4_ + uStack_318._4_4_ + -1.0;
              uStack_310._0_4_ = (float)uStack_310 + (float)uStack_310 + -1.0;
              uStack_310._4_4_ = uStack_310._4_4_ + uStack_310._4_4_ + -1.0;
              uStack_308._0_4_ = (float)uStack_308 + (float)uStack_308 + -1.0;
              uStack_308._4_4_ = uStack_308._4_4_ + uStack_308._4_4_ + -1.0;
              local_280 = _local_c0;
              auVar130 = _local_320;
              auVar26 = _local_320;
              local_260 = (float)local_320._0_4_;
              fStack_25c = (float)local_320._4_4_;
              fStack_258 = (float)uStack_318;
              fStack_254 = uStack_318._4_4_;
              fStack_250 = (float)uStack_310;
              fStack_24c = uStack_310._4_4_;
              fStack_248 = (float)uStack_308;
              fStack_244 = uStack_308._4_4_;
              local_240 = local_300;
              local_21c = uVar22;
              local_210 = CONCAT44(fStack_7ac,local_7b0);
              uStack_208 = CONCAT44(fStack_7a4,fStack_7a8);
              local_200 = local_770;
              uStack_1f8 = uStack_768;
              local_1f0 = local_6b0;
              uStack_1e8 = uStack_6a8;
              local_1e0 = local_6c0;
              uStack_1d8 = uStack_6b8;
              pGVar137 = (context->scene->geometries).items[local_7b8].ptr;
              _local_320 = auVar26;
              if ((pGVar137->mask & (ray->super_RayK<1>).mask) != 0) {
                auVar149 = vandps_avx(auVar25,auVar149);
                local_4e0[0] = auVar149;
                auVar248 = vshufps_avx(ZEXT416((uint)(float)(int)local_220),
                                       ZEXT416((uint)(float)(int)local_220),0);
                local_1a0[0] = (auVar248._0_4_ + (float)local_c0._0_4_ + 0.0) *
                               (float)local_3a0._0_4_;
                local_1a0[1] = (auVar248._4_4_ + (float)local_c0._4_4_ + 1.0) *
                               (float)local_3a0._4_4_;
                local_1a0[2] = (auVar248._8_4_ + fStack_b8 + 2.0) * fStack_398;
                local_1a0[3] = (auVar248._12_4_ + fStack_b4 + 3.0) * fStack_394;
                fStack_190 = (auVar248._0_4_ + fStack_b0 + 4.0) * fStack_390;
                fStack_18c = (auVar248._4_4_ + fStack_ac + 5.0) * fStack_38c;
                fStack_188 = (auVar248._8_4_ + fStack_a8 + 6.0) * fStack_388;
                fStack_184 = auVar248._12_4_ + fStack_a4 + 7.0;
                uStack_310 = auVar130._16_8_;
                uStack_308 = auVar26._24_8_;
                local_180 = local_320;
                uStack_178 = uStack_318;
                uStack_170 = uStack_310;
                uStack_168 = uStack_308;
                local_160 = local_300;
                auVar174._8_4_ = 0x7f800000;
                auVar174._0_8_ = 0x7f8000007f800000;
                auVar174._12_4_ = 0x7f800000;
                auVar174._16_4_ = 0x7f800000;
                auVar174._20_4_ = 0x7f800000;
                auVar174._24_4_ = 0x7f800000;
                auVar174._28_4_ = 0x7f800000;
                auVar25 = vblendvps_avx(auVar174,local_300,auVar149);
                auVar26 = vshufps_avx(auVar25,auVar25,0xb1);
                auVar26 = vminps_avx(auVar25,auVar26);
                auVar27 = vshufpd_avx(auVar26,auVar26,5);
                auVar26 = vminps_avx(auVar26,auVar27);
                auVar27 = vperm2f128_avx(auVar26,auVar26,1);
                auVar26 = vminps_avx(auVar26,auVar27);
                auVar25 = vcmpps_avx(auVar25,auVar26,0);
                auVar26 = auVar149 & auVar25;
                if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar26 >> 0x7f,0) != '\0') ||
                      (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0xbf,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar26[0x1f] < '\0') {
                  auVar149 = vandps_avx(auVar25,auVar149);
                }
                uVar132 = vmovmskps_avx(auVar149);
                uVar21 = 0;
                if (uVar132 != 0) {
                  for (; (uVar132 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                uVar134 = (ulong)uVar21;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar137->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_700 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  local_720._0_8_ = pGVar137;
                  local_5e8 = context;
                  do {
                    local_614 = local_1a0[uVar134];
                    local_610 = *(undefined4 *)((long)&local_180 + uVar134 * 4);
                    local_7a0 = (undefined1  [8])uVar134;
                    (ray->super_RayK<1>).tfar = *(float *)(local_160 + uVar134 * 4);
                    local_750.context = context->user;
                    fVar214 = 1.0 - local_614;
                    fVar202 = local_614 * fVar214 + local_614 * fVar214;
                    auVar248 = ZEXT416((uint)(local_614 * local_614 * 3.0));
                    auVar248 = vshufps_avx(auVar248,auVar248,0);
                    auVar191 = ZEXT416((uint)((fVar202 - local_614 * local_614) * 3.0));
                    auVar191 = vshufps_avx(auVar191,auVar191,0);
                    auVar184 = ZEXT416((uint)((fVar214 * fVar214 - fVar202) * 3.0));
                    auVar184 = vshufps_avx(auVar184,auVar184,0);
                    auVar205 = ZEXT416((uint)(fVar214 * fVar214 * -3.0));
                    auVar205 = vshufps_avx(auVar205,auVar205,0);
                    auVar193._0_4_ =
                         auVar205._0_4_ * local_7b0 +
                         auVar184._0_4_ * (float)local_770._0_4_ +
                         auVar248._0_4_ * (float)local_6c0._0_4_ +
                         auVar191._0_4_ * (float)local_6b0._0_4_;
                    auVar193._4_4_ =
                         auVar205._4_4_ * fStack_7ac +
                         auVar184._4_4_ * (float)local_770._4_4_ +
                         auVar248._4_4_ * (float)local_6c0._4_4_ +
                         auVar191._4_4_ * (float)local_6b0._4_4_;
                    auVar193._8_4_ =
                         auVar205._8_4_ * fStack_7a8 +
                         auVar184._8_4_ * (float)uStack_768 +
                         auVar248._8_4_ * (float)uStack_6b8 + auVar191._8_4_ * (float)uStack_6a8;
                    auVar193._12_4_ =
                         auVar205._12_4_ * fStack_7a4 +
                         auVar184._12_4_ * uStack_768._4_4_ +
                         auVar248._12_4_ * uStack_6b8._4_4_ + auVar191._12_4_ * uStack_6a8._4_4_;
                    local_620 = vmovlps_avx(auVar193);
                    local_618 = vextractps_avx(auVar193,2);
                    local_60c = uVar133;
                    local_608 = (int)local_7b8;
                    local_604 = (local_750.context)->instID[0];
                    local_600 = (local_750.context)->instPrimID[0];
                    local_7bc = -1;
                    local_750.valid = &local_7bc;
                    local_750.geometryUserPtr = pGVar137->userPtr;
                    local_750.ray = (RTCRayN *)ray;
                    local_750.hit = (RTCHitN *)&local_620;
                    local_750.N = 1;
                    if (pGVar137->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00ff4d25:
                      p_Var23 = context->args->filter;
                      if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar137->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var23)(&local_750);
                        context = local_5e8;
                        pGVar137 = (Geometry *)local_720._0_8_;
                        if (*local_750.valid == 0) goto LAB_00ff4dc9;
                      }
                      (((Vec3f *)((long)local_750.ray + 0x30))->field_0).components[0] =
                           *(float *)local_750.hit;
                      (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_750.hit + 4);
                      (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_750.hit + 8);
                      *(float *)((long)local_750.ray + 0x3c) = *(float *)(local_750.hit + 0xc);
                      *(float *)((long)local_750.ray + 0x40) = *(float *)(local_750.hit + 0x10);
                      *(float *)((long)local_750.ray + 0x44) = *(float *)(local_750.hit + 0x14);
                      *(float *)((long)local_750.ray + 0x48) = *(float *)(local_750.hit + 0x18);
                      *(float *)((long)local_750.ray + 0x4c) = *(float *)(local_750.hit + 0x1c);
                      *(float *)((long)local_750.ray + 0x50) = *(float *)(local_750.hit + 0x20);
                    }
                    else {
                      (*pGVar137->intersectionFilterN)(&local_750);
                      context = local_5e8;
                      pGVar137 = (Geometry *)local_720._0_8_;
                      if (*local_750.valid != 0) goto LAB_00ff4d25;
LAB_00ff4dc9:
                      (ray->super_RayK<1>).tfar = (float)local_700._0_4_;
                      context = local_5e8;
                      pGVar137 = (Geometry *)local_720._0_8_;
                    }
                    *(undefined4 *)(local_4e0[0] + (long)local_7a0 * 4) = 0;
                    auVar26 = local_4e0[0];
                    fVar202 = (ray->super_RayK<1>).tfar;
                    auVar154._4_4_ = fVar202;
                    auVar154._0_4_ = fVar202;
                    auVar154._8_4_ = fVar202;
                    auVar154._12_4_ = fVar202;
                    auVar154._16_4_ = fVar202;
                    auVar154._20_4_ = fVar202;
                    auVar154._24_4_ = fVar202;
                    auVar154._28_4_ = fVar202;
                    auVar213 = ZEXT3264(local_300);
                    auVar25 = vcmpps_avx(local_300,auVar154,2);
                    auVar149 = vandps_avx(auVar25,local_4e0[0]);
                    auVar156 = ZEXT3264(auVar149);
                    local_4e0[0] = auVar149;
                    auVar26 = auVar26 & auVar25;
                    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar26 >> 0x7f,0) == '\0') &&
                          (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar26 >> 0xbf,0) == '\0') &&
                        (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar26[0x1f]) goto LAB_00ff4e6f;
                    auVar175._8_4_ = 0x7f800000;
                    auVar175._0_8_ = 0x7f8000007f800000;
                    auVar175._12_4_ = 0x7f800000;
                    auVar175._16_4_ = 0x7f800000;
                    auVar175._20_4_ = 0x7f800000;
                    auVar175._24_4_ = 0x7f800000;
                    auVar175._28_4_ = 0x7f800000;
                    auVar25 = vblendvps_avx(auVar175,local_300,auVar149);
                    auVar26 = vshufps_avx(auVar25,auVar25,0xb1);
                    auVar26 = vminps_avx(auVar25,auVar26);
                    auVar27 = vshufpd_avx(auVar26,auVar26,5);
                    auVar26 = vminps_avx(auVar26,auVar27);
                    auVar27 = vperm2f128_avx(auVar26,auVar26,1);
                    auVar26 = vminps_avx(auVar26,auVar27);
                    auVar25 = vcmpps_avx(auVar25,auVar26,0);
                    auVar26 = auVar149 & auVar25;
                    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar26 >> 0x7f,0) != '\0') ||
                          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar26 >> 0xbf,0) != '\0') ||
                        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar26[0x1f] < '\0') {
                      auVar149 = vandps_avx(auVar25,auVar149);
                    }
                    local_700 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                    uVar132 = vmovmskps_avx(auVar149);
                    uVar21 = 0;
                    if (uVar132 != 0) {
                      for (; (uVar132 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    uVar134 = (ulong)uVar21;
                  } while( true );
                }
                fVar202 = local_1a0[uVar134];
                auVar156 = ZEXT464((uint)fVar202);
                fVar214 = *(float *)((long)&local_180 + uVar134 * 4);
                fVar220 = 1.0 - fVar202;
                fVar218 = fVar202 * fVar220 + fVar202 * fVar220;
                auVar248 = ZEXT416((uint)(fVar202 * fVar202 * 3.0));
                auVar248 = vshufps_avx(auVar248,auVar248,0);
                auVar191 = ZEXT416((uint)((fVar218 - fVar202 * fVar202) * 3.0));
                auVar191 = vshufps_avx(auVar191,auVar191,0);
                auVar184 = ZEXT416((uint)((fVar220 * fVar220 - fVar218) * 3.0));
                auVar184 = vshufps_avx(auVar184,auVar184,0);
                auVar205 = ZEXT416((uint)(fVar220 * fVar220 * -3.0));
                auVar205 = vshufps_avx(auVar205,auVar205,0);
                auVar192._0_4_ =
                     auVar205._0_4_ * local_7b0 +
                     auVar184._0_4_ * (float)local_770._0_4_ +
                     auVar248._0_4_ * (float)local_6c0._0_4_ +
                     auVar191._0_4_ * (float)local_6b0._0_4_;
                auVar192._4_4_ =
                     auVar205._4_4_ * fStack_7ac +
                     auVar184._4_4_ * (float)local_770._4_4_ +
                     auVar248._4_4_ * (float)local_6c0._4_4_ +
                     auVar191._4_4_ * (float)local_6b0._4_4_;
                auVar192._8_4_ =
                     auVar205._8_4_ * fStack_7a8 +
                     auVar184._8_4_ * (float)uStack_768 +
                     auVar248._8_4_ * (float)uStack_6b8 + auVar191._8_4_ * (float)uStack_6a8;
                auVar192._12_4_ =
                     auVar205._12_4_ * fStack_7a4 +
                     auVar184._12_4_ * uStack_768._4_4_ +
                     auVar248._12_4_ * uStack_6b8._4_4_ + auVar191._12_4_ * uStack_6a8._4_4_;
                auVar213 = ZEXT464((uint)*(float *)(local_160 + uVar134 * 4));
                (ray->super_RayK<1>).tfar = *(float *)(local_160 + uVar134 * 4);
                uVar10 = vmovlps_avx(auVar192);
                *(undefined8 *)&(ray->Ng).field_0 = uVar10;
                fVar218 = (float)vextractps_avx(auVar192,2);
                (ray->Ng).field_0.field_0.z = fVar218;
                ray->u = fVar202;
                ray->v = fVar214;
                ray->primID = uVar133;
                ray->geomID = (uint)local_7b8;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
            }
          }
          goto LAB_00ff4b26;
        }
        auVar284 = ZEXT3264(local_6e0);
        auVar300 = ZEXT3264(local_680);
        auVar338 = ZEXT3264(_local_5e0);
        fVar202 = (float)local_580._0_4_;
        fVar214 = (float)local_580._4_4_;
        fVar218 = fStack_578;
        fVar220 = fStack_574;
        fVar232 = fStack_570;
        fVar235 = fStack_56c;
        fVar242 = fStack_568;
        goto LAB_00ff4b2f;
      }
LAB_00ff3f40:
      fVar202 = (ray->super_RayK<1>).tfar;
      auVar150._4_4_ = fVar202;
      auVar150._0_4_ = fVar202;
      auVar150._8_4_ = fVar202;
      auVar150._12_4_ = fVar202;
      auVar150._16_4_ = fVar202;
      auVar150._20_4_ = fVar202;
      auVar150._24_4_ = fVar202;
      auVar150._28_4_ = fVar202;
      auVar149 = vcmpps_avx(local_80,auVar150,2);
      uVar133 = vmovmskps_avx(auVar149);
      uVar133 = (uint)uVar139 & uVar133;
    } while (uVar133 != 0);
  }
  return;
LAB_00ff4e6f:
  auVar284 = ZEXT3264(local_6e0);
  auVar300 = ZEXT3264(local_680);
  auVar338 = ZEXT3264(_local_5e0);
  pre = local_760;
  pPVar138 = local_758;
  fVar315 = (float)local_640._0_4_;
  fVar319 = (float)local_640._4_4_;
  fVar320 = fStack_638;
  fVar321 = fStack_634;
  fVar215 = fStack_630;
  fVar216 = fStack_62c;
  fVar222 = fStack_628;
  fVar187 = (float)local_660._0_4_;
  fVar199 = (float)local_660._4_4_;
  fVar200 = fStack_658;
  fVar201 = fStack_654;
  fVar224 = fStack_650;
  fVar238 = fStack_64c;
  fVar241 = fStack_648;
  fVar244 = fStack_644;
LAB_00ff4b26:
  fVar202 = (float)local_580._0_4_;
  fVar214 = (float)local_580._4_4_;
  fVar218 = fStack_578;
  fVar220 = fStack_574;
  fVar232 = fStack_570;
  fVar235 = fStack_56c;
  fVar242 = fStack_568;
LAB_00ff4b2f:
  lVar135 = lVar135 + 8;
  if ((int)uVar22 <= (int)lVar135) goto LAB_00ff3f40;
  goto LAB_00ff4005;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }